

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deconvolution_x86_avx.cpp
# Opt level: O3

int __thiscall
ncnn::Deconvolution_x86_avx::forward
          (Deconvolution_x86_avx *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  float *pfVar5;
  float *pfVar6;
  undefined4 uVar7;
  int iVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  undefined1 auVar13 [32];
  int iVar20;
  int iVar21;
  uint uVar22;
  uint uVar23;
  int *piVar24;
  void *pvVar25;
  undefined4 *puVar26;
  size_t sVar27;
  size_t sVar28;
  size_t sVar29;
  void *pvVar30;
  size_t sVar31;
  Layer *pLVar32;
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined4 uVar42;
  undefined4 uVar43;
  Mat *pMVar44;
  int iVar45;
  int iVar46;
  int iVar47;
  int iVar48;
  int iVar49;
  int iVar50;
  uint uVar51;
  long lVar52;
  ulong uVar53;
  undefined1 (*pauVar54) [32];
  ulong uVar55;
  undefined1 (*pauVar56) [16];
  uint uVar57;
  ulong uVar58;
  long lVar59;
  int iVar60;
  int x;
  int iVar61;
  uint uVar62;
  int iVar63;
  int y;
  ulong uVar64;
  ulong uVar65;
  void *pvVar66;
  ulong uVar67;
  uint uVar68;
  int iVar69;
  int y_3;
  int w;
  long lVar70;
  undefined1 (*pauVar71) [32];
  undefined1 (*pauVar72) [16];
  int y_6;
  float *pfVar73;
  int iVar74;
  int iVar75;
  float *pfVar76;
  void *pvVar77;
  void *pvVar78;
  float fVar79;
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [32];
  undefined1 auVar80 [16];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar81 [16];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar82 [16];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar83 [16];
  undefined1 auVar96 [32];
  float fVar97;
  float fVar119;
  float fVar120;
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  float fVar121;
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar149 [28];
  undefined1 auVar150 [28];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar151 [28];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar152 [32];
  undefined1 auVar153 [32];
  undefined1 auVar154 [32];
  undefined1 auVar155 [32];
  undefined1 auVar156 [32];
  undefined1 auVar157 [32];
  undefined1 auVar158 [32];
  undefined1 auVar159 [32];
  undefined1 auVar160 [32];
  undefined1 auVar161 [32];
  undefined1 auVar162 [32];
  undefined1 auVar163 [32];
  undefined1 auVar164 [32];
  undefined1 auVar165 [32];
  undefined1 auVar166 [32];
  float fVar167;
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  float fVar220;
  float fVar224;
  float fVar225;
  undefined1 auVar201 [32];
  undefined1 auVar202 [32];
  undefined1 auVar203 [32];
  undefined1 auVar204 [32];
  undefined1 auVar205 [32];
  undefined1 auVar207 [32];
  float fVar226;
  undefined1 auVar209 [32];
  undefined1 auVar210 [32];
  undefined1 auVar212 [32];
  undefined1 auVar214 [32];
  undefined1 auVar215 [32];
  undefined1 auVar217 [32];
  float fVar218;
  float fVar219;
  float fVar221;
  float fVar222;
  float fVar223;
  undefined1 in_ZMM3 [64];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [32];
  undefined1 auVar232 [32];
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  undefined1 in_ZMM5 [64];
  undefined1 auVar236 [16];
  undefined1 auVar237 [16];
  undefined1 auVar238 [32];
  undefined1 auVar239 [32];
  undefined1 auVar240 [64];
  undefined1 auVar243 [16];
  float fVar241;
  float fVar289;
  undefined1 auVar244 [16];
  undefined1 auVar245 [16];
  undefined1 auVar246 [16];
  undefined1 auVar247 [16];
  undefined1 auVar248 [16];
  undefined1 auVar249 [16];
  undefined1 auVar250 [16];
  undefined1 auVar251 [16];
  undefined1 auVar252 [16];
  float fVar242;
  undefined1 auVar253 [16];
  undefined1 auVar254 [16];
  undefined1 auVar255 [16];
  undefined1 auVar256 [16];
  undefined1 auVar257 [16];
  undefined1 auVar258 [16];
  undefined1 auVar259 [16];
  undefined1 auVar260 [16];
  undefined1 auVar261 [16];
  undefined1 auVar262 [16];
  undefined1 auVar263 [16];
  undefined1 auVar264 [16];
  undefined1 auVar265 [16];
  undefined1 auVar266 [16];
  undefined1 auVar267 [16];
  undefined1 auVar268 [16];
  undefined1 auVar269 [16];
  undefined1 auVar270 [32];
  undefined1 auVar271 [32];
  undefined1 auVar272 [32];
  undefined1 auVar273 [32];
  undefined1 auVar275 [32];
  undefined1 auVar276 [32];
  undefined1 auVar277 [32];
  undefined1 auVar278 [32];
  undefined1 auVar280 [32];
  undefined1 auVar281 [32];
  undefined1 auVar282 [32];
  undefined1 auVar283 [32];
  undefined1 auVar285 [32];
  undefined1 auVar286 [32];
  float fVar287;
  float fVar288;
  float fVar290;
  undefined1 in_ZMM7 [64];
  undefined1 auVar291 [16];
  undefined1 auVar292 [16];
  undefined1 auVar293 [16];
  undefined1 auVar294 [16];
  undefined1 auVar295 [16];
  undefined1 auVar296 [16];
  undefined1 auVar297 [32];
  undefined1 auVar298 [16];
  undefined1 auVar299 [16];
  undefined1 auVar300 [32];
  undefined1 auVar301 [32];
  undefined1 auVar302 [16];
  undefined1 auVar303 [16];
  undefined1 auVar304 [32];
  undefined1 auVar305 [32];
  undefined1 auVar306 [64];
  undefined1 auVar307 [64];
  undefined1 auVar308 [64];
  undefined1 auVar309 [16];
  undefined1 auVar310 [16];
  undefined1 auVar311 [16];
  undefined1 auVar312 [16];
  undefined1 auVar313 [32];
  undefined1 auVar314 [32];
  undefined1 auVar315 [32];
  undefined1 auVar316 [32];
  undefined1 auVar317 [32];
  undefined1 auVar318 [32];
  undefined1 auVar319 [64];
  undefined1 auVar320 [64];
  float fVar322;
  undefined1 auVar324 [16];
  undefined1 auVar325 [16];
  undefined1 auVar326 [16];
  undefined1 auVar327 [16];
  float fVar323;
  undefined1 auVar328 [16];
  undefined1 auVar329 [16];
  undefined1 auVar330 [16];
  undefined1 auVar331 [16];
  undefined1 auVar332 [16];
  undefined1 auVar333 [16];
  undefined1 auVar334 [16];
  undefined1 auVar335 [16];
  float fVar339;
  float fVar341;
  float fVar343;
  float fVar345;
  float fVar347;
  float fVar349;
  undefined1 auVar336 [32];
  undefined1 auVar337 [32];
  float fVar340;
  float fVar342;
  float fVar344;
  float fVar346;
  float fVar348;
  float fVar350;
  undefined1 auVar338 [32];
  int outw;
  int outh_1;
  int h_2;
  int outh;
  int size;
  Option opt_b;
  void *local_258;
  void *local_250;
  ulong local_248;
  float *local_238;
  ulong local_230;
  Mat local_198;
  void *local_150;
  long local_148;
  void *local_140;
  Option *local_138;
  long local_130;
  Mat *local_128;
  int local_11c;
  long *local_118;
  undefined4 uStack_110;
  int iStack_10c;
  long local_108;
  undefined4 uStack_100;
  long *local_f8;
  undefined4 uStack_f0;
  int iStack_ec;
  undefined1 auStack_e8 [12];
  undefined8 local_d8;
  void *local_d0;
  void *local_c8;
  int *piStack_c0;
  size_t local_b8;
  int local_b0;
  Allocator *local_a8;
  undefined4 local_a0;
  int iStack_9c;
  undefined4 uStack_98;
  undefined4 uStack_94;
  int local_90;
  size_t local_88;
  undefined8 local_78;
  Allocator *pAStack_70;
  undefined1 auStack_68 [16];
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 uStack_48;
  undefined8 uStack_40;
  undefined8 uVar14;
  undefined4 uVar15;
  undefined1 uVar16;
  undefined1 uVar17;
  undefined1 uVar18;
  undefined1 uVar19;
  undefined1 auVar206 [32];
  undefined1 auVar208 [32];
  undefined1 auVar211 [32];
  undefined1 auVar213 [32];
  undefined1 auVar216 [32];
  undefined1 auVar274 [32];
  undefined1 auVar279 [32];
  undefined1 auVar284 [32];
  undefined1 auVar321 [64];
  
  auVar168 = in_ZMM5._0_16_;
  iVar20 = bottom_blob->w;
  iVar21 = bottom_blob->h;
  uVar58 = bottom_blob->elemsize;
  uVar57 = bottom_blob->elempack;
  uVar22 = (this->super_Deconvolution).num_output;
  uVar68 = 1;
  if (opt->use_packing_layout == true) {
    uVar68 = 8;
    if ((uVar22 & 7) != 0) {
      uVar68 = (uint)((uVar22 & 3) == 0) * 3 + 1;
    }
  }
  iVar63 = (this->super_Deconvolution).kernel_w;
  iVar45 = (this->super_Deconvolution).dilation_w;
  iVar46 = (this->super_Deconvolution).stride_w;
  iVar60 = ((this->super_Deconvolution).kernel_h + -1) * (this->super_Deconvolution).dilation_h;
  local_148 = CONCAT44(local_148._4_4_,iVar60);
  iVar74 = (this->super_Deconvolution).stride_h;
  iVar61 = (this->super_Deconvolution).output_pad_right;
  iVar69 = (this->super_Deconvolution).output_pad_bottom;
  local_198.cstep = 0;
  local_198.data = (void *)0x0;
  local_198.refcount._0_4_ = 0;
  local_198.refcount._4_4_ = 0;
  local_198.elemsize = 0;
  local_198.elempack = 0;
  local_198.allocator = (Allocator *)0x0;
  local_198.dims = 0;
  local_198.w = 0;
  local_198.h = 0;
  local_198.d = 0;
  local_198.c = 0;
  auVar243._0_4_ = (this->super_Deconvolution).pad_left;
  auVar243._4_4_ = (this->super_Deconvolution).pad_right;
  auVar243._8_4_ = (this->super_Deconvolution).pad_top;
  auVar243._12_4_ = (this->super_Deconvolution).pad_bottom;
  auVar243 = vpcmpgtd_avx(auVar243,(undefined1  [16])0x0);
  lVar70 = 0x10;
  iVar75 = (int)((long)(int)uVar22 / (long)(int)uVar68);
  if (((((auVar243 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
        (auVar243 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
       (auVar243 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) && -1 < auVar243[0xf])
     && ((((this->super_Deconvolution).output_w < 1 || ((this->super_Deconvolution).output_h < 1))
         && (lVar70 = 8, &local_198 != top_blob)))) {
    piVar24 = top_blob->refcount;
    if (piVar24 != (int *)0x0) {
      LOCK();
      *piVar24 = *piVar24 + 1;
      UNLOCK();
    }
    local_198.data = top_blob->data;
    local_198.refcount._0_4_ = SUB84(top_blob->refcount,0);
    local_198.refcount._4_4_ = (undefined4)((ulong)top_blob->refcount >> 0x20);
    local_198.elemsize = top_blob->elemsize;
    local_198.elempack = top_blob->elempack;
    local_198.allocator = top_blob->allocator;
    uVar9 = top_blob->dims;
    uVar10 = top_blob->w;
    uVar11 = top_blob->h;
    uVar12 = top_blob->d;
    local_198.c = top_blob->c;
    local_198.cstep = top_blob->cstep;
    local_198.dims = uVar9;
    local_198.w = uVar10;
    local_198.h = uVar11;
    local_198.d = uVar12;
  }
  uVar64 = (long)(int)uVar22 / (long)(int)uVar68 & 0xffffffff;
  iVar45 = (iVar63 + -1) * iVar45;
  local_150 = (void *)CONCAT44(local_150._4_4_,iVar45);
  iVar61 = (iVar20 + -1) * iVar46 + iVar45 + iVar61 + 1;
  local_138 = opt;
  local_128 = top_blob;
  Mat::create(&local_198,iVar61,iVar69 + (iVar21 + -1) * iVar74 + iVar60 + 1,iVar75,
              (uVar58 / (ulong)(long)(int)uVar57) * (ulong)uVar68,uVar68,
              *(Allocator **)(&opt->lightmode + lVar70));
  iVar45 = local_198.h;
  iVar63 = local_198.w;
  iVar46 = -100;
  if ((local_198.data == (void *)0x0) || (local_198.cstep * (long)local_198.c == 0))
  goto LAB_002a3932;
  uVar22 = (this->super_Deconvolution).kernel_w;
  uVar51 = (this->super_Deconvolution).kernel_h;
  iVar74 = uVar51 * uVar22;
  if (local_138->use_sgemm_convolution == true) {
    piVar24 = bottom_blob->refcount;
    local_c8 = bottom_blob->data;
    piStack_c0 = bottom_blob->refcount;
    local_b8 = bottom_blob->elemsize;
    local_b0 = bottom_blob->elempack;
    local_a8 = bottom_blob->allocator;
    iVar63 = bottom_blob->h;
    iVar45 = bottom_blob->w;
    uVar42 = bottom_blob->dims;
    uVar43 = bottom_blob->d;
    local_90 = bottom_blob->c;
    local_88 = bottom_blob->cstep;
    if (piVar24 != (int *)0x0) {
      LOCK();
      *piVar24 = *piVar24 + 1;
      UNLOCK();
      iVar45 = bottom_blob->w;
      iVar63 = bottom_blob->h;
    }
    _local_a0 = CONCAT44(iVar63 * iVar45,uVar42);
    _uStack_98 = CONCAT44(uVar43,1);
    local_d8 = 0;
    local_118 = (long *)0x0;
    uStack_110 = 0;
    iStack_10c = 0;
    local_108 = 0;
    uStack_100 = 0;
    auStack_e8 = SUB1612(ZEXT816(0),0);
    auVar13[0] = local_138->lightmode;
    auVar13[1] = local_138->use_shader_pack8;
    auVar13[2] = local_138->use_subgroup_ops;
    auVar13[3] = local_138->use_reserved_0;
    auVar13._4_4_ = local_138->num_threads;
    auVar13._8_8_ = local_138->blob_allocator;
    uVar14 = local_138->workspace_allocator;
    uVar15 = local_138->openmp_blocktime;
    uVar16 = local_138->use_winograd_convolution;
    uVar17 = local_138->use_sgemm_convolution;
    uVar18 = local_138->use_int8_inference;
    uVar19 = local_138->use_vulkan_compute;
    auVar13[0x1f] = uVar19;
    auVar13[0x1e] = uVar18;
    auVar13[0x1d] = uVar17;
    auVar13[0x1c] = uVar16;
    auVar13._24_4_ = uVar15;
    auVar13._16_8_ = uVar14;
    local_58._0_1_ = local_138->use_bf16_storage;
    local_58._1_1_ = local_138->use_fp16_packed;
    local_58._2_1_ = local_138->use_fp16_storage;
    local_58._3_1_ = local_138->use_fp16_arithmetic;
    local_58._4_1_ = local_138->use_int8_packed;
    local_58._5_1_ = local_138->use_int8_storage;
    local_58._6_1_ = local_138->use_int8_arithmetic;
    local_58._7_1_ = local_138->use_packing_layout;
    uStack_50._0_4_ = local_138->vulkan_device_index;
    uStack_50._4_1_ = local_138->use_reserved_1;
    uStack_50._5_1_ = local_138->use_image_storage;
    uStack_50._6_1_ = local_138->use_tensor_storage;
    uStack_50._7_1_ = local_138->use_reserved_2;
    uStack_48._0_4_ = local_138->flush_denormals;
    uStack_48._4_1_ = local_138->use_local_pool_allocator;
    uStack_48._5_1_ = local_138->use_shader_local_memory;
    uStack_48._6_1_ = local_138->use_cooperative_matrix;
    uStack_48._7_1_ = local_138->use_winograd23_convolution;
    uStack_40._0_1_ = local_138->use_winograd43_convolution;
    uStack_40._1_1_ = local_138->use_winograd63_convolution;
    uStack_40._2_1_ = local_138->use_a53_a55_optimized_kernel;
    uStack_40._3_1_ = local_138->use_fp16_uniform;
    uStack_40._4_1_ = local_138->use_int8_uniform;
    uStack_40._5_1_ = local_138->use_reserved_9;
    uStack_40._6_1_ = local_138->use_reserved_10;
    uStack_40._7_1_ = local_138->use_reserved_11;
    local_78 = auVar13._0_8_;
    pAStack_70 = local_198.allocator;
    auStack_68 = auVar13._16_16_;
    local_f8 = local_118;
    uStack_f0 = uStack_110;
    iStack_ec = iStack_10c;
    iVar46 = (*this->gemm->_vptr_Layer[7])();
    auVar87 = _DAT_005b46a0;
    auVar314 = _DAT_005b4680;
    if (iVar46 != 0) {
      piVar24 = (int *)CONCAT44(iStack_10c,uStack_110);
      if (piVar24 != (int *)0x0) {
        LOCK();
        *piVar24 = *piVar24 + -1;
        UNLOCK();
        if (*piVar24 == 0) {
          if (local_f8 == (long *)0x0) {
            if (local_118 != (long *)0x0) {
              free(local_118);
            }
          }
          else {
            (**(code **)(*local_f8 + 0x18))();
          }
        }
      }
      if (piStack_c0 != (int *)0x0) {
        LOCK();
        *piStack_c0 = *piStack_c0 + -1;
        UNLOCK();
        if (*piStack_c0 == 0) {
          if (local_a8 == (Allocator *)0x0) {
            if (local_c8 != (void *)0x0) {
              free(local_c8);
            }
          }
          else {
            (*local_a8->_vptr_Allocator[3])();
          }
        }
      }
      goto LAB_002a3932;
    }
    iVar63 = (iVar61 * (this->super_Deconvolution).stride_h -
             (this->super_Deconvolution).stride_w * iVar20) * uVar68;
    if (uVar68 == 1) {
      if (0 < iVar75) {
        lVar70 = (long)local_198.h * (long)local_198.w;
        local_248 = 0;
        pvVar30 = (this->super_Deconvolution).bias_data.data;
        iVar45 = (this->super_Deconvolution).bias_data.c;
        sVar31 = (this->super_Deconvolution).bias_data.cstep;
        iVar46 = (int)((local_198.elemsize * lVar70 + 0xf & 0xfffffffffffffff0) / local_198.elemsize
                      );
        if (local_198.dims == 4) {
          iVar46 = (int)lVar70;
        }
        uVar51 = iVar46 * local_198.d;
        uVar57 = (this->super_Deconvolution).kernel_w;
        uVar22 = (this->super_Deconvolution).kernel_h;
        auVar85._8_8_ = 0;
        auVar85._0_8_ = (ulong)uVar51 - 1;
        auVar243 = vpshufd_avx(auVar85,0x44);
        uVar58 = auVar243._0_8_;
        auVar230._0_8_ = uVar58 ^ 0x8000000000000000;
        auVar230._8_4_ = auVar243._8_4_;
        uVar68 = auVar243._12_4_;
        auVar230._12_4_ = uVar68 ^ 0x80000000;
        auVar168 = vpcmpeqd_avx(auVar168,auVar168);
        pvVar66 = local_198.data;
        do {
          auVar243 = ZEXT816(0) << 0x40;
          if ((long)iVar45 * sVar31 != 0 && pvVar30 != (void *)0x0) {
            auVar243 = ZEXT416(*(uint *)((long)pvVar30 + local_248 * 4));
          }
          if (0 < (int)uVar51) {
            auVar243 = vshufps_avx(auVar243,auVar243,0);
            auVar239._16_16_ = auVar243;
            auVar239._0_16_ = auVar243;
            uVar55 = 0;
            do {
              auVar268._8_8_ = 0;
              auVar268._0_8_ = uVar55;
              auVar243 = vpshufd_avx(auVar268,0x44);
              auVar285._16_16_ = auVar243;
              auVar285._0_16_ = auVar243;
              auVar152 = vorps_avx(auVar285,auVar314);
              auVar158 = vorps_avx(auVar285,auVar87);
              auVar298._0_8_ = auVar158._16_8_ ^ 0x8000000000000000;
              auVar298._8_4_ = auVar158._24_4_;
              auVar298._12_4_ = auVar158._28_4_ ^ 0x80000000;
              auVar243 = vpcmpgtq_avx(auVar298,auVar230);
              auVar302._0_8_ = uVar58 ^ 0x8000000000000000;
              auVar302._8_4_ = auVar230._8_4_;
              auVar302._12_4_ = uVar68 ^ 0x80000000;
              auVar269._0_8_ = auVar158._0_8_ ^ 0x8000000000000000;
              auVar269._8_4_ = auVar158._8_4_;
              auVar269._12_4_ = auVar158._12_4_ ^ 0x80000000;
              auVar310 = vpcmpgtq_avx(auVar269,auVar302);
              auVar243 = vpackssdw_avx(auVar310,auVar243);
              auVar299._0_8_ = auVar152._16_8_ ^ 0x8000000000000000;
              auVar299._8_4_ = auVar152._24_4_;
              auVar299._12_4_ = auVar152._28_4_ ^ 0x80000000;
              auVar310 = vpcmpgtq_avx(auVar299,auVar230);
              auVar303._0_8_ = uVar58 ^ 0x8000000000000000;
              auVar303._8_4_ = auVar230._8_4_;
              auVar303._12_4_ = uVar68 ^ 0x80000000;
              auVar296._0_8_ = auVar152._0_8_ ^ 0x8000000000000000;
              auVar296._8_4_ = auVar152._8_4_;
              auVar296._12_4_ = auVar152._12_4_ ^ 0x80000000;
              auVar169 = vpcmpgtq_avx(auVar296,auVar303);
              auVar310 = vpackssdw_avx(auVar169,auVar310);
              auVar243 = vpackssdw_avx(auVar310 ^ auVar168,auVar243 ^ auVar168);
              auVar310 = vpmovsxwd_avx(auVar243);
              auVar243 = vpunpckhwd_avx(auVar243,auVar243);
              auVar286._16_16_ = auVar243;
              auVar286._0_16_ = auVar310;
              auVar152 = vmaskmovps_avx(auVar286,auVar239);
              *(undefined1 (*) [32])((long)pvVar66 + uVar55 * 4) = auVar152;
              uVar55 = uVar55 + 8;
            } while ((uVar51 + 7 & 0xfffffff8) != uVar55);
          }
          if (0 < (int)uVar22) {
            pfVar76 = (float *)(local_248 * (long)iVar74 * iStack_ec * local_108 + (long)local_118);
            iVar46 = (this->super_Deconvolution).dilation_h;
            iVar61 = (this->super_Deconvolution).dilation_w;
            uVar55 = 0;
            do {
              if (0 < (int)uVar57) {
                uVar65 = 0;
                do {
                  if (0 < iVar21) {
                    pfVar73 = (float *)((long)local_198.data +
                                       uVar65 * (long)iVar61 * 4 +
                                       uVar55 * (long)iVar46 *
                                                local_198.elemsize * (long)local_198.w +
                                       local_198.cstep * local_198.elemsize * local_248);
                    iVar69 = (this->super_Deconvolution).stride_w;
                    iVar60 = 0;
                    do {
                      iVar75 = iVar20;
                      if (0 < iVar20) {
                        do {
                          *pfVar73 = *pfVar73 + *pfVar76;
                          pfVar76 = pfVar76 + 1;
                          pfVar73 = pfVar73 + iVar69;
                          iVar75 = iVar75 + -1;
                        } while (iVar75 != 0);
                      }
                      pfVar73 = pfVar73 + iVar63;
                      iVar60 = iVar60 + 1;
                    } while (iVar60 != iVar21);
                  }
                  uVar65 = uVar65 + 1;
                } while (uVar65 != uVar57);
              }
              uVar55 = uVar55 + 1;
            } while (uVar55 != uVar22);
          }
          local_248 = local_248 + 1;
          pvVar66 = (void *)((long)pvVar66 + local_198.cstep * local_198.elemsize);
        } while (local_248 != uVar64);
      }
    }
    else if (uVar68 == 4) {
      if (0 < iVar75) {
        uVar58 = 0;
        do {
          sVar31 = local_198.elemsize;
          pfVar76 = (float *)((long)iStack_ec * uVar58 * (long)iVar74 * local_108 + (long)local_118)
          ;
          lVar70 = (long)local_198.w;
          pauVar72 = (undefined1 (*) [16])
                     (local_198.cstep * uVar58 * local_198.elemsize + (long)local_198.data);
          uVar65 = local_198.h * lVar70;
          uVar55 = (local_198.elemsize * uVar65 + 0xf & 0xfffffffffffffff0) / local_198.elemsize;
          if (local_198.dims == 4) {
            uVar55 = uVar65;
          }
          pvVar30 = (this->super_Deconvolution).bias_data.data;
          if ((pvVar30 == (void *)0x0) ||
             ((long)(this->super_Deconvolution).bias_data.c *
              (this->super_Deconvolution).bias_data.cstep == 0)) {
            uVar57 = local_198.d * (int)uVar55;
            if (0 < (int)uVar57) {
              memset(pauVar72,0,(ulong)uVar57 << 4);
            }
          }
          else {
            iVar45 = local_198.d * (int)uVar55;
            if (0 < iVar45) {
              auVar168 = *(undefined1 (*) [16])((long)pvVar30 + uVar58 * 0x10);
              pauVar56 = pauVar72;
              do {
                *pauVar56 = auVar168;
                pauVar56 = pauVar56 + 1;
                iVar45 = iVar45 + -1;
              } while (iVar45 != 0);
            }
          }
          iVar45 = (this->super_Deconvolution).kernel_h;
          if (0 < iVar45) {
            iVar46 = (this->super_Deconvolution).kernel_w;
            iVar61 = 0;
            do {
              if (0 < iVar46) {
                iVar45 = 0;
                do {
                  if (0 < iVar21) {
                    pauVar56 = (undefined1 (*) [16])
                               (*pauVar72 +
                               (long)((this->super_Deconvolution).dilation_w * iVar45 * 4) * 4 +
                               (long)(this->super_Deconvolution).dilation_h * (long)iVar61 *
                               sVar31 * lVar70);
                    iVar46 = 0;
                    do {
                      iVar69 = iVar20;
                      if (0 < iVar20) {
                        do {
                          auVar86._0_4_ = *pfVar76 + *(float *)*pauVar56;
                          auVar86._4_4_ = pfVar76[1] + *(float *)(*pauVar56 + 4);
                          auVar86._8_4_ = pfVar76[2] + *(float *)(*pauVar56 + 8);
                          auVar86._12_4_ = pfVar76[3] + *(float *)(*pauVar56 + 0xc);
                          *pauVar56 = auVar86;
                          pauVar56 = pauVar56 + (this->super_Deconvolution).stride_w;
                          pfVar76 = pfVar76 + 4;
                          iVar69 = iVar69 + -1;
                        } while (iVar69 != 0);
                      }
                      pauVar56 = (undefined1 (*) [16])(*pauVar56 + (long)iVar63 * 4);
                      iVar46 = iVar46 + 1;
                    } while (iVar46 != iVar21);
                    iVar46 = (this->super_Deconvolution).kernel_w;
                  }
                  iVar45 = iVar45 + 1;
                } while (iVar45 < iVar46);
                iVar45 = (this->super_Deconvolution).kernel_h;
              }
              iVar61 = iVar61 + 1;
            } while (iVar61 < iVar45);
          }
          uVar58 = uVar58 + 1;
        } while (uVar58 != uVar64);
      }
    }
    else if ((uVar68 == 8) && (0 < iVar75)) {
      uVar58 = 0;
      do {
        sVar31 = local_198.elemsize;
        pfVar76 = (float *)((long)iStack_ec * uVar58 * (long)iVar74 * local_108 + (long)local_118);
        lVar70 = (long)local_198.w;
        pauVar71 = (undefined1 (*) [32])
                   (local_198.cstep * uVar58 * local_198.elemsize + (long)local_198.data);
        uVar65 = local_198.h * lVar70;
        uVar55 = (local_198.elemsize * uVar65 + 0xf & 0xfffffffffffffff0) / local_198.elemsize;
        if (local_198.dims == 4) {
          uVar55 = uVar65;
        }
        pvVar30 = (this->super_Deconvolution).bias_data.data;
        if ((pvVar30 == (void *)0x0) ||
           ((long)(this->super_Deconvolution).bias_data.c *
            (this->super_Deconvolution).bias_data.cstep == 0)) {
          uVar57 = local_198.d * (int)uVar55;
          if (0 < (int)uVar57) {
            memset(pauVar71,0,(ulong)uVar57 << 5);
          }
        }
        else {
          iVar45 = local_198.d * (int)uVar55;
          if (0 < iVar45) {
            auVar314 = *(undefined1 (*) [32])((long)pvVar30 + uVar58 * 0x20);
            pauVar54 = pauVar71;
            do {
              *pauVar54 = auVar314;
              pauVar54 = pauVar54 + 1;
              iVar45 = iVar45 + -1;
            } while (iVar45 != 0);
          }
        }
        iVar45 = (this->super_Deconvolution).kernel_h;
        if (0 < iVar45) {
          iVar46 = (this->super_Deconvolution).kernel_w;
          iVar61 = 0;
          do {
            if (0 < iVar46) {
              iVar45 = 0;
              do {
                if (0 < iVar21) {
                  pauVar54 = (undefined1 (*) [32])
                             (*pauVar71 +
                             (long)((this->super_Deconvolution).dilation_w * iVar45 * 8) * 4 +
                             (long)(this->super_Deconvolution).dilation_h * (long)iVar61 *
                             sVar31 * lVar70);
                  iVar46 = 0;
                  do {
                    iVar69 = iVar20;
                    if (0 < iVar20) {
                      do {
                        auVar96._0_4_ = *pfVar76 + *(float *)*pauVar54;
                        auVar96._4_4_ = pfVar76[1] + *(float *)(*pauVar54 + 4);
                        auVar96._8_4_ = pfVar76[2] + *(float *)(*pauVar54 + 8);
                        auVar96._12_4_ = pfVar76[3] + *(float *)(*pauVar54 + 0xc);
                        auVar96._16_4_ = pfVar76[4] + *(float *)(*pauVar54 + 0x10);
                        auVar96._20_4_ = pfVar76[5] + *(float *)(*pauVar54 + 0x14);
                        auVar96._24_4_ = pfVar76[6] + *(float *)(*pauVar54 + 0x18);
                        auVar96._28_4_ = pfVar76[7] + *(float *)(*pauVar54 + 0x1c);
                        *pauVar54 = auVar96;
                        pauVar54 = pauVar54 + (this->super_Deconvolution).stride_w;
                        pfVar76 = pfVar76 + 8;
                        iVar69 = iVar69 + -1;
                      } while (iVar69 != 0);
                    }
                    pauVar54 = (undefined1 (*) [32])(*pauVar54 + (long)iVar63 * 4);
                    iVar46 = iVar46 + 1;
                  } while (iVar46 != iVar21);
                  iVar46 = (this->super_Deconvolution).kernel_w;
                }
                iVar45 = iVar45 + 1;
              } while (iVar45 < iVar46);
              iVar45 = (this->super_Deconvolution).kernel_h;
            }
            iVar61 = iVar61 + 1;
          } while (iVar61 < iVar45);
        }
        uVar58 = uVar58 + 1;
      } while (uVar58 != uVar64);
    }
    pLVar32 = this->activation;
    if (pLVar32 != (Layer *)0x0) {
      (*pLVar32->_vptr_Layer[9])(pLVar32,&local_198,local_138);
    }
    piVar24 = (int *)CONCAT44(iStack_10c,uStack_110);
    if (piVar24 != (int *)0x0) {
      LOCK();
      *piVar24 = *piVar24 + -1;
      UNLOCK();
      if (*piVar24 == 0) {
        if (local_f8 == (long *)0x0) {
          if (local_118 != (long *)0x0) {
            free(local_118);
          }
        }
        else {
          (**(code **)(*local_f8 + 0x18))();
        }
      }
    }
    if (piStack_c0 != (int *)0x0) {
      LOCK();
      *piStack_c0 = *piStack_c0 + -1;
      UNLOCK();
      if (*piStack_c0 == 0) {
        if (local_a8 == (Allocator *)0x0) {
          if (local_c8 != (void *)0x0) {
            free(local_c8);
          }
        }
        else {
          (*local_a8->_vptr_Allocator[3])();
        }
      }
    }
  }
  else {
    local_11c = iVar74;
    if ((uVar57 == 8) && (uVar68 == 8)) {
      if (local_198.c < 1) goto LAB_002a38ed;
      iVar20 = (this->super_Deconvolution).dilation_w;
      iVar21 = (this->super_Deconvolution).dilation_h;
      iVar46 = (this->super_Deconvolution).stride_w;
      iVar74 = (this->super_Deconvolution).stride_h;
      iVar61 = (this->super_Deconvolution).activation_type;
      pvVar30 = (this->super_Deconvolution).bias_data.data;
      local_258 = (void *)0x0;
      auVar306 = ZEXT1664(ZEXT816(0) << 0x40);
      auVar308 = ZEXT3264(CONCAT428(0x3f000000,
                                    CONCAT424(0x3f000000,
                                              CONCAT420(0x3f000000,
                                                        CONCAT416(0x3f000000,
                                                                  CONCAT412(0x3f000000,
                                                                            CONCAT48(0x3f000000,
                                                                                                                                                                          
                                                  0x3f0000003f000000)))))));
      auVar240 = ZEXT3264(CONCAT428(0x3f800000,
                                    CONCAT424(0x3f800000,
                                              CONCAT420(0x3f800000,
                                                        CONCAT416(0x3f800000,
                                                                  CONCAT412(0x3f800000,
                                                                            CONCAT48(0x3f800000,
                                                                                                                                                                          
                                                  0x3f8000003f800000)))))));
      do {
        if (0 < local_198.h) {
          iVar69 = bottom_blob->w;
          iVar60 = bottom_blob->h;
          pauVar71 = (undefined1 (*) [32])
                     (local_198.cstep * (long)local_258 * local_198.elemsize + (long)local_198.data)
          ;
          uVar23 = bottom_blob->c;
          iVar75 = 0;
          do {
            if (0 < local_198.w) {
              uVar62 = 0;
              iVar8 = (1 - uVar22) * iVar20;
              do {
                if (pvVar30 == (void *)0x0) {
                  auVar319 = ZEXT1664(ZEXT816(0) << 0x40);
                }
                else {
                  auVar319 = ZEXT3264(*(undefined1 (*) [32])((long)pvVar30 + (long)local_258 * 0x20)
                                     );
                }
                if (0 < (int)uVar23) {
                  pvVar66 = (void *)((this->weight_data_tm).cstep * (long)local_258 *
                                     (this->weight_data_tm).elemsize +
                                    (long)(this->weight_data_tm).data);
                  pvVar25 = bottom_blob->data;
                  uVar58 = 0;
                  do {
                    if (0 < (int)uVar51) {
                      uVar55 = 0;
                      uVar64 = 0;
                      do {
                        iVar47 = (((int)uVar64 - uVar51) + 1) * iVar21 + iVar75;
                        if ((((-1 < iVar47) && (iVar48 = iVar47 / iVar74, iVar47 % iVar74 == 0)) &&
                            (0 < (int)uVar22)) && (iVar48 < iVar60)) {
                          lVar70 = (long)iVar48 * (long)bottom_blob->w * bottom_blob->elemsize +
                                   bottom_blob->cstep * bottom_blob->elemsize * uVar58;
                          uVar65 = uVar55;
                          uVar67 = (ulong)uVar22;
                          iVar47 = iVar8;
                          do {
                            if (((-1 < iVar47) && (iVar48 = iVar47 / iVar46, iVar47 % iVar46 == 0))
                               && (iVar48 < iVar69)) {
                              lVar52 = (long)(iVar48 << 3);
                              fVar79 = *(float *)((long)pvVar25 + lVar52 * 4 + lVar70);
                              fVar97 = *(float *)((long)pvVar25 + lVar52 * 4 + lVar70 + 4);
                              fVar119 = *(float *)((long)pvVar25 + lVar52 * 4 + lVar70 + 8);
                              fVar120 = *(float *)((long)pvVar25 + lVar52 * 4 + lVar70 + 0xc);
                              fVar226 = *(float *)((long)pvVar25 + lVar52 * 4 + lVar70 + 0x10);
                              fVar121 = *(float *)((long)pvVar25 + lVar52 * 4 + lVar70 + 0x14);
                              fVar223 = *(float *)((long)pvVar25 + lVar52 * 4 + lVar70 + 0x18);
                              fVar225 = *(float *)((long)pvVar25 + lVar52 * 4 + lVar70 + 0x1c);
                              uVar53 = uVar65 & 0xffffffff;
                              pfVar76 = (float *)((long)pvVar66 + uVar53 * 4);
                              pfVar73 = (float *)((long)pvVar66 + uVar53 * 4 + 0x20);
                              pfVar1 = (float *)((long)pvVar66 + uVar53 * 4 + 0x40);
                              pfVar2 = (float *)((long)pvVar66 + uVar53 * 4 + 0x60);
                              pfVar3 = (float *)((long)pvVar66 + uVar53 * 4 + 0x80);
                              in_ZMM7 = ZEXT3264(CONCAT428(fVar120,CONCAT424(fVar226 * pfVar3[6],
                                                                             CONCAT420(fVar226 * 
                                                  pfVar3[5],
                                                  CONCAT416(fVar226 * pfVar3[4],
                                                            CONCAT412(fVar226 * pfVar3[3],
                                                                      CONCAT48(fVar226 * pfVar3[2],
                                                                               CONCAT44(fVar226 * 
                                                  pfVar3[1],fVar226 * *pfVar3))))))));
                              pfVar4 = (float *)((long)pvVar66 + uVar53 * 4 + 0xa0);
                              fVar224 = fVar119 + fVar120 + fVar119;
                              pfVar5 = (float *)((long)pvVar66 + uVar53 * 4 + 0xc0);
                              pfVar6 = (float *)((long)pvVar66 + uVar53 * 4 + 0xe0);
                              fVar167 = fVar223 * *pfVar5 + fVar225 * *pfVar6;
                              fVar218 = fVar223 * pfVar5[1] + fVar225 * pfVar6[1];
                              fVar219 = fVar223 * pfVar5[2] + fVar225 * pfVar6[2];
                              fVar220 = fVar223 * pfVar5[3] + fVar225 * pfVar6[3];
                              fVar221 = fVar223 * pfVar5[4] + fVar225 * pfVar6[4];
                              fVar222 = fVar223 * pfVar5[5] + fVar225 * pfVar6[5];
                              fVar223 = fVar223 * pfVar5[6] + fVar225 * pfVar6[6];
                              fVar225 = fVar224 + fVar119;
                              in_ZMM3 = ZEXT3264(CONCAT428(fVar225,CONCAT424(fVar223,CONCAT420(
                                                  fVar222,CONCAT416(fVar221,CONCAT412(fVar220,
                                                  CONCAT48(fVar219,CONCAT44(fVar218,fVar167))))))));
                              auVar319 = ZEXT3264(CONCAT428(auVar319._28_4_ + fVar79 +
                                                            fVar97 + fVar119 + fVar224 + fVar225,
                                                            CONCAT424(auVar319._24_4_ +
                                                                      fVar79 * pfVar76[6] +
                                                                      fVar97 * pfVar73[6] +
                                                                      fVar119 * pfVar1[6] +
                                                                      fVar120 * pfVar2[6] +
                                                                      fVar226 * pfVar3[6] +
                                                                      fVar121 * pfVar4[6] + fVar223,
                                                                      CONCAT420(auVar319._20_4_ +
                                                                                fVar79 * pfVar76[5]
                                                                                + fVar97 * pfVar73[5
                                                  ] + fVar119 * pfVar1[5] +
                                                  fVar120 * pfVar2[5] + fVar226 * pfVar3[5] +
                                                  fVar121 * pfVar4[5] + fVar222,
                                                  CONCAT416(auVar319._16_4_ + fVar79 * pfVar76[4] +
                                                            fVar97 * pfVar73[4] +
                                                            fVar119 * pfVar1[4] +
                                                            fVar120 * pfVar2[4] +
                                                            fVar226 * pfVar3[4] +
                                                            fVar121 * pfVar4[4] + fVar221,
                                                            CONCAT412(auVar319._12_4_ +
                                                                      fVar79 * pfVar76[3] +
                                                                      fVar97 * pfVar73[3] +
                                                                      fVar119 * pfVar1[3] +
                                                                      fVar120 * pfVar2[3] +
                                                                      fVar226 * pfVar3[3] +
                                                                      fVar121 * pfVar4[3] + fVar220,
                                                                      CONCAT48(auVar319._8_4_ +
                                                                               fVar79 * pfVar76[2] +
                                                                               fVar97 * pfVar73[2] +
                                                                               fVar119 * pfVar1[2] +
                                                                               fVar120 * pfVar2[2] +
                                                                               fVar226 * pfVar3[2] +
                                                                               fVar121 * pfVar4[2] +
                                                                               fVar219,CONCAT44(
                                                  auVar319._4_4_ + fVar79 * pfVar76[1] +
                                                  fVar97 * pfVar73[1] + fVar119 * pfVar1[1] +
                                                  fVar120 * pfVar2[1] + fVar226 * pfVar3[1] +
                                                  fVar121 * pfVar4[1] + fVar218,
                                                  auVar319._0_4_ + fVar79 * *pfVar76 +
                                                  fVar97 * *pfVar73 + fVar119 * *pfVar1 +
                                                  fVar120 * *pfVar2 + fVar226 * *pfVar3 +
                                                  fVar121 * *pfVar4 + fVar167))))))));
                            }
                            uVar65 = uVar65 + 0x40;
                            iVar47 = iVar47 + iVar20;
                            uVar67 = uVar67 - 1;
                          } while (uVar67 != 0);
                        }
                        uVar64 = uVar64 + 1;
                        uVar55 = uVar55 + (ulong)uVar22 * 0x40;
                      } while (uVar64 != uVar51);
                    }
                    pvVar66 = (void *)((long)pvVar66 + (long)(int)(uVar22 * uVar51 * 0x40) * 4);
                    uVar58 = uVar58 + 1;
                  } while (uVar58 != uVar23);
                }
                auVar314 = auVar319._0_32_;
                auVar152 = auVar306._0_32_;
                fVar241 = auVar319._8_4_;
                fVar287 = auVar319._12_4_;
                fVar288 = auVar319._16_4_;
                fVar289 = auVar319._20_4_;
                fVar290 = auVar319._24_4_;
                fVar167 = auVar308._0_4_;
                fVar218 = auVar308._4_4_;
                fVar219 = auVar308._8_4_;
                fVar220 = auVar308._12_4_;
                fVar221 = auVar308._16_4_;
                fVar222 = auVar308._20_4_;
                fVar224 = auVar308._24_4_;
                fVar242 = auVar308._28_4_;
                auVar87 = auVar240._0_32_;
                fVar79 = auVar240._0_4_;
                fVar97 = auVar240._4_4_;
                fVar119 = auVar240._8_4_;
                fVar120 = auVar240._12_4_;
                fVar226 = auVar240._16_4_;
                fVar121 = auVar240._20_4_;
                fVar223 = auVar240._24_4_;
                fVar225 = auVar240._28_4_;
                auVar307._28_36_ = auVar319._28_36_;
                switch(iVar61) {
                case 1:
                  auVar314 = vmaxps_avx(auVar314,auVar152);
                  break;
                case 2:
                  auVar87 = vmaxps_avx(auVar314,auVar152);
                  in_ZMM7 = ZEXT3264(auVar87);
                  auVar152 = vminps_avx(auVar314,auVar152);
                  fVar79 = *(this->super_Deconvolution).activation_params.data;
                  auVar314._0_4_ = fVar79 * auVar152._0_4_ + auVar87._0_4_;
                  auVar314._4_4_ = fVar79 * auVar152._4_4_ + auVar87._4_4_;
                  auVar314._8_4_ = fVar79 * auVar152._8_4_ + auVar87._8_4_;
                  auVar314._12_4_ = fVar79 * auVar152._12_4_ + auVar87._12_4_;
                  auVar314._16_4_ = fVar79 * auVar152._16_4_ + auVar87._16_4_;
                  auVar314._20_4_ = fVar79 * auVar152._20_4_ + auVar87._20_4_;
                  auVar314._24_4_ = fVar79 * auVar152._24_4_ + auVar87._24_4_;
                  auVar314._28_4_ = auVar152._28_4_ + auVar87._28_4_;
                  break;
                case 3:
                  puVar26 = (undefined4 *)(this->super_Deconvolution).activation_params.data;
                  uVar7 = *puVar26;
                  auVar272._4_4_ = uVar7;
                  auVar272._0_4_ = uVar7;
                  auVar272._8_4_ = uVar7;
                  auVar272._12_4_ = uVar7;
                  auVar272._16_4_ = uVar7;
                  auVar272._20_4_ = uVar7;
                  auVar272._24_4_ = uVar7;
                  auVar272._28_4_ = uVar7;
                  uVar7 = puVar26[1];
                  auVar336._4_4_ = uVar7;
                  auVar336._0_4_ = uVar7;
                  auVar336._8_4_ = uVar7;
                  auVar336._12_4_ = uVar7;
                  auVar336._16_4_ = uVar7;
                  auVar336._20_4_ = uVar7;
                  auVar336._24_4_ = uVar7;
                  auVar336._28_4_ = uVar7;
                  auVar314 = vmaxps_avx(auVar314,auVar272);
                  in_ZMM7 = ZEXT3264(auVar314);
                  auVar314 = vminps_avx(auVar336,auVar314);
                  break;
                case 4:
                  auVar273._0_8_ = auVar319._0_8_ ^ 0x8000000080000000;
                  auVar273._8_4_ = -fVar241;
                  auVar273._12_4_ = -fVar287;
                  auVar273._16_4_ = -fVar288;
                  auVar273._20_4_ = -fVar289;
                  auVar273._24_4_ = -fVar290;
                  auVar273._28_4_ = -auVar319._28_4_;
                  auVar155._8_4_ = 0x42b0c0a5;
                  auVar155._0_8_ = 0x42b0c0a542b0c0a5;
                  auVar155._12_4_ = 0x42b0c0a5;
                  auVar155._16_4_ = 0x42b0c0a5;
                  auVar155._20_4_ = 0x42b0c0a5;
                  auVar155._24_4_ = 0x42b0c0a5;
                  auVar155._28_4_ = 0x42b0c0a5;
                  auVar314 = vminps_avx(auVar273,auVar155);
                  auVar156._8_4_ = 0xc2b0c0a5;
                  auVar156._0_8_ = 0xc2b0c0a5c2b0c0a5;
                  auVar156._12_4_ = 0xc2b0c0a5;
                  auVar156._16_4_ = 0xc2b0c0a5;
                  auVar156._20_4_ = 0xc2b0c0a5;
                  auVar156._24_4_ = 0xc2b0c0a5;
                  auVar156._28_4_ = 0xc2b0c0a5;
                  auVar152 = vmaxps_avx(auVar314,auVar156);
                  auVar313._0_4_ = auVar152._0_4_ * 1.442695 + fVar167;
                  auVar313._4_4_ = auVar152._4_4_ * 1.442695 + fVar218;
                  auVar313._8_4_ = auVar152._8_4_ * 1.442695 + fVar219;
                  auVar313._12_4_ = auVar152._12_4_ * 1.442695 + fVar220;
                  auVar313._16_4_ = auVar152._16_4_ * 1.442695 + fVar221;
                  auVar313._20_4_ = auVar152._20_4_ * 1.442695 + fVar222;
                  auVar313._24_4_ = auVar152._24_4_ * 1.442695 + fVar224;
                  auVar313._28_4_ = auVar319._28_4_ + fVar242;
                  auVar158 = vroundps_avx(auVar313,1);
                  auVar314 = vcmpps_avx(auVar313,auVar158,1);
                  auVar314 = vandps_avx(auVar314,auVar87);
                  auVar314 = vsubps_avx(auVar158,auVar314);
                  fVar241 = auVar314._0_4_ * -0.6931472 + auVar152._0_4_;
                  fVar287 = auVar314._4_4_ * -0.6931472 + auVar152._4_4_;
                  fVar288 = auVar314._8_4_ * -0.6931472 + auVar152._8_4_;
                  fVar289 = auVar314._12_4_ * -0.6931472 + auVar152._12_4_;
                  fVar290 = auVar314._16_4_ * -0.6931472 + auVar152._16_4_;
                  fVar322 = auVar314._20_4_ * -0.6931472 + auVar152._20_4_;
                  fVar339 = auVar314._24_4_ * -0.6931472 + auVar152._24_4_;
                  in_ZMM3 = ZEXT3264(CONCAT428(0x3ab743ce,
                                               CONCAT424(0x3ab743ce,
                                                         CONCAT420(0x3ab743ce,
                                                                   CONCAT416(0x3ab743ce,
                                                                             CONCAT412(0x3ab743ce,
                                                                                       CONCAT48(
                                                  0x3ab743ce,0x3ab743ce3ab743ce)))))));
                  auVar244._0_4_ = (int)auVar314._0_4_;
                  auVar244._4_4_ = (int)auVar314._4_4_;
                  auVar244._8_4_ = (int)auVar314._8_4_;
                  auVar244._12_4_ = (int)auVar314._12_4_;
                  auVar274._16_4_ = (int)auVar314._16_4_;
                  auVar274._0_16_ = auVar244;
                  auVar274._20_4_ = (int)auVar314._20_4_;
                  auVar274._24_4_ = (int)auVar314._24_4_;
                  auVar274._28_4_ = (int)auVar314._28_4_;
                  auVar243 = vpslld_avx(auVar244,0x17);
                  auVar168 = vpslld_avx(auVar274._16_16_,0x17);
                  auVar80._8_4_ = 0x3f800000;
                  auVar80._0_8_ = 0x3f8000003f800000;
                  auVar80._12_4_ = 0x3f800000;
                  auVar168 = vpaddd_avx(auVar168,auVar80);
                  auVar243 = vpaddd_avx(auVar243,auVar80);
                  in_ZMM7 = ZEXT3264(CONCAT1616(auVar168,auVar243));
                  auVar157._0_4_ =
                       (fVar241 + fVar79 +
                       fVar241 * fVar241 *
                       (fVar167 +
                       ((((fVar241 * 0.00019875691 + 0.0013981999) * fVar241 + 0.008333452) *
                         fVar241 + 0.041665796) * fVar241 + 0.16666666) * fVar241)) * auVar243._0_4_
                       + fVar79;
                  auVar157._4_4_ =
                       (fVar287 + fVar97 +
                       fVar287 * fVar287 *
                       (fVar218 +
                       ((((fVar287 * 0.00019875691 + 0.0013981999) * fVar287 + 0.008333452) *
                         fVar287 + 0.041665796) * fVar287 + 0.16666666) * fVar287)) * auVar243._4_4_
                       + fVar97;
                  auVar157._8_4_ =
                       (fVar288 + fVar119 +
                       fVar288 * fVar288 *
                       (fVar219 +
                       ((((fVar288 * 0.00019875691 + 0.0013981999) * fVar288 + 0.008333452) *
                         fVar288 + 0.041665796) * fVar288 + 0.16666666) * fVar288)) * auVar243._8_4_
                       + fVar119;
                  auVar157._12_4_ =
                       (fVar289 + fVar120 +
                       fVar289 * fVar289 *
                       (fVar220 +
                       ((((fVar289 * 0.00019875691 + 0.0013981999) * fVar289 + 0.008333452) *
                         fVar289 + 0.041665796) * fVar289 + 0.16666666) * fVar289)) *
                       auVar243._12_4_ + fVar120;
                  auVar157._16_4_ =
                       (fVar290 + fVar226 +
                       fVar290 * fVar290 *
                       (fVar221 +
                       ((((fVar290 * 0.00019875691 + 0.0013981999) * fVar290 + 0.008333452) *
                         fVar290 + 0.041665796) * fVar290 + 0.16666666) * fVar290)) * auVar168._0_4_
                       + fVar226;
                  auVar157._20_4_ =
                       (fVar322 + fVar121 +
                       fVar322 * fVar322 *
                       (fVar222 +
                       ((((fVar322 * 0.00019875691 + 0.0013981999) * fVar322 + 0.008333452) *
                         fVar322 + 0.041665796) * fVar322 + 0.16666666) * fVar322)) * auVar168._4_4_
                       + fVar121;
                  auVar157._24_4_ =
                       (fVar339 + fVar223 +
                       fVar339 * fVar339 *
                       (fVar224 +
                       ((((fVar339 * 0.00019875691 + 0.0013981999) * fVar339 + 0.008333452) *
                         fVar339 + 0.041665796) * fVar339 + 0.16666666) * fVar339)) * auVar168._8_4_
                       + fVar223;
                  auVar157._28_4_ =
                       auVar158._28_4_ + auVar152._28_4_ + fVar225 + fVar242 + 0.21826287 + fVar225;
                  auVar314 = vdivps_avx(auVar87,auVar157);
                  break;
                case 5:
                  auVar300._8_4_ = 0x42b0c0a5;
                  auVar300._0_8_ = 0x42b0c0a542b0c0a5;
                  auVar300._12_4_ = 0x42b0c0a5;
                  auVar300._16_4_ = 0x42b0c0a5;
                  auVar300._20_4_ = 0x42b0c0a5;
                  auVar300._24_4_ = 0x42b0c0a5;
                  auVar300._28_4_ = 0x42b0c0a5;
                  auVar314 = vminps_avx(auVar314,auVar300);
                  auVar304._8_4_ = 0xc2b0c0a5;
                  auVar304._0_8_ = 0xc2b0c0a5c2b0c0a5;
                  auVar304._12_4_ = 0xc2b0c0a5;
                  auVar304._16_4_ = 0xc2b0c0a5;
                  auVar304._20_4_ = 0xc2b0c0a5;
                  auVar304._24_4_ = 0xc2b0c0a5;
                  auVar304._28_4_ = 0xc2b0c0a5;
                  auVar152 = vmaxps_avx(auVar304,auVar314);
                  auVar270._0_4_ = fVar167 + auVar152._0_4_ * 1.442695;
                  auVar270._4_4_ = fVar218 + auVar152._4_4_ * 1.442695;
                  auVar270._8_4_ = fVar219 + auVar152._8_4_ * 1.442695;
                  auVar270._12_4_ = fVar220 + auVar152._12_4_ * 1.442695;
                  auVar270._16_4_ = fVar221 + auVar152._16_4_ * 1.442695;
                  auVar270._20_4_ = fVar222 + auVar152._20_4_ * 1.442695;
                  auVar270._24_4_ = fVar224 + auVar152._24_4_ * 1.442695;
                  auVar270._28_4_ = fVar242 + in_ZMM7._28_4_;
                  auVar158 = vroundps_avx(auVar270,1);
                  auVar314 = vcmpps_avx(auVar270,auVar158,1);
                  auVar314 = vandps_avx(auVar314,auVar87);
                  auVar314 = vsubps_avx(auVar158,auVar314);
                  auVar33._4_4_ = auVar314._4_4_ * 0.6931472;
                  auVar33._0_4_ = auVar314._0_4_ * 0.6931472;
                  auVar33._8_4_ = auVar314._8_4_ * 0.6931472;
                  auVar33._12_4_ = auVar314._12_4_ * 0.6931472;
                  auVar33._16_4_ = auVar314._16_4_ * 0.6931472;
                  auVar33._20_4_ = auVar314._20_4_ * 0.6931472;
                  auVar33._24_4_ = auVar314._24_4_ * 0.6931472;
                  auVar33._28_4_ = auVar158._28_4_;
                  auVar152 = vsubps_avx(auVar152,auVar33);
                  fVar322 = auVar152._0_4_;
                  fVar339 = auVar152._4_4_;
                  fVar341 = auVar152._8_4_;
                  fVar343 = auVar152._12_4_;
                  fVar345 = auVar152._16_4_;
                  fVar347 = auVar152._20_4_;
                  fVar349 = auVar152._24_4_;
                  auVar168._0_4_ = (int)auVar314._0_4_;
                  auVar168._4_4_ = (int)auVar314._4_4_;
                  auVar168._8_4_ = (int)auVar314._8_4_;
                  auVar168._12_4_ = (int)auVar314._12_4_;
                  auVar201._16_4_ = (int)auVar314._16_4_;
                  auVar201._0_16_ = auVar168;
                  auVar201._20_4_ = (int)auVar314._20_4_;
                  auVar201._24_4_ = (int)auVar314._24_4_;
                  auVar201._28_4_ = (int)auVar314._28_4_;
                  auVar243 = vpslld_avx(auVar168,0x17);
                  auVar168 = vpslld_avx(auVar201._16_16_,0x17);
                  auVar310._8_4_ = 0x3f800000;
                  auVar310._0_8_ = 0x3f8000003f800000;
                  auVar310._12_4_ = 0x3f800000;
                  auVar168 = vpaddd_avx(auVar168,auVar310);
                  auVar243 = vpaddd_avx(auVar243,auVar310);
                  auVar271._0_4_ =
                       (fVar322 + fVar79 +
                       fVar322 * fVar322 *
                       (((((fVar322 * 0.00019875691 + 0.0013981999) * fVar322 + 0.008333452) *
                          fVar322 + 0.041665796) * fVar322 + 0.16666666) * fVar322 + fVar167)) *
                       auVar243._0_4_ + fVar79;
                  auVar271._4_4_ =
                       (fVar339 + fVar97 +
                       fVar339 * fVar339 *
                       (((((fVar339 * 0.00019875691 + 0.0013981999) * fVar339 + 0.008333452) *
                          fVar339 + 0.041665796) * fVar339 + 0.16666666) * fVar339 + fVar218)) *
                       auVar243._4_4_ + fVar97;
                  auVar271._8_4_ =
                       (fVar341 + fVar119 +
                       fVar341 * fVar341 *
                       (((((fVar341 * 0.00019875691 + 0.0013981999) * fVar341 + 0.008333452) *
                          fVar341 + 0.041665796) * fVar341 + 0.16666666) * fVar341 + fVar219)) *
                       auVar243._8_4_ + fVar119;
                  auVar271._12_4_ =
                       (fVar343 + fVar120 +
                       fVar343 * fVar343 *
                       (((((fVar343 * 0.00019875691 + 0.0013981999) * fVar343 + 0.008333452) *
                          fVar343 + 0.041665796) * fVar343 + 0.16666666) * fVar343 + fVar220)) *
                       auVar243._12_4_ + fVar120;
                  auVar271._16_4_ =
                       (fVar345 + fVar226 +
                       fVar345 * fVar345 *
                       (((((fVar345 * 0.00019875691 + 0.0013981999) * fVar345 + 0.008333452) *
                          fVar345 + 0.041665796) * fVar345 + 0.16666666) * fVar345 + fVar221)) *
                       auVar168._0_4_ + fVar226;
                  auVar271._20_4_ =
                       (fVar347 + fVar121 +
                       fVar347 * fVar347 *
                       (((((fVar347 * 0.00019875691 + 0.0013981999) * fVar347 + 0.008333452) *
                          fVar347 + 0.041665796) * fVar347 + 0.16666666) * fVar347 + fVar222)) *
                       auVar168._4_4_ + fVar121;
                  auVar271._24_4_ =
                       (fVar349 + fVar223 +
                       fVar349 * fVar349 *
                       (((((fVar349 * 0.00019875691 + 0.0013981999) * fVar349 + 0.008333452) *
                          fVar349 + 0.041665796) * fVar349 + 0.16666666) * fVar349 + fVar224)) *
                       auVar168._8_4_ + fVar223;
                  auVar271._28_4_ =
                       auVar152._28_4_ + fVar225 +
                       in_ZMM3._28_4_ + 0.0013981999 + 0.008333452 + 0.041665796 + 0.16666666 +
                       fVar242 + fVar225;
                  auVar152._8_4_ = 0x800000;
                  auVar152._0_8_ = 0x80000000800000;
                  auVar152._12_4_ = 0x800000;
                  auVar152._16_4_ = 0x800000;
                  auVar152._20_4_ = 0x800000;
                  auVar152._24_4_ = 0x800000;
                  auVar152._28_4_ = 0x800000;
                  auVar158 = vmaxps_avx(auVar271,auVar152);
                  auVar168 = vpsrld_avx(auVar158._16_16_,0x17);
                  auVar231._8_4_ = 0x807fffff;
                  auVar231._0_8_ = 0x807fffff807fffff;
                  auVar231._12_4_ = 0x807fffff;
                  auVar231._16_4_ = 0x807fffff;
                  auVar231._20_4_ = 0x807fffff;
                  auVar231._24_4_ = 0x807fffff;
                  auVar231._28_4_ = 0x807fffff;
                  auVar314 = vandps_avx(auVar158,auVar231);
                  auVar207 = vorps_avx(auVar314,auVar308._0_32_);
                  auVar232._8_4_ = 0x3f3504f3;
                  auVar232._0_8_ = 0x3f3504f33f3504f3;
                  auVar232._12_4_ = 0x3f3504f3;
                  auVar232._16_4_ = 0x3f3504f3;
                  auVar232._20_4_ = 0x3f3504f3;
                  auVar232._24_4_ = 0x3f3504f3;
                  auVar232._28_4_ = 0x3f3504f3;
                  auVar152 = vcmpps_avx(auVar232,auVar207,2);
                  auVar314 = vandnps_avx(auVar152,auVar207);
                  fVar322 = auVar207._0_4_ + -1.0 + auVar314._0_4_;
                  fVar339 = auVar207._4_4_ + -1.0 + auVar314._4_4_;
                  fVar341 = auVar207._8_4_ + -1.0 + auVar314._8_4_;
                  fVar343 = auVar207._12_4_ + -1.0 + auVar314._12_4_;
                  fVar345 = auVar207._16_4_ + -1.0 + auVar314._16_4_;
                  fVar347 = auVar207._20_4_ + -1.0 + auVar314._20_4_;
                  fVar349 = auVar207._24_4_ + -1.0 + auVar314._24_4_;
                  auVar168 = vpsubd_avx(auVar168,auVar152._16_16_);
                  auVar243 = vpsrld_avx(auVar158._0_16_,0x17);
                  auVar291._8_4_ = 0xffffff81;
                  auVar291._0_8_ = 0xffffff81ffffff81;
                  auVar291._12_4_ = 0xffffff81;
                  auVar168 = vpaddd_avx(auVar291,auVar168);
                  auVar243 = vpsubd_avx(auVar243,auVar152._0_16_);
                  auVar243 = vpaddd_avx(auVar291,auVar243);
                  auVar153._16_16_ = auVar168;
                  auVar153._0_16_ = auVar243;
                  auVar152 = vcmpps_avx(auVar271,_DAT_005b6fa0,2);
                  auVar158 = vcvtdq2ps_avx(auVar153);
                  auVar34._4_4_ =
                       (fVar339 + auVar158._4_4_ * 0.6931472 +
                       fVar339 * fVar339 *
                       (fVar339 * (fVar339 * (fVar339 * (fVar339 * (fVar339 * (fVar339 * (fVar339 * 
                                                  (fVar339 * (fVar339 * 0.070376836 + -0.1151461) +
                                                  0.116769984) + -0.12420141) + 0.14249323) +
                                                  -0.16668057) + 0.20000714) + -0.24999994) +
                                  0.3333333) + -0.5)) * -2.0;
                  auVar34._0_4_ =
                       (fVar322 + auVar158._0_4_ * 0.6931472 +
                       fVar322 * fVar322 *
                       (fVar322 * (fVar322 * (fVar322 * (fVar322 * (fVar322 * (fVar322 * (fVar322 * 
                                                  (fVar322 * (fVar322 * 0.070376836 + -0.1151461) +
                                                  0.116769984) + -0.12420141) + 0.14249323) +
                                                  -0.16668057) + 0.20000714) + -0.24999994) +
                                  0.3333333) + -0.5)) * -2.0;
                  auVar34._8_4_ =
                       (fVar341 + auVar158._8_4_ * 0.6931472 +
                       fVar341 * fVar341 *
                       (fVar341 * (fVar341 * (fVar341 * (fVar341 * (fVar341 * (fVar341 * (fVar341 * 
                                                  (fVar341 * (fVar341 * 0.070376836 + -0.1151461) +
                                                  0.116769984) + -0.12420141) + 0.14249323) +
                                                  -0.16668057) + 0.20000714) + -0.24999994) +
                                  0.3333333) + -0.5)) * -2.0;
                  auVar34._12_4_ =
                       (fVar343 + auVar158._12_4_ * 0.6931472 +
                       fVar343 * fVar343 *
                       (fVar343 * (fVar343 * (fVar343 * (fVar343 * (fVar343 * (fVar343 * (fVar343 * 
                                                  (fVar343 * (fVar343 * 0.070376836 + -0.1151461) +
                                                  0.116769984) + -0.12420141) + 0.14249323) +
                                                  -0.16668057) + 0.20000714) + -0.24999994) +
                                  0.3333333) + -0.5)) * -2.0;
                  auVar34._16_4_ =
                       (fVar345 + auVar158._16_4_ * 0.6931472 +
                       fVar345 * fVar345 *
                       (fVar345 * (fVar345 * (fVar345 * (fVar345 * (fVar345 * (fVar345 * (fVar345 * 
                                                  (fVar345 * (fVar345 * 0.070376836 + -0.1151461) +
                                                  0.116769984) + -0.12420141) + 0.14249323) +
                                                  -0.16668057) + 0.20000714) + -0.24999994) +
                                  0.3333333) + -0.5)) * -2.0;
                  auVar34._20_4_ =
                       (fVar347 + auVar158._20_4_ * 0.6931472 +
                       fVar347 * fVar347 *
                       (fVar347 * (fVar347 * (fVar347 * (fVar347 * (fVar347 * (fVar347 * (fVar347 * 
                                                  (fVar347 * (fVar347 * 0.070376836 + -0.1151461) +
                                                  0.116769984) + -0.12420141) + 0.14249323) +
                                                  -0.16668057) + 0.20000714) + -0.24999994) +
                                  0.3333333) + -0.5)) * -2.0;
                  auVar34._24_4_ =
                       (fVar349 + auVar158._24_4_ * 0.6931472 +
                       fVar349 * fVar349 *
                       (fVar349 * (fVar349 * (fVar349 * (fVar349 * (fVar349 * (fVar349 * (fVar349 * 
                                                  (fVar349 * (fVar349 * 0.070376836 + -0.1151461) +
                                                  0.116769984) + -0.12420141) + 0.14249323) +
                                                  -0.16668057) + 0.20000714) + -0.24999994) +
                                  0.3333333) + -0.5)) * -2.0;
                  auVar34._28_4_ = auVar207._28_4_ + -1.0 + auVar314._28_4_ + auVar158._28_4_ + 0.0;
                  auVar202._8_4_ = 0x7fffffff;
                  auVar202._0_8_ = 0x7fffffff7fffffff;
                  auVar202._12_4_ = 0x7fffffff;
                  auVar202._16_4_ = 0x7fffffff;
                  auVar202._20_4_ = 0x7fffffff;
                  auVar202._24_4_ = 0x7fffffff;
                  auVar202._28_4_ = 0x7fffffff;
                  auVar314 = vblendvps_avx(auVar34,auVar202,auVar152);
                  auVar203._8_4_ = 0x42b0c0a5;
                  auVar203._0_8_ = 0x42b0c0a542b0c0a5;
                  auVar203._12_4_ = 0x42b0c0a5;
                  auVar203._16_4_ = 0x42b0c0a5;
                  auVar203._20_4_ = 0x42b0c0a5;
                  auVar203._24_4_ = 0x42b0c0a5;
                  auVar203._28_4_ = 0x42b0c0a5;
                  auVar314 = vminps_avx(auVar314,auVar203);
                  auVar204._8_4_ = 0xc2b0c0a5;
                  auVar204._0_8_ = 0xc2b0c0a5c2b0c0a5;
                  auVar204._12_4_ = 0xc2b0c0a5;
                  auVar204._16_4_ = 0xc2b0c0a5;
                  auVar204._20_4_ = 0xc2b0c0a5;
                  auVar204._24_4_ = 0xc2b0c0a5;
                  auVar204._28_4_ = 0xc2b0c0a5;
                  auVar152 = vmaxps_avx(auVar314,auVar204);
                  auVar306 = ZEXT864(0) << 0x20;
                  auVar205._0_4_ = auVar152._0_4_ * 1.442695 + fVar167;
                  auVar205._4_4_ = auVar152._4_4_ * 1.442695 + fVar218;
                  auVar205._8_4_ = auVar152._8_4_ * 1.442695 + fVar219;
                  auVar205._12_4_ = auVar152._12_4_ * 1.442695 + fVar220;
                  auVar205._16_4_ = auVar152._16_4_ * 1.442695 + fVar221;
                  auVar205._20_4_ = auVar152._20_4_ * 1.442695 + fVar222;
                  auVar205._24_4_ = auVar152._24_4_ * 1.442695 + fVar224;
                  auVar205._28_4_ = fVar242 + -88.37626;
                  auVar158 = vroundps_avx(auVar205,1);
                  auVar314 = vcmpps_avx(auVar205,auVar158,1);
                  auVar314 = vandps_avx(auVar314,auVar87);
                  auVar314 = vsubps_avx(auVar158,auVar314);
                  auVar35._4_4_ = auVar314._4_4_ * 0.6931472;
                  auVar35._0_4_ = auVar314._0_4_ * 0.6931472;
                  auVar35._8_4_ = auVar314._8_4_ * 0.6931472;
                  auVar35._12_4_ = auVar314._12_4_ * 0.6931472;
                  auVar35._16_4_ = auVar314._16_4_ * 0.6931472;
                  auVar35._20_4_ = auVar314._20_4_ * 0.6931472;
                  auVar35._24_4_ = auVar314._24_4_ * 0.6931472;
                  auVar35._28_4_ = auVar158._28_4_;
                  auVar152 = vsubps_avx(auVar152,auVar35);
                  fVar322 = auVar152._0_4_;
                  fVar339 = auVar152._4_4_;
                  fVar341 = auVar152._8_4_;
                  fVar343 = auVar152._12_4_;
                  fVar345 = auVar152._16_4_;
                  fVar347 = auVar152._20_4_;
                  fVar349 = auVar152._24_4_;
                  auVar240 = ZEXT3264(auVar87);
                  auVar308 = ZEXT3264(auVar308._0_32_);
                  fVar167 = fVar167 + ((((fVar322 * 0.00019875691 + 0.0013981999) * fVar322 +
                                        0.008333452) * fVar322 + 0.041665796) * fVar322 + 0.16666666
                                      ) * fVar322;
                  fVar218 = fVar218 + ((((fVar339 * 0.00019875691 + 0.0013981999) * fVar339 +
                                        0.008333452) * fVar339 + 0.041665796) * fVar339 + 0.16666666
                                      ) * fVar339;
                  fVar219 = fVar219 + ((((fVar341 * 0.00019875691 + 0.0013981999) * fVar341 +
                                        0.008333452) * fVar341 + 0.041665796) * fVar341 + 0.16666666
                                      ) * fVar341;
                  fVar220 = fVar220 + ((((fVar343 * 0.00019875691 + 0.0013981999) * fVar343 +
                                        0.008333452) * fVar343 + 0.041665796) * fVar343 + 0.16666666
                                      ) * fVar343;
                  fVar221 = fVar221 + ((((fVar345 * 0.00019875691 + 0.0013981999) * fVar345 +
                                        0.008333452) * fVar345 + 0.041665796) * fVar345 + 0.16666666
                                      ) * fVar345;
                  fVar222 = fVar222 + ((((fVar347 * 0.00019875691 + 0.0013981999) * fVar347 +
                                        0.008333452) * fVar347 + 0.041665796) * fVar347 + 0.16666666
                                      ) * fVar347;
                  fVar224 = fVar224 + ((((fVar349 * 0.00019875691 + 0.0013981999) * fVar349 +
                                        0.008333452) * fVar349 + 0.041665796) * fVar349 + 0.16666666
                                      ) * fVar349;
                  in_ZMM7 = ZEXT3264(CONCAT428(fVar242 + auVar271._28_4_ + 0.0013981999 +
                                                         0.008333452 + 0.041665796 + 0.16666666,
                                               CONCAT424(fVar224,CONCAT420(fVar222,CONCAT416(fVar221
                                                  ,CONCAT412(fVar220,CONCAT48(fVar219,CONCAT44(
                                                  fVar218,fVar167))))))));
                  auVar169._0_4_ = (int)auVar314._0_4_;
                  auVar169._4_4_ = (int)auVar314._4_4_;
                  auVar169._8_4_ = (int)auVar314._8_4_;
                  auVar169._12_4_ = (int)auVar314._12_4_;
                  auVar206._16_4_ = (int)auVar314._16_4_;
                  auVar206._0_16_ = auVar169;
                  auVar206._20_4_ = (int)auVar314._20_4_;
                  auVar206._24_4_ = (int)auVar314._24_4_;
                  auVar206._28_4_ = (int)auVar314._28_4_;
                  auVar243 = vpslld_avx(auVar169,0x17);
                  auVar168 = vpslld_avx(auVar206._16_16_,0x17);
                  auVar168 = vpaddd_avx(auVar168,auVar310);
                  auVar243 = vpaddd_avx(auVar243,auVar310);
                  auVar207._16_16_ = auVar168;
                  auVar207._0_16_ = auVar243;
                  auVar154._0_4_ =
                       (fVar322 + fVar79 + fVar322 * fVar322 * fVar167) * auVar243._0_4_ + fVar79;
                  auVar154._4_4_ =
                       (fVar339 + fVar97 + fVar339 * fVar339 * fVar218) * auVar243._4_4_ + fVar97;
                  auVar154._8_4_ =
                       (fVar341 + fVar119 + fVar341 * fVar341 * fVar219) * auVar243._8_4_ + fVar119;
                  auVar154._12_4_ =
                       (fVar343 + fVar120 + fVar343 * fVar343 * fVar220) * auVar243._12_4_ + fVar120
                  ;
                  auVar154._16_4_ =
                       (fVar345 + fVar226 + fVar345 * fVar345 * fVar221) * auVar168._0_4_ + fVar226;
                  auVar154._20_4_ =
                       (fVar347 + fVar121 + fVar347 * fVar347 * fVar222) * auVar168._4_4_ + fVar121;
                  auVar154._24_4_ =
                       (fVar349 + fVar223 + fVar349 * fVar349 * fVar224) * auVar168._8_4_ + fVar223;
                  auVar154._28_4_ = auVar152._28_4_ + fVar225 + auVar158._28_4_ + fVar225;
                  auVar87._8_4_ = 0x40000000;
                  auVar87._0_8_ = 0x4000000040000000;
                  auVar87._12_4_ = 0x40000000;
                  auVar87._16_4_ = 0x40000000;
                  auVar87._20_4_ = 0x40000000;
                  auVar87._24_4_ = 0x40000000;
                  auVar87._28_4_ = 0x40000000;
                  auVar314 = vdivps_avx(auVar87,auVar154);
                  auVar149._0_4_ = auVar314._0_4_ + -1.0;
                  auVar149._4_4_ = auVar314._4_4_ + -1.0;
                  auVar149._8_4_ = auVar314._8_4_ + -1.0;
                  auVar149._12_4_ = auVar314._12_4_ + -1.0;
                  auVar149._16_4_ = auVar314._16_4_ + -1.0;
                  auVar149._20_4_ = auVar314._20_4_ + -1.0;
                  auVar149._24_4_ = auVar314._24_4_ + -1.0;
                  goto LAB_0029fab9;
                case 6:
                  pfVar76 = (float *)(this->super_Deconvolution).activation_params.data;
                  fVar79 = *pfVar76;
                  fVar97 = pfVar76[1];
                  auVar207._4_4_ = fVar97;
                  auVar207._0_4_ = fVar97;
                  auVar207._8_4_ = fVar97;
                  auVar207._12_4_ = fVar97;
                  auVar207._16_4_ = fVar97;
                  auVar207._20_4_ = fVar97;
                  auVar207._24_4_ = fVar97;
                  auVar207._28_4_ = fVar97;
                  auVar158._0_4_ = auVar319._0_4_ * fVar79 + fVar97;
                  auVar158._4_4_ = auVar319._4_4_ * fVar79 + fVar97;
                  auVar158._8_4_ = fVar241 * fVar79 + fVar97;
                  auVar158._12_4_ = fVar287 * fVar79 + fVar97;
                  auVar158._16_4_ = fVar288 * fVar79 + fVar97;
                  auVar158._20_4_ = fVar289 * fVar79 + fVar97;
                  auVar158._24_4_ = fVar290 * fVar79 + fVar97;
                  auVar158._28_4_ = fVar79 + fVar97;
                  auVar314 = vmaxps_avx(auVar152,auVar158);
                  auVar314 = vminps_avx(auVar314,auVar87);
                  auVar149 = auVar314._0_28_;
LAB_0029fab9:
                  in_ZMM3 = ZEXT3264(auVar207);
                  auVar307._0_4_ = auVar319._0_4_ * auVar149._0_4_;
                  auVar307._4_4_ = auVar319._4_4_ * auVar149._4_4_;
                  auVar307._8_4_ = fVar241 * auVar149._8_4_;
                  auVar307._12_4_ = fVar287 * auVar149._12_4_;
                  auVar307._16_4_ = fVar288 * auVar149._16_4_;
                  auVar307._20_4_ = fVar289 * auVar149._20_4_;
                  auVar307._24_4_ = fVar290 * auVar149._24_4_;
                  auVar314 = auVar307._0_32_;
                }
                *pauVar71 = auVar314;
                pauVar71 = pauVar71 + 1;
                uVar62 = uVar62 + 1;
                iVar8 = iVar8 + 1;
              } while (uVar62 != local_198.w);
            }
            iVar75 = iVar75 + 1;
          } while (iVar75 != local_198.h);
        }
        local_258 = (void *)((long)local_258 + 1);
      } while (local_258 != (void *)(long)local_198.c);
    }
    if ((uVar57 == 4) && (uVar68 == 8)) {
      if ((long)local_198.c < 1) goto LAB_002a38ed;
      iVar20 = (this->super_Deconvolution).dilation_w;
      iVar21 = (this->super_Deconvolution).dilation_h;
      iVar46 = (this->super_Deconvolution).stride_w;
      iVar74 = (this->super_Deconvolution).stride_h;
      iVar61 = (this->super_Deconvolution).activation_type;
      pvVar30 = (this->super_Deconvolution).bias_data.data;
      uVar22 = (this->super_Deconvolution).kernel_w;
      uVar51 = (this->super_Deconvolution).kernel_h;
      local_258 = (void *)0x0;
      auVar240 = ZEXT1664(ZEXT816(0) << 0x40);
      auVar308 = ZEXT3264(CONCAT428(0x3f000000,
                                    CONCAT424(0x3f000000,
                                              CONCAT420(0x3f000000,
                                                        CONCAT416(0x3f000000,
                                                                  CONCAT412(0x3f000000,
                                                                            CONCAT48(0x3f000000,
                                                                                                                                                                          
                                                  0x3f0000003f000000)))))));
      auVar306 = ZEXT3264(CONCAT428(0x3f800000,
                                    CONCAT424(0x3f800000,
                                              CONCAT420(0x3f800000,
                                                        CONCAT416(0x3f800000,
                                                                  CONCAT412(0x3f800000,
                                                                            CONCAT48(0x3f800000,
                                                                                                                                                                          
                                                  0x3f8000003f800000)))))));
      auVar301._8_4_ = 0x42b0c0a5;
      auVar301._0_8_ = 0x42b0c0a542b0c0a5;
      auVar301._12_4_ = 0x42b0c0a5;
      auVar301._16_4_ = 0x42b0c0a5;
      auVar301._20_4_ = 0x42b0c0a5;
      auVar301._24_4_ = 0x42b0c0a5;
      auVar301._28_4_ = 0x42b0c0a5;
      auVar305._8_4_ = 0xc2b0c0a5;
      auVar305._0_8_ = 0xc2b0c0a5c2b0c0a5;
      auVar305._12_4_ = 0xc2b0c0a5;
      auVar305._16_4_ = 0xc2b0c0a5;
      auVar305._20_4_ = 0xc2b0c0a5;
      auVar305._24_4_ = 0xc2b0c0a5;
      auVar305._28_4_ = 0xc2b0c0a5;
      do {
        if (0 < local_198.h) {
          iVar69 = bottom_blob->w;
          iVar60 = bottom_blob->h;
          pauVar71 = (undefined1 (*) [32])
                     (local_198.cstep * (long)local_258 * local_198.elemsize + (long)local_198.data)
          ;
          uVar23 = bottom_blob->c;
          iVar75 = 0;
          do {
            if (0 < local_198.w) {
              uVar62 = 0;
              iVar8 = (1 - uVar22) * iVar20;
              do {
                if (pvVar30 == (void *)0x0) {
                  auVar319 = ZEXT1664(ZEXT816(0) << 0x40);
                }
                else {
                  auVar319 = ZEXT3264(*(undefined1 (*) [32])((long)pvVar30 + (long)local_258 * 0x20)
                                     );
                }
                if (0 < (int)uVar23) {
                  pvVar66 = (void *)((this->weight_data_tm).cstep * (long)local_258 *
                                     (this->weight_data_tm).elemsize +
                                    (long)(this->weight_data_tm).data);
                  pvVar25 = bottom_blob->data;
                  uVar58 = 0;
                  do {
                    if (0 < (int)uVar51) {
                      uVar64 = 0;
                      uVar55 = 0;
                      do {
                        iVar47 = (((int)uVar55 - uVar51) + 1) * iVar21 + iVar75;
                        if ((((-1 < iVar47) && (iVar48 = iVar47 / iVar74, iVar47 % iVar74 == 0)) &&
                            (0 < (int)uVar22)) && (iVar48 < iVar60)) {
                          lVar70 = (long)iVar48 * (long)bottom_blob->w * bottom_blob->elemsize +
                                   bottom_blob->cstep * bottom_blob->elemsize * uVar58;
                          uVar65 = uVar64;
                          uVar67 = (ulong)uVar22;
                          iVar47 = iVar8;
                          do {
                            if (((-1 < iVar47) && (iVar48 = iVar47 / iVar46, iVar47 % iVar46 == 0))
                               && (iVar48 < iVar69)) {
                              lVar52 = (long)(iVar48 << 2);
                              fVar79 = *(float *)((long)pvVar25 + lVar52 * 4 + lVar70);
                              fVar97 = *(float *)((long)pvVar25 + lVar52 * 4 + lVar70 + 4);
                              fVar119 = *(float *)((long)pvVar25 + lVar52 * 4 + lVar70 + 8);
                              fVar120 = *(float *)((long)pvVar25 + lVar52 * 4 + lVar70 + 0xc);
                              in_ZMM7 = ZEXT3264(CONCAT428(fVar120,CONCAT424(fVar120,CONCAT420(
                                                  fVar120,CONCAT416(fVar120,CONCAT412(fVar120,
                                                  CONCAT48(fVar120,CONCAT44(fVar120,fVar120))))))));
                              uVar53 = uVar65 & 0xffffffff;
                              pfVar76 = (float *)((long)pvVar66 + uVar53 * 4);
                              pfVar73 = (float *)((long)pvVar66 + uVar53 * 4 + 0x20);
                              pfVar1 = (float *)((long)pvVar66 + uVar53 * 4 + 0x40);
                              fVar226 = fVar97 + fVar119;
                              pfVar2 = (float *)((long)pvVar66 + uVar53 * 4 + 0x60);
                              in_ZMM3 = ZEXT3264(CONCAT428(fVar226,CONCAT424(fVar120 * pfVar2[6],
                                                                             CONCAT420(fVar120 * 
                                                  pfVar2[5],
                                                  CONCAT416(fVar120 * pfVar2[4],
                                                            CONCAT412(fVar120 * pfVar2[3],
                                                                      CONCAT48(fVar120 * pfVar2[2],
                                                                               CONCAT44(fVar120 * 
                                                  pfVar2[1],fVar120 * *pfVar2))))))));
                              auVar319 = ZEXT3264(CONCAT428(auVar319._28_4_ + fVar79 + fVar226 +
                                                            fVar226,CONCAT424(auVar319._24_4_ +
                                                                              fVar79 * pfVar76[6] +
                                                                              fVar97 * pfVar73[6] +
                                                                              fVar119 * pfVar1[6] +
                                                                              fVar120 * pfVar2[6],
                                                                              CONCAT420(auVar319.
                                                  _20_4_ + fVar79 * pfVar76[5] +
                                                  fVar97 * pfVar73[5] + fVar119 * pfVar1[5] +
                                                  fVar120 * pfVar2[5],
                                                  CONCAT416(auVar319._16_4_ + fVar79 * pfVar76[4] +
                                                            fVar97 * pfVar73[4] +
                                                            fVar119 * pfVar1[4] +
                                                            fVar120 * pfVar2[4],
                                                            CONCAT412(auVar319._12_4_ +
                                                                      fVar79 * pfVar76[3] +
                                                                      fVar97 * pfVar73[3] +
                                                                      fVar119 * pfVar1[3] +
                                                                      fVar120 * pfVar2[3],
                                                                      CONCAT48(auVar319._8_4_ +
                                                                               fVar79 * pfVar76[2] +
                                                                               fVar97 * pfVar73[2] +
                                                                               fVar119 * pfVar1[2] +
                                                                               fVar120 * pfVar2[2],
                                                                               CONCAT44(auVar319.
                                                  _4_4_ + fVar79 * pfVar76[1] +
                                                  fVar97 * pfVar73[1] + fVar119 * pfVar1[1] +
                                                  fVar120 * pfVar2[1],
                                                  auVar319._0_4_ + fVar79 * *pfVar76 +
                                                  fVar97 * *pfVar73 + fVar119 * *pfVar1 +
                                                  fVar120 * *pfVar2))))))));
                            }
                            uVar65 = uVar65 + 0x20;
                            iVar47 = iVar47 + iVar20;
                            uVar67 = uVar67 - 1;
                          } while (uVar67 != 0);
                        }
                        uVar55 = uVar55 + 1;
                        uVar64 = uVar64 + (ulong)uVar22 * 0x20;
                      } while (uVar55 != uVar51);
                    }
                    pvVar66 = (void *)((long)pvVar66 + (long)(int)(uVar22 * uVar51 * 0x20) * 4);
                    uVar58 = uVar58 + 1;
                  } while (uVar58 != uVar23);
                }
                auVar316 = auVar319._0_32_;
                fVar241 = auVar319._8_4_;
                fVar287 = auVar319._12_4_;
                fVar288 = auVar319._16_4_;
                fVar289 = auVar319._20_4_;
                fVar290 = auVar319._24_4_;
                fVar167 = auVar308._0_4_;
                fVar218 = auVar308._4_4_;
                fVar219 = auVar308._8_4_;
                fVar220 = auVar308._12_4_;
                fVar221 = auVar308._16_4_;
                fVar222 = auVar308._20_4_;
                fVar224 = auVar308._24_4_;
                fVar242 = auVar308._28_4_;
                auVar314 = auVar306._0_32_;
                fVar79 = auVar306._0_4_;
                fVar97 = auVar306._4_4_;
                fVar119 = auVar306._8_4_;
                fVar120 = auVar306._12_4_;
                fVar226 = auVar306._16_4_;
                fVar121 = auVar306._20_4_;
                fVar223 = auVar306._24_4_;
                fVar225 = auVar306._28_4_;
                auVar320._28_36_ = auVar319._28_36_;
                switch(iVar61) {
                case 1:
                  auVar316 = vmaxps_avx(auVar316,auVar240._0_32_);
                  break;
                case 2:
                  auVar314 = vmaxps_avx(auVar316,SUB6432(ZEXT1664((undefined1  [16])0x0),0));
                  in_ZMM7 = ZEXT3264(auVar314);
                  auVar240 = ZEXT1664(ZEXT816(0) << 0x40);
                  auVar87 = vminps_avx(auVar316,SUB6432(ZEXT1664((undefined1  [16])0x0),0));
                  fVar79 = *(this->super_Deconvolution).activation_params.data;
                  auVar316._0_4_ = fVar79 * auVar87._0_4_ + auVar314._0_4_;
                  auVar316._4_4_ = fVar79 * auVar87._4_4_ + auVar314._4_4_;
                  auVar316._8_4_ = fVar79 * auVar87._8_4_ + auVar314._8_4_;
                  auVar316._12_4_ = fVar79 * auVar87._12_4_ + auVar314._12_4_;
                  auVar316._16_4_ = fVar79 * auVar87._16_4_ + auVar314._16_4_;
                  auVar316._20_4_ = fVar79 * auVar87._20_4_ + auVar314._20_4_;
                  auVar316._24_4_ = fVar79 * auVar87._24_4_ + auVar314._24_4_;
                  auVar316._28_4_ = auVar87._28_4_ + auVar314._28_4_;
                  break;
                case 3:
                  puVar26 = (undefined4 *)(this->super_Deconvolution).activation_params.data;
                  uVar7 = *puVar26;
                  auVar277._4_4_ = uVar7;
                  auVar277._0_4_ = uVar7;
                  auVar277._8_4_ = uVar7;
                  auVar277._12_4_ = uVar7;
                  auVar277._16_4_ = uVar7;
                  auVar277._20_4_ = uVar7;
                  auVar277._24_4_ = uVar7;
                  auVar277._28_4_ = uVar7;
                  uVar7 = puVar26[1];
                  auVar337._4_4_ = uVar7;
                  auVar337._0_4_ = uVar7;
                  auVar337._8_4_ = uVar7;
                  auVar337._12_4_ = uVar7;
                  auVar337._16_4_ = uVar7;
                  auVar337._20_4_ = uVar7;
                  auVar337._24_4_ = uVar7;
                  auVar337._28_4_ = uVar7;
                  auVar314 = vmaxps_avx(auVar316,auVar277);
                  in_ZMM7 = ZEXT3264(auVar314);
                  auVar316 = vminps_avx(auVar337,auVar314);
                  break;
                case 4:
                  auVar278._0_8_ = auVar319._0_8_ ^ 0x8000000080000000;
                  auVar278._8_4_ = -fVar241;
                  auVar278._12_4_ = -fVar287;
                  auVar278._16_4_ = -fVar288;
                  auVar278._20_4_ = -fVar289;
                  auVar278._24_4_ = -fVar290;
                  auVar278._28_4_ = -auVar319._28_4_;
                  auVar117._8_4_ = 0x42b0c0a5;
                  auVar117._0_8_ = 0x42b0c0a542b0c0a5;
                  auVar117._12_4_ = 0x42b0c0a5;
                  auVar117._16_4_ = 0x42b0c0a5;
                  auVar117._20_4_ = 0x42b0c0a5;
                  auVar117._24_4_ = 0x42b0c0a5;
                  auVar117._28_4_ = 0x42b0c0a5;
                  auVar87 = vminps_avx(auVar278,auVar117);
                  auVar118._8_4_ = 0xc2b0c0a5;
                  auVar118._0_8_ = 0xc2b0c0a5c2b0c0a5;
                  auVar118._12_4_ = 0xc2b0c0a5;
                  auVar118._16_4_ = 0xc2b0c0a5;
                  auVar118._20_4_ = 0xc2b0c0a5;
                  auVar118._24_4_ = 0xc2b0c0a5;
                  auVar118._28_4_ = 0xc2b0c0a5;
                  auVar152 = vmaxps_avx(auVar87,auVar118);
                  auVar315._0_4_ = auVar152._0_4_ * 1.442695 + fVar167;
                  auVar315._4_4_ = auVar152._4_4_ * 1.442695 + fVar218;
                  auVar315._8_4_ = auVar152._8_4_ * 1.442695 + fVar219;
                  auVar315._12_4_ = auVar152._12_4_ * 1.442695 + fVar220;
                  auVar315._16_4_ = auVar152._16_4_ * 1.442695 + fVar221;
                  auVar315._20_4_ = auVar152._20_4_ * 1.442695 + fVar222;
                  auVar315._24_4_ = auVar152._24_4_ * 1.442695 + fVar224;
                  auVar315._28_4_ = auVar319._28_4_ + fVar242;
                  auVar158 = vroundps_avx(auVar315,1);
                  auVar87 = vcmpps_avx(auVar315,auVar158,1);
                  auVar87 = vandps_avx(auVar87,auVar314);
                  auVar87 = vsubps_avx(auVar158,auVar87);
                  fVar241 = auVar87._0_4_ * -0.6931472 + auVar152._0_4_;
                  fVar287 = auVar87._4_4_ * -0.6931472 + auVar152._4_4_;
                  fVar288 = auVar87._8_4_ * -0.6931472 + auVar152._8_4_;
                  fVar289 = auVar87._12_4_ * -0.6931472 + auVar152._12_4_;
                  fVar290 = auVar87._16_4_ * -0.6931472 + auVar152._16_4_;
                  fVar322 = auVar87._20_4_ * -0.6931472 + auVar152._20_4_;
                  fVar339 = auVar87._24_4_ * -0.6931472 + auVar152._24_4_;
                  auVar245._0_4_ = (int)auVar87._0_4_;
                  auVar245._4_4_ = (int)auVar87._4_4_;
                  auVar245._8_4_ = (int)auVar87._8_4_;
                  auVar245._12_4_ = (int)auVar87._12_4_;
                  auVar279._16_4_ = (int)auVar87._16_4_;
                  auVar279._0_16_ = auVar245;
                  auVar279._20_4_ = (int)auVar87._20_4_;
                  auVar279._24_4_ = (int)auVar87._24_4_;
                  auVar279._28_4_ = (int)auVar87._28_4_;
                  auVar243 = vpslld_avx(auVar245,0x17);
                  auVar168 = vpslld_avx(auVar279._16_16_,0x17);
                  auVar99._8_4_ = 0x3f800000;
                  auVar99._0_8_ = 0x3f8000003f800000;
                  auVar99._12_4_ = 0x3f800000;
                  auVar168 = vpaddd_avx(auVar168,auVar99);
                  auVar243 = vpaddd_avx(auVar243,auVar99);
                  in_ZMM7 = ZEXT3264(CONCAT1616(auVar168,auVar243));
                  auVar161._0_4_ =
                       (fVar241 + fVar79 +
                       fVar241 * fVar241 *
                       (fVar167 +
                       ((((fVar241 * 0.00019875691 + 0.0013981999) * fVar241 + 0.008333452) *
                         fVar241 + 0.041665796) * fVar241 + 0.16666666) * fVar241)) * auVar243._0_4_
                       + fVar79;
                  auVar161._4_4_ =
                       (fVar287 + fVar97 +
                       fVar287 * fVar287 *
                       (fVar218 +
                       ((((fVar287 * 0.00019875691 + 0.0013981999) * fVar287 + 0.008333452) *
                         fVar287 + 0.041665796) * fVar287 + 0.16666666) * fVar287)) * auVar243._4_4_
                       + fVar97;
                  auVar161._8_4_ =
                       (fVar288 + fVar119 +
                       fVar288 * fVar288 *
                       (fVar219 +
                       ((((fVar288 * 0.00019875691 + 0.0013981999) * fVar288 + 0.008333452) *
                         fVar288 + 0.041665796) * fVar288 + 0.16666666) * fVar288)) * auVar243._8_4_
                       + fVar119;
                  auVar161._12_4_ =
                       (fVar289 + fVar120 +
                       fVar289 * fVar289 *
                       (fVar220 +
                       ((((fVar289 * 0.00019875691 + 0.0013981999) * fVar289 + 0.008333452) *
                         fVar289 + 0.041665796) * fVar289 + 0.16666666) * fVar289)) *
                       auVar243._12_4_ + fVar120;
                  auVar161._16_4_ =
                       (fVar290 + fVar226 +
                       fVar290 * fVar290 *
                       (fVar221 +
                       ((((fVar290 * 0.00019875691 + 0.0013981999) * fVar290 + 0.008333452) *
                         fVar290 + 0.041665796) * fVar290 + 0.16666666) * fVar290)) * auVar168._0_4_
                       + fVar226;
                  auVar161._20_4_ =
                       (fVar322 + fVar121 +
                       fVar322 * fVar322 *
                       (fVar222 +
                       ((((fVar322 * 0.00019875691 + 0.0013981999) * fVar322 + 0.008333452) *
                         fVar322 + 0.041665796) * fVar322 + 0.16666666) * fVar322)) * auVar168._4_4_
                       + fVar121;
                  auVar161._24_4_ =
                       (fVar339 + fVar223 +
                       fVar339 * fVar339 *
                       (fVar224 +
                       ((((fVar339 * 0.00019875691 + 0.0013981999) * fVar339 + 0.008333452) *
                         fVar339 + 0.041665796) * fVar339 + 0.16666666) * fVar339)) * auVar168._8_4_
                       + fVar223;
                  auVar161._28_4_ =
                       auVar158._28_4_ + auVar152._28_4_ + fVar225 + fVar242 + -0.47508308 + fVar225
                  ;
                  auVar316 = vdivps_avx(auVar314,auVar161);
                  break;
                case 5:
                  auVar87 = vminps_avx(auVar316,auVar301);
                  auVar152 = vmaxps_avx(auVar305,auVar87);
                  auVar275._0_4_ = fVar167 + auVar152._0_4_ * 1.442695;
                  auVar275._4_4_ = fVar218 + auVar152._4_4_ * 1.442695;
                  auVar275._8_4_ = fVar219 + auVar152._8_4_ * 1.442695;
                  auVar275._12_4_ = fVar220 + auVar152._12_4_ * 1.442695;
                  auVar275._16_4_ = fVar221 + auVar152._16_4_ * 1.442695;
                  auVar275._20_4_ = fVar222 + auVar152._20_4_ * 1.442695;
                  auVar275._24_4_ = fVar224 + auVar152._24_4_ * 1.442695;
                  auVar275._28_4_ = fVar242 + in_ZMM7._28_4_;
                  auVar158 = vroundps_avx(auVar275,1);
                  auVar87 = vcmpps_avx(auVar275,auVar158,1);
                  auVar87 = vandps_avx(auVar87,auVar314);
                  auVar87 = vsubps_avx(auVar158,auVar87);
                  auVar36._4_4_ = auVar87._4_4_ * 0.6931472;
                  auVar36._0_4_ = auVar87._0_4_ * 0.6931472;
                  auVar36._8_4_ = auVar87._8_4_ * 0.6931472;
                  auVar36._12_4_ = auVar87._12_4_ * 0.6931472;
                  auVar36._16_4_ = auVar87._16_4_ * 0.6931472;
                  auVar36._20_4_ = auVar87._20_4_ * 0.6931472;
                  auVar36._24_4_ = auVar87._24_4_ * 0.6931472;
                  auVar36._28_4_ = auVar158._28_4_;
                  auVar152 = vsubps_avx(auVar152,auVar36);
                  fVar322 = auVar152._0_4_;
                  fVar339 = auVar152._4_4_;
                  fVar341 = auVar152._8_4_;
                  fVar343 = auVar152._12_4_;
                  fVar345 = auVar152._16_4_;
                  fVar347 = auVar152._20_4_;
                  fVar349 = auVar152._24_4_;
                  auVar170._0_4_ = (int)auVar87._0_4_;
                  auVar170._4_4_ = (int)auVar87._4_4_;
                  auVar170._8_4_ = (int)auVar87._8_4_;
                  auVar170._12_4_ = (int)auVar87._12_4_;
                  auVar208._16_4_ = (int)auVar87._16_4_;
                  auVar208._0_16_ = auVar170;
                  auVar208._20_4_ = (int)auVar87._20_4_;
                  auVar208._24_4_ = (int)auVar87._24_4_;
                  auVar208._28_4_ = (int)auVar87._28_4_;
                  auVar243 = vpslld_avx(auVar170,0x17);
                  auVar168 = vpslld_avx(auVar208._16_16_,0x17);
                  auVar233._8_4_ = 0x3f800000;
                  auVar233._0_8_ = 0x3f8000003f800000;
                  auVar233._12_4_ = 0x3f800000;
                  auVar168 = vpaddd_avx(auVar168,auVar233);
                  auVar243 = vpaddd_avx(auVar243,auVar233);
                  auVar276._0_4_ =
                       (fVar322 + fVar79 +
                       fVar322 * fVar322 *
                       (((((fVar322 * 0.00019875691 + 0.0013981999) * fVar322 + 0.008333452) *
                          fVar322 + 0.041665796) * fVar322 + 0.16666666) * fVar322 + fVar167)) *
                       auVar243._0_4_ + fVar79;
                  auVar276._4_4_ =
                       (fVar339 + fVar97 +
                       fVar339 * fVar339 *
                       (((((fVar339 * 0.00019875691 + 0.0013981999) * fVar339 + 0.008333452) *
                          fVar339 + 0.041665796) * fVar339 + 0.16666666) * fVar339 + fVar218)) *
                       auVar243._4_4_ + fVar97;
                  auVar276._8_4_ =
                       (fVar341 + fVar119 +
                       fVar341 * fVar341 *
                       (((((fVar341 * 0.00019875691 + 0.0013981999) * fVar341 + 0.008333452) *
                          fVar341 + 0.041665796) * fVar341 + 0.16666666) * fVar341 + fVar219)) *
                       auVar243._8_4_ + fVar119;
                  auVar276._12_4_ =
                       (fVar343 + fVar120 +
                       fVar343 * fVar343 *
                       (((((fVar343 * 0.00019875691 + 0.0013981999) * fVar343 + 0.008333452) *
                          fVar343 + 0.041665796) * fVar343 + 0.16666666) * fVar343 + fVar220)) *
                       auVar243._12_4_ + fVar120;
                  auVar276._16_4_ =
                       (fVar345 + fVar226 +
                       fVar345 * fVar345 *
                       (((((fVar345 * 0.00019875691 + 0.0013981999) * fVar345 + 0.008333452) *
                          fVar345 + 0.041665796) * fVar345 + 0.16666666) * fVar345 + fVar221)) *
                       auVar168._0_4_ + fVar226;
                  auVar276._20_4_ =
                       (fVar347 + fVar121 +
                       fVar347 * fVar347 *
                       (((((fVar347 * 0.00019875691 + 0.0013981999) * fVar347 + 0.008333452) *
                          fVar347 + 0.041665796) * fVar347 + 0.16666666) * fVar347 + fVar222)) *
                       auVar168._4_4_ + fVar121;
                  auVar276._24_4_ =
                       (fVar349 + fVar223 +
                       fVar349 * fVar349 *
                       (((((fVar349 * 0.00019875691 + 0.0013981999) * fVar349 + 0.008333452) *
                          fVar349 + 0.041665796) * fVar349 + 0.16666666) * fVar349 + fVar224)) *
                       auVar168._8_4_ + fVar223;
                  auVar276._28_4_ =
                       auVar152._28_4_ + fVar225 +
                       in_ZMM3._28_4_ + 0.0013981999 + 0.008333452 + 0.041665796 + 0.16666666 +
                       fVar242 + fVar225;
                  auVar88._8_4_ = 0x800000;
                  auVar88._0_8_ = 0x80000000800000;
                  auVar88._12_4_ = 0x800000;
                  auVar88._16_4_ = 0x800000;
                  auVar88._20_4_ = 0x800000;
                  auVar88._24_4_ = 0x800000;
                  auVar88._28_4_ = 0x800000;
                  auVar158 = vmaxps_avx(auVar276,auVar88);
                  auVar168 = vpsrld_avx(auVar158._16_16_,0x17);
                  auVar89._8_4_ = 0x807fffff;
                  auVar89._0_8_ = 0x807fffff807fffff;
                  auVar89._12_4_ = 0x807fffff;
                  auVar89._16_4_ = 0x807fffff;
                  auVar89._20_4_ = 0x807fffff;
                  auVar89._24_4_ = 0x807fffff;
                  auVar89._28_4_ = 0x807fffff;
                  auVar87 = vandps_avx(auVar158,auVar89);
                  auVar207 = vorps_avx(auVar87,auVar308._0_32_);
                  auVar90._8_4_ = 0x3f3504f3;
                  auVar90._0_8_ = 0x3f3504f33f3504f3;
                  auVar90._12_4_ = 0x3f3504f3;
                  auVar90._16_4_ = 0x3f3504f3;
                  auVar90._20_4_ = 0x3f3504f3;
                  auVar90._24_4_ = 0x3f3504f3;
                  auVar90._28_4_ = 0x3f3504f3;
                  auVar152 = vcmpps_avx(auVar90,auVar207,2);
                  auVar87 = vandnps_avx(auVar152,auVar207);
                  fVar322 = auVar207._0_4_ + -1.0 + auVar87._0_4_;
                  fVar339 = auVar207._4_4_ + -1.0 + auVar87._4_4_;
                  fVar341 = auVar207._8_4_ + -1.0 + auVar87._8_4_;
                  fVar343 = auVar207._12_4_ + -1.0 + auVar87._12_4_;
                  fVar345 = auVar207._16_4_ + -1.0 + auVar87._16_4_;
                  fVar347 = auVar207._20_4_ + -1.0 + auVar87._20_4_;
                  fVar349 = auVar207._24_4_ + -1.0 + auVar87._24_4_;
                  auVar168 = vpsubd_avx(auVar168,auVar152._16_16_);
                  auVar243 = vpsrld_avx(auVar158._0_16_,0x17);
                  auVar81._8_4_ = 0xffffff81;
                  auVar81._0_8_ = 0xffffff81ffffff81;
                  auVar81._12_4_ = 0xffffff81;
                  auVar168 = vpaddd_avx(auVar168,auVar81);
                  auVar243 = vpsubd_avx(auVar243,auVar152._0_16_);
                  auVar243 = vpaddd_avx(auVar243,auVar81);
                  auVar159._16_16_ = auVar168;
                  auVar159._0_16_ = auVar243;
                  auVar240 = ZEXT864(0) << 0x20;
                  auVar152 = vcmpps_avx(auVar276,ZEXT832(0) << 0x20,2);
                  auVar158 = vcvtdq2ps_avx(auVar159);
                  auVar37._4_4_ =
                       (fVar339 + auVar158._4_4_ * 0.6931472 +
                       fVar339 * fVar339 *
                       (fVar339 * (fVar339 * (fVar339 * (fVar339 * (fVar339 * (fVar339 * (fVar339 * 
                                                  (fVar339 * (fVar339 * 0.070376836 + -0.1151461) +
                                                  0.116769984) + -0.12420141) + 0.14249323) +
                                                  -0.16668057) + 0.20000714) + -0.24999994) +
                                  0.3333333) + -0.5)) * -2.0;
                  auVar37._0_4_ =
                       (fVar322 + auVar158._0_4_ * 0.6931472 +
                       fVar322 * fVar322 *
                       (fVar322 * (fVar322 * (fVar322 * (fVar322 * (fVar322 * (fVar322 * (fVar322 * 
                                                  (fVar322 * (fVar322 * 0.070376836 + -0.1151461) +
                                                  0.116769984) + -0.12420141) + 0.14249323) +
                                                  -0.16668057) + 0.20000714) + -0.24999994) +
                                  0.3333333) + -0.5)) * -2.0;
                  auVar37._8_4_ =
                       (fVar341 + auVar158._8_4_ * 0.6931472 +
                       fVar341 * fVar341 *
                       (fVar341 * (fVar341 * (fVar341 * (fVar341 * (fVar341 * (fVar341 * (fVar341 * 
                                                  (fVar341 * (fVar341 * 0.070376836 + -0.1151461) +
                                                  0.116769984) + -0.12420141) + 0.14249323) +
                                                  -0.16668057) + 0.20000714) + -0.24999994) +
                                  0.3333333) + -0.5)) * -2.0;
                  auVar37._12_4_ =
                       (fVar343 + auVar158._12_4_ * 0.6931472 +
                       fVar343 * fVar343 *
                       (fVar343 * (fVar343 * (fVar343 * (fVar343 * (fVar343 * (fVar343 * (fVar343 * 
                                                  (fVar343 * (fVar343 * 0.070376836 + -0.1151461) +
                                                  0.116769984) + -0.12420141) + 0.14249323) +
                                                  -0.16668057) + 0.20000714) + -0.24999994) +
                                  0.3333333) + -0.5)) * -2.0;
                  auVar37._16_4_ =
                       (fVar345 + auVar158._16_4_ * 0.6931472 +
                       fVar345 * fVar345 *
                       (fVar345 * (fVar345 * (fVar345 * (fVar345 * (fVar345 * (fVar345 * (fVar345 * 
                                                  (fVar345 * (fVar345 * 0.070376836 + -0.1151461) +
                                                  0.116769984) + -0.12420141) + 0.14249323) +
                                                  -0.16668057) + 0.20000714) + -0.24999994) +
                                  0.3333333) + -0.5)) * -2.0;
                  auVar37._20_4_ =
                       (fVar347 + auVar158._20_4_ * 0.6931472 +
                       fVar347 * fVar347 *
                       (fVar347 * (fVar347 * (fVar347 * (fVar347 * (fVar347 * (fVar347 * (fVar347 * 
                                                  (fVar347 * (fVar347 * 0.070376836 + -0.1151461) +
                                                  0.116769984) + -0.12420141) + 0.14249323) +
                                                  -0.16668057) + 0.20000714) + -0.24999994) +
                                  0.3333333) + -0.5)) * -2.0;
                  auVar37._24_4_ =
                       (fVar349 + auVar158._24_4_ * 0.6931472 +
                       fVar349 * fVar349 *
                       (fVar349 * (fVar349 * (fVar349 * (fVar349 * (fVar349 * (fVar349 * (fVar349 * 
                                                  (fVar349 * (fVar349 * 0.070376836 + -0.1151461) +
                                                  0.116769984) + -0.12420141) + 0.14249323) +
                                                  -0.16668057) + 0.20000714) + -0.24999994) +
                                  0.3333333) + -0.5)) * -2.0;
                  auVar37._28_4_ = auVar207._28_4_ + -1.0 + auVar87._28_4_ + auVar158._28_4_ + 0.0;
                  auVar209._8_4_ = 0x7fffffff;
                  auVar209._0_8_ = 0x7fffffff7fffffff;
                  auVar209._12_4_ = 0x7fffffff;
                  auVar209._16_4_ = 0x7fffffff;
                  auVar209._20_4_ = 0x7fffffff;
                  auVar209._24_4_ = 0x7fffffff;
                  auVar209._28_4_ = 0x7fffffff;
                  auVar87 = vblendvps_avx(auVar37,auVar209,auVar152);
                  auVar87 = vminps_avx(auVar301,auVar87);
                  auVar152 = vmaxps_avx(auVar305,auVar87);
                  auVar210._0_4_ = auVar152._0_4_ * 1.442695 + fVar167;
                  auVar210._4_4_ = auVar152._4_4_ * 1.442695 + fVar218;
                  auVar210._8_4_ = auVar152._8_4_ * 1.442695 + fVar219;
                  auVar210._12_4_ = auVar152._12_4_ * 1.442695 + fVar220;
                  auVar210._16_4_ = auVar152._16_4_ * 1.442695 + fVar221;
                  auVar210._20_4_ = auVar152._20_4_ * 1.442695 + fVar222;
                  auVar210._24_4_ = auVar152._24_4_ * 1.442695 + fVar224;
                  auVar210._28_4_ = fVar242 + NAN;
                  auVar158 = vroundps_avx(auVar210,1);
                  auVar87 = vcmpps_avx(auVar210,auVar158,1);
                  auVar87 = vandps_avx(auVar87,auVar314);
                  auVar87 = vsubps_avx(auVar158,auVar87);
                  auVar38._4_4_ = auVar87._4_4_ * 0.6931472;
                  auVar38._0_4_ = auVar87._0_4_ * 0.6931472;
                  auVar38._8_4_ = auVar87._8_4_ * 0.6931472;
                  auVar38._12_4_ = auVar87._12_4_ * 0.6931472;
                  auVar38._16_4_ = auVar87._16_4_ * 0.6931472;
                  auVar38._20_4_ = auVar87._20_4_ * 0.6931472;
                  auVar38._24_4_ = auVar87._24_4_ * 0.6931472;
                  auVar38._28_4_ = auVar158._28_4_;
                  auVar152 = vsubps_avx(auVar152,auVar38);
                  fVar322 = auVar152._0_4_;
                  fVar339 = auVar152._4_4_;
                  fVar341 = auVar152._8_4_;
                  fVar343 = auVar152._12_4_;
                  fVar345 = auVar152._16_4_;
                  fVar347 = auVar152._20_4_;
                  fVar349 = auVar152._24_4_;
                  auVar306 = ZEXT3264(auVar314);
                  auVar308 = ZEXT3264(auVar308._0_32_);
                  fVar167 = fVar167 + ((((fVar322 * 0.00019875691 + 0.0013981999) * fVar322 +
                                        0.008333452) * fVar322 + 0.041665796) * fVar322 + 0.16666666
                                      ) * fVar322;
                  fVar218 = fVar218 + ((((fVar339 * 0.00019875691 + 0.0013981999) * fVar339 +
                                        0.008333452) * fVar339 + 0.041665796) * fVar339 + 0.16666666
                                      ) * fVar339;
                  fVar219 = fVar219 + ((((fVar341 * 0.00019875691 + 0.0013981999) * fVar341 +
                                        0.008333452) * fVar341 + 0.041665796) * fVar341 + 0.16666666
                                      ) * fVar341;
                  fVar220 = fVar220 + ((((fVar343 * 0.00019875691 + 0.0013981999) * fVar343 +
                                        0.008333452) * fVar343 + 0.041665796) * fVar343 + 0.16666666
                                      ) * fVar343;
                  fVar221 = fVar221 + ((((fVar345 * 0.00019875691 + 0.0013981999) * fVar345 +
                                        0.008333452) * fVar345 + 0.041665796) * fVar345 + 0.16666666
                                      ) * fVar345;
                  fVar222 = fVar222 + ((((fVar347 * 0.00019875691 + 0.0013981999) * fVar347 +
                                        0.008333452) * fVar347 + 0.041665796) * fVar347 + 0.16666666
                                      ) * fVar347;
                  fVar224 = fVar224 + ((((fVar349 * 0.00019875691 + 0.0013981999) * fVar349 +
                                        0.008333452) * fVar349 + 0.041665796) * fVar349 + 0.16666666
                                      ) * fVar349;
                  in_ZMM7 = ZEXT3264(CONCAT428(fVar242 + auVar276._28_4_ + 0.0013981999 +
                                                         0.008333452 + 0.041665796 + 0.16666666,
                                               CONCAT424(fVar224,CONCAT420(fVar222,CONCAT416(fVar221
                                                  ,CONCAT412(fVar220,CONCAT48(fVar219,CONCAT44(
                                                  fVar218,fVar167))))))));
                  auVar171._0_4_ = (int)auVar87._0_4_;
                  auVar171._4_4_ = (int)auVar87._4_4_;
                  auVar171._8_4_ = (int)auVar87._8_4_;
                  auVar171._12_4_ = (int)auVar87._12_4_;
                  auVar211._16_4_ = (int)auVar87._16_4_;
                  auVar211._0_16_ = auVar171;
                  auVar211._20_4_ = (int)auVar87._20_4_;
                  auVar211._24_4_ = (int)auVar87._24_4_;
                  auVar211._28_4_ = (int)auVar87._28_4_;
                  auVar243 = vpslld_avx(auVar171,0x17);
                  auVar168 = vpslld_avx(auVar211._16_16_,0x17);
                  auVar98._8_4_ = 0x3f800000;
                  auVar98._0_8_ = 0x3f8000003f800000;
                  auVar98._12_4_ = 0x3f800000;
                  auVar168 = vpaddd_avx(auVar168,auVar98);
                  auVar243 = vpaddd_avx(auVar243,auVar98);
                  auVar212._16_16_ = auVar168;
                  auVar212._0_16_ = auVar243;
                  auVar160._0_4_ =
                       (fVar322 + fVar79 + fVar322 * fVar322 * fVar167) * auVar243._0_4_ + fVar79;
                  auVar160._4_4_ =
                       (fVar339 + fVar97 + fVar339 * fVar339 * fVar218) * auVar243._4_4_ + fVar97;
                  auVar160._8_4_ =
                       (fVar341 + fVar119 + fVar341 * fVar341 * fVar219) * auVar243._8_4_ + fVar119;
                  auVar160._12_4_ =
                       (fVar343 + fVar120 + fVar343 * fVar343 * fVar220) * auVar243._12_4_ + fVar120
                  ;
                  auVar160._16_4_ =
                       (fVar345 + fVar226 + fVar345 * fVar345 * fVar221) * auVar168._0_4_ + fVar226;
                  auVar160._20_4_ =
                       (fVar347 + fVar121 + fVar347 * fVar347 * fVar222) * auVar168._4_4_ + fVar121;
                  auVar160._24_4_ =
                       (fVar349 + fVar223 + fVar349 * fVar349 * fVar224) * auVar168._8_4_ + fVar223;
                  auVar160._28_4_ = auVar152._28_4_ + fVar225 + auVar158._28_4_ + fVar225;
                  auVar116._8_4_ = 0x40000000;
                  auVar116._0_8_ = 0x4000000040000000;
                  auVar116._12_4_ = 0x40000000;
                  auVar116._16_4_ = 0x40000000;
                  auVar116._20_4_ = 0x40000000;
                  auVar116._24_4_ = 0x40000000;
                  auVar116._28_4_ = 0x40000000;
                  auVar314 = vdivps_avx(auVar116,auVar160);
                  auVar150._0_4_ = auVar314._0_4_ + -1.0;
                  auVar150._4_4_ = auVar314._4_4_ + -1.0;
                  auVar150._8_4_ = auVar314._8_4_ + -1.0;
                  auVar150._12_4_ = auVar314._12_4_ + -1.0;
                  auVar150._16_4_ = auVar314._16_4_ + -1.0;
                  auVar150._20_4_ = auVar314._20_4_ + -1.0;
                  auVar150._24_4_ = auVar314._24_4_ + -1.0;
                  goto LAB_002a030a;
                case 6:
                  pfVar76 = (float *)(this->super_Deconvolution).activation_params.data;
                  fVar79 = *pfVar76;
                  fVar97 = pfVar76[1];
                  auVar212._4_4_ = fVar97;
                  auVar212._0_4_ = fVar97;
                  auVar212._8_4_ = fVar97;
                  auVar212._12_4_ = fVar97;
                  auVar212._16_4_ = fVar97;
                  auVar212._20_4_ = fVar97;
                  auVar212._24_4_ = fVar97;
                  auVar212._28_4_ = fVar97;
                  auVar162._0_4_ = auVar319._0_4_ * fVar79 + fVar97;
                  auVar162._4_4_ = auVar319._4_4_ * fVar79 + fVar97;
                  auVar162._8_4_ = fVar241 * fVar79 + fVar97;
                  auVar162._12_4_ = fVar287 * fVar79 + fVar97;
                  auVar162._16_4_ = fVar288 * fVar79 + fVar97;
                  auVar162._20_4_ = fVar289 * fVar79 + fVar97;
                  auVar162._24_4_ = fVar290 * fVar79 + fVar97;
                  auVar162._28_4_ = fVar79 + fVar97;
                  auVar87 = vmaxps_avx(auVar162,auVar240._0_32_);
                  auVar314 = vminps_avx(auVar87,auVar314);
                  auVar150 = auVar314._0_28_;
LAB_002a030a:
                  in_ZMM3 = ZEXT3264(auVar212);
                  auVar320._0_4_ = auVar319._0_4_ * auVar150._0_4_;
                  auVar320._4_4_ = auVar319._4_4_ * auVar150._4_4_;
                  auVar320._8_4_ = fVar241 * auVar150._8_4_;
                  auVar320._12_4_ = fVar287 * auVar150._12_4_;
                  auVar320._16_4_ = fVar288 * auVar150._16_4_;
                  auVar320._20_4_ = fVar289 * auVar150._20_4_;
                  auVar320._24_4_ = fVar290 * auVar150._24_4_;
                  auVar316 = auVar320._0_32_;
                }
                *pauVar71 = auVar316;
                pauVar71 = pauVar71 + 1;
                uVar62 = uVar62 + 1;
                iVar8 = iVar8 + 1;
              } while (uVar62 != local_198.w);
            }
            iVar75 = iVar75 + 1;
          } while (iVar75 != local_198.h);
        }
        local_258 = (void *)((long)local_258 + 1);
      } while (local_258 != (void *)(long)local_198.c);
    }
    if ((uVar57 == 8) && (uVar68 == 4)) {
      if ((long)local_198.c < 1) goto LAB_002a38ed;
      iVar20 = (this->super_Deconvolution).dilation_w;
      iVar21 = (this->super_Deconvolution).dilation_h;
      iVar46 = (this->super_Deconvolution).stride_w;
      iVar74 = (this->super_Deconvolution).stride_h;
      iVar61 = (this->super_Deconvolution).activation_type;
      pvVar30 = (this->super_Deconvolution).bias_data.data;
      uVar22 = (this->super_Deconvolution).kernel_w;
      uVar51 = (this->super_Deconvolution).kernel_h;
      local_258 = (void *)0x0;
      auVar306 = ZEXT1664(ZEXT816(0) << 0x40);
      auVar234._8_4_ = 0x3f000000;
      auVar234._0_8_ = 0x3f0000003f000000;
      auVar234._12_4_ = 0x3f000000;
      auVar240 = ZEXT1664(CONCAT412(0x3f800000,CONCAT48(0x3f800000,0x3f8000003f800000)));
      do {
        if (0 < local_198.h) {
          iVar69 = bottom_blob->w;
          iVar60 = bottom_blob->h;
          pauVar72 = (undefined1 (*) [16])
                     (local_198.cstep * (long)local_258 * local_198.elemsize + (long)local_198.data)
          ;
          uVar23 = bottom_blob->c;
          iVar75 = 0;
          do {
            if (0 < local_198.w) {
              uVar62 = 0;
              iVar8 = (1 - uVar22) * iVar20;
              do {
                if (pvVar30 == (void *)0x0) {
                  auVar308 = ZEXT1664((undefined1  [16])0x0);
                }
                else {
                  auVar308 = ZEXT1664(*(undefined1 (*) [16])((long)pvVar30 + (long)local_258 * 0x10)
                                     );
                }
                auVar102 = auVar308._0_16_;
                if (0 < (int)uVar23) {
                  pvVar66 = (void *)((this->weight_data_tm).cstep * (long)local_258 *
                                     (this->weight_data_tm).elemsize +
                                    (long)(this->weight_data_tm).data);
                  pvVar25 = bottom_blob->data;
                  uVar58 = 0;
                  do {
                    if (0 < (int)uVar51) {
                      uVar55 = 0;
                      uVar64 = 0;
                      do {
                        iVar47 = (((int)uVar64 - uVar51) + 1) * iVar21 + iVar75;
                        if ((((-1 < iVar47) && (iVar48 = iVar47 / iVar74, iVar47 % iVar74 == 0)) &&
                            (0 < (int)uVar22)) && (iVar48 < iVar60)) {
                          lVar70 = (long)iVar48 * (long)bottom_blob->w * bottom_blob->elemsize +
                                   bottom_blob->cstep * bottom_blob->elemsize * uVar58;
                          uVar65 = uVar55;
                          uVar67 = (ulong)uVar22;
                          iVar47 = iVar8;
                          do {
                            if (((-1 < iVar47) && (iVar48 = iVar47 / iVar46, iVar47 % iVar46 == 0))
                               && (iVar48 < iVar69)) {
                              lVar52 = (long)(iVar48 << 3);
                              fVar79 = *(float *)((long)pvVar25 + lVar52 * 4 + lVar70);
                              fVar97 = *(float *)((long)pvVar25 + lVar52 * 4 + lVar70 + 4);
                              fVar119 = *(float *)((long)pvVar25 + lVar52 * 4 + lVar70 + 8);
                              fVar120 = *(float *)((long)pvVar25 + lVar52 * 4 + lVar70 + 0xc);
                              fVar226 = *(float *)((long)pvVar25 + lVar52 * 4 + lVar70 + 0x10);
                              fVar121 = *(float *)((long)pvVar25 + lVar52 * 4 + lVar70 + 0x14);
                              fVar223 = *(float *)((long)pvVar25 + lVar52 * 4 + lVar70 + 0x18);
                              fVar225 = *(float *)((long)pvVar25 + lVar52 * 4 + lVar70 + 0x1c);
                              uVar53 = uVar65 & 0xffffffff;
                              pfVar76 = (float *)((long)pvVar66 + uVar53 * 4);
                              pfVar73 = (float *)((long)pvVar66 + uVar53 * 4 + 0x10);
                              pfVar1 = (float *)((long)pvVar66 + uVar53 * 4 + 0x20);
                              pfVar2 = (float *)((long)pvVar66 + uVar53 * 4 + 0x30);
                              pfVar3 = (float *)((long)pvVar66 + uVar53 * 4 + 0x40);
                              in_ZMM7 = ZEXT1664(CONCAT412(fVar226 * pfVar3[3],
                                                           CONCAT48(fVar226 * pfVar3[2],
                                                                    CONCAT44(fVar226 * pfVar3[1],
                                                                             fVar226 * *pfVar3))));
                              pfVar4 = (float *)((long)pvVar66 + uVar53 * 4 + 0x50);
                              pfVar5 = (float *)((long)pvVar66 + uVar53 * 4 + 0x60);
                              pfVar6 = (float *)((long)pvVar66 + uVar53 * 4 + 0x70);
                              in_ZMM3 = ZEXT1664(CONCAT412(fVar225 * pfVar6[3],
                                                           CONCAT48(fVar225 * pfVar6[2],
                                                                    CONCAT44(fVar225 * pfVar6[1],
                                                                             fVar225 * *pfVar6))));
                              auVar308 = ZEXT1664(CONCAT412(fVar79 * pfVar76[3] + auVar308._12_4_ +
                                                            fVar97 * pfVar73[3] +
                                                            fVar119 * pfVar1[3] +
                                                            fVar120 * pfVar2[3] +
                                                            fVar226 * pfVar3[3] +
                                                            fVar121 * pfVar4[3] +
                                                            fVar223 * pfVar5[3] +
                                                            fVar225 * pfVar6[3],
                                                            CONCAT48(fVar79 * pfVar76[2] +
                                                                     auVar308._8_4_ +
                                                                     fVar97 * pfVar73[2] +
                                                                     fVar119 * pfVar1[2] +
                                                                     fVar120 * pfVar2[2] +
                                                                     fVar226 * pfVar3[2] +
                                                                     fVar121 * pfVar4[2] +
                                                                     fVar223 * pfVar5[2] +
                                                                     fVar225 * pfVar6[2],
                                                                     CONCAT44(fVar79 * pfVar76[1] +
                                                                              auVar308._4_4_ +
                                                                              fVar97 * pfVar73[1] +
                                                                              fVar119 * pfVar1[1] +
                                                                              fVar120 * pfVar2[1] +
                                                                              fVar226 * pfVar3[1] +
                                                                              fVar121 * pfVar4[1] +
                                                                              fVar223 * pfVar5[1] +
                                                                              fVar225 * pfVar6[1],
                                                                              fVar79 * *pfVar76 +
                                                                              auVar308._0_4_ +
                                                                              fVar97 * *pfVar73 +
                                                                              fVar119 * *pfVar1 +
                                                                              fVar120 * *pfVar2 +
                                                                              fVar226 * *pfVar3 +
                                                                              fVar121 * *pfVar4 +
                                                                              fVar223 * *pfVar5 +
                                                                              fVar225 * *pfVar6))));
                            }
                            uVar65 = uVar65 + 0x20;
                            iVar47 = iVar47 + iVar20;
                            uVar67 = uVar67 - 1;
                          } while (uVar67 != 0);
                        }
                        uVar64 = uVar64 + 1;
                        uVar55 = uVar55 + (ulong)uVar22 * 0x20;
                      } while (uVar64 != uVar51);
                    }
                    auVar102 = auVar308._0_16_;
                    pvVar66 = (void *)((long)pvVar66 + (long)(int)(uVar22 * uVar51 * 0x20) * 4);
                    uVar58 = uVar58 + 1;
                  } while (uVar58 != uVar23);
                }
                auVar243 = auVar306._0_16_;
                auVar168 = auVar240._0_16_;
                fVar79 = auVar240._0_4_;
                fVar97 = auVar240._4_4_;
                fVar119 = auVar240._8_4_;
                fVar120 = auVar240._12_4_;
                fVar226 = auVar102._4_4_;
                fVar121 = auVar102._8_4_;
                fVar223 = auVar102._12_4_;
                switch(iVar61) {
                case 1:
                  auVar102 = vmaxps_avx(auVar243,auVar102);
                  break;
                case 2:
                  auVar168 = vmaxps_avx(auVar243,auVar102);
                  in_ZMM7 = ZEXT1664(auVar168);
                  auVar243 = vminps_avx(auVar243,auVar102);
                  fVar79 = *(this->super_Deconvolution).activation_params.data;
                  auVar102._0_4_ = fVar79 * auVar243._0_4_ + auVar168._0_4_;
                  auVar102._4_4_ = fVar79 * auVar243._4_4_ + auVar168._4_4_;
                  auVar102._8_4_ = fVar79 * auVar243._8_4_ + auVar168._8_4_;
                  auVar102._12_4_ = fVar79 * auVar243._12_4_ + auVar168._12_4_;
                  break;
                case 3:
                  puVar26 = (undefined4 *)(this->super_Deconvolution).activation_params.data;
                  uVar7 = *puVar26;
                  auVar250._4_4_ = uVar7;
                  auVar250._0_4_ = uVar7;
                  auVar250._8_4_ = uVar7;
                  auVar250._12_4_ = uVar7;
                  in_ZMM7 = ZEXT1664(auVar250);
                  uVar7 = puVar26[1];
                  auVar326._4_4_ = uVar7;
                  auVar326._0_4_ = uVar7;
                  auVar326._8_4_ = uVar7;
                  auVar326._12_4_ = uVar7;
                  auVar168 = vmaxps_avx(auVar102,auVar250);
                  auVar102 = vminps_avx(auVar326,auVar168);
                  break;
                case 4:
                  auVar100._0_8_ = auVar102._0_8_ ^ 0x8000000080000000;
                  auVar100._8_4_ = -fVar121;
                  auVar100._12_4_ = -fVar223;
                  auVar126._8_4_ = 0x42b0c0a5;
                  auVar126._0_8_ = 0x42b0c0a542b0c0a5;
                  auVar126._12_4_ = 0x42b0c0a5;
                  auVar243 = vminps_avx(auVar100,auVar126);
                  auVar127._8_4_ = 0xc2b0c0a5;
                  auVar127._0_8_ = 0xc2b0c0a5c2b0c0a5;
                  auVar127._12_4_ = 0xc2b0c0a5;
                  auVar169 = vmaxps_avx(auVar243,auVar127);
                  auVar251._0_4_ = auVar169._0_4_ * 1.442695 + 0.5;
                  auVar251._4_4_ = auVar169._4_4_ * 1.442695 + 0.5;
                  auVar251._8_4_ = auVar169._8_4_ * 1.442695 + 0.5;
                  auVar251._12_4_ = auVar169._12_4_ * 1.442695 + 0.5;
                  auVar327._0_4_ = (int)auVar251._0_4_;
                  auVar327._4_4_ = (int)auVar251._4_4_;
                  auVar327._8_4_ = (int)auVar251._8_4_;
                  auVar327._12_4_ = (int)auVar251._12_4_;
                  auVar310 = vcvtdq2ps_avx(auVar327);
                  auVar243 = vcmpps_avx(auVar251,auVar310,1);
                  auVar243 = vandps_avx(auVar243,auVar168);
                  auVar243 = vsubps_avx(auVar310,auVar243);
                  fVar226 = auVar243._0_4_ * -0.6931472 + auVar169._0_4_;
                  fVar121 = auVar243._4_4_ * -0.6931472 + auVar169._4_4_;
                  fVar223 = auVar243._8_4_ * -0.6931472 + auVar169._8_4_;
                  fVar225 = auVar243._12_4_ * -0.6931472 + auVar169._12_4_;
                  auVar252._0_4_ = (int)auVar243._0_4_;
                  auVar252._4_4_ = (int)auVar243._4_4_;
                  auVar252._8_4_ = (int)auVar243._8_4_;
                  auVar252._12_4_ = (int)auVar243._12_4_;
                  auVar243 = vpslld_avx(auVar252,0x17);
                  auVar243 = vpaddd_avx(auVar243,auVar168);
                  in_ZMM7 = ZEXT1664(auVar243);
                  auVar101._0_4_ =
                       (fVar226 * fVar226 *
                        (((((fVar226 * 0.00019875691 + 0.0013981999) * fVar226 + 0.008333452) *
                           fVar226 + 0.041665796) * fVar226 + 0.16666666) * fVar226 + 0.5) +
                       fVar226 + fVar79) * auVar243._0_4_ + fVar79;
                  auVar101._4_4_ =
                       (fVar121 * fVar121 *
                        (((((fVar121 * 0.00019875691 + 0.0013981999) * fVar121 + 0.008333452) *
                           fVar121 + 0.041665796) * fVar121 + 0.16666666) * fVar121 + 0.5) +
                       fVar121 + fVar97) * auVar243._4_4_ + fVar97;
                  auVar101._8_4_ =
                       (fVar223 * fVar223 *
                        (((((fVar223 * 0.00019875691 + 0.0013981999) * fVar223 + 0.008333452) *
                           fVar223 + 0.041665796) * fVar223 + 0.16666666) * fVar223 + 0.5) +
                       fVar223 + fVar119) * auVar243._8_4_ + fVar119;
                  auVar101._12_4_ =
                       (fVar225 * fVar225 *
                        (((((fVar225 * 0.00019875691 + 0.0013981999) * fVar225 + 0.008333452) *
                           fVar225 + 0.041665796) * fVar225 + 0.16666666) * fVar225 + 0.5) +
                       fVar225 + fVar120) * auVar243._12_4_ + fVar120;
                  auVar102 = vdivps_avx(auVar168,auVar101);
                  break;
                case 5:
                  auVar227._8_4_ = 0x42b0c0a5;
                  auVar227._0_8_ = 0x42b0c0a542b0c0a5;
                  auVar227._12_4_ = 0x42b0c0a5;
                  auVar243 = vminps_avx(auVar102,auVar227);
                  auVar292._8_4_ = 0xc2b0c0a5;
                  auVar292._0_8_ = 0xc2b0c0a5c2b0c0a5;
                  auVar292._12_4_ = 0xc2b0c0a5;
                  auVar169 = vmaxps_avx(auVar292,auVar243);
                  auVar309._0_4_ = auVar169._0_4_ * 1.442695 + 0.5;
                  auVar309._4_4_ = auVar169._4_4_ * 1.442695 + 0.5;
                  auVar309._8_4_ = auVar169._8_4_ * 1.442695 + 0.5;
                  auVar309._12_4_ = auVar169._12_4_ * 1.442695 + 0.5;
                  auVar324._0_4_ = (int)auVar309._0_4_;
                  auVar324._4_4_ = (int)auVar309._4_4_;
                  auVar324._8_4_ = (int)auVar309._8_4_;
                  auVar324._12_4_ = (int)auVar309._12_4_;
                  auVar310 = vcvtdq2ps_avx(auVar324);
                  auVar243 = vcmpps_avx(auVar309,auVar310,1);
                  auVar243 = vandps_avx(auVar243,auVar168);
                  auVar243 = vsubps_avx(auVar310,auVar243);
                  auVar325._0_4_ = auVar243._0_4_ * 0.6931472;
                  auVar325._4_4_ = auVar243._4_4_ * 0.6931472;
                  auVar325._8_4_ = auVar243._8_4_ * 0.6931472;
                  auVar325._12_4_ = auVar243._12_4_ * 0.6931472;
                  auVar310 = vsubps_avx(auVar169,auVar325);
                  fVar225 = auVar310._0_4_;
                  fVar167 = auVar310._4_4_;
                  fVar218 = auVar310._8_4_;
                  fVar219 = auVar310._12_4_;
                  auVar246._0_4_ = (int)auVar243._0_4_;
                  auVar246._4_4_ = (int)auVar243._4_4_;
                  auVar246._8_4_ = (int)auVar243._8_4_;
                  auVar246._12_4_ = (int)auVar243._12_4_;
                  auVar243 = vpslld_avx(auVar246,0x17);
                  auVar243 = vpaddd_avx(auVar243,auVar168);
                  auVar247._0_4_ =
                       (fVar225 + fVar79 +
                       fVar225 * fVar225 *
                       (((((fVar225 * 0.00019875691 + 0.0013981999) * fVar225 + 0.008333452) *
                          fVar225 + 0.041665796) * fVar225 + 0.16666666) * fVar225 + 0.5)) *
                       auVar243._0_4_ + fVar79;
                  auVar247._4_4_ =
                       (fVar167 + fVar97 +
                       fVar167 * fVar167 *
                       (((((fVar167 * 0.00019875691 + 0.0013981999) * fVar167 + 0.008333452) *
                          fVar167 + 0.041665796) * fVar167 + 0.16666666) * fVar167 + 0.5)) *
                       auVar243._4_4_ + fVar97;
                  auVar247._8_4_ =
                       (fVar218 + fVar119 +
                       fVar218 * fVar218 *
                       (((((fVar218 * 0.00019875691 + 0.0013981999) * fVar218 + 0.008333452) *
                          fVar218 + 0.041665796) * fVar218 + 0.16666666) * fVar218 + 0.5)) *
                       auVar243._8_4_ + fVar119;
                  auVar247._12_4_ =
                       (fVar219 + fVar120 +
                       fVar219 * fVar219 *
                       (((((fVar219 * 0.00019875691 + 0.0013981999) * fVar219 + 0.008333452) *
                          fVar219 + 0.041665796) * fVar219 + 0.16666666) * fVar219 + 0.5)) *
                       auVar243._12_4_ + fVar120;
                  auVar122._8_4_ = 0x800000;
                  auVar122._0_8_ = 0x80000000800000;
                  auVar122._12_4_ = 0x800000;
                  auVar243 = vmaxps_avx(auVar247,auVar122);
                  auVar310 = vpsrld_avx(auVar243,0x17);
                  auVar172._8_4_ = 0xffffff82;
                  auVar172._0_8_ = 0xffffff82ffffff82;
                  auVar172._12_4_ = 0xffffff82;
                  auVar310 = vpaddd_avx(auVar310,auVar172);
                  auVar173._8_4_ = 0x807fffff;
                  auVar173._0_8_ = 0x807fffff807fffff;
                  auVar173._12_4_ = 0x807fffff;
                  auVar243 = vandps_avx(auVar243,auVar173);
                  auVar291 = vorps_avx(auVar243,auVar234);
                  auVar169 = vcvtdq2ps_avx(auVar310);
                  auVar174._8_4_ = 0x3f3504f3;
                  auVar174._0_8_ = 0x3f3504f33f3504f3;
                  auVar174._12_4_ = 0x3f3504f3;
                  auVar310 = vcmpps_avx(auVar291,auVar174,1);
                  auVar243 = vandps_avx(auVar310,auVar291);
                  fVar225 = auVar291._0_4_ + -1.0 + auVar243._0_4_;
                  fVar167 = auVar291._4_4_ + -1.0 + auVar243._4_4_;
                  fVar218 = auVar291._8_4_ + -1.0 + auVar243._8_4_;
                  fVar219 = auVar291._12_4_ + -1.0 + auVar243._12_4_;
                  auVar243 = vandps_avx(auVar310,auVar168);
                  auVar310 = vsubps_avx(auVar169,auVar243);
                  auVar243 = vcmpps_avx(auVar247,_DAT_005b3ce0,2);
                  auVar123._0_4_ =
                       (fVar225 * fVar225 *
                        (((((((((fVar225 * 0.070376836 + -0.1151461) * fVar225 + 0.116769984) *
                               fVar225 + -0.12420141) * fVar225 + 0.14249323) * fVar225 +
                            -0.16668057) * fVar225 + 0.20000714) * fVar225 + -0.24999994) * fVar225
                         + 0.3333333) * fVar225 + -0.5) + auVar310._0_4_ * 0.6931472 + fVar225) *
                       -2.0;
                  auVar123._4_4_ =
                       (fVar167 * fVar167 *
                        (((((((((fVar167 * 0.070376836 + -0.1151461) * fVar167 + 0.116769984) *
                               fVar167 + -0.12420141) * fVar167 + 0.14249323) * fVar167 +
                            -0.16668057) * fVar167 + 0.20000714) * fVar167 + -0.24999994) * fVar167
                         + 0.3333333) * fVar167 + -0.5) + auVar310._4_4_ * 0.6931472 + fVar167) *
                       -2.0;
                  auVar123._8_4_ =
                       (fVar218 * fVar218 *
                        (((((((((fVar218 * 0.070376836 + -0.1151461) * fVar218 + 0.116769984) *
                               fVar218 + -0.12420141) * fVar218 + 0.14249323) * fVar218 +
                            -0.16668057) * fVar218 + 0.20000714) * fVar218 + -0.24999994) * fVar218
                         + 0.3333333) * fVar218 + -0.5) + auVar310._8_4_ * 0.6931472 + fVar218) *
                       -2.0;
                  auVar123._12_4_ =
                       (fVar219 * fVar219 *
                        (((((((((fVar219 * 0.070376836 + -0.1151461) * fVar219 + 0.116769984) *
                               fVar219 + -0.12420141) * fVar219 + 0.14249323) * fVar219 +
                            -0.16668057) * fVar219 + 0.20000714) * fVar219 + -0.24999994) * fVar219
                         + 0.3333333) * fVar219 + -0.5) + auVar310._12_4_ * 0.6931472 + fVar219) *
                       -2.0;
                  auVar175._8_4_ = 0x7fffffff;
                  auVar175._0_8_ = 0x7fffffff7fffffff;
                  auVar175._12_4_ = 0x7fffffff;
                  auVar243 = vblendvps_avx(auVar123,auVar175,auVar243);
                  auVar176._8_4_ = 0x42b0c0a5;
                  auVar176._0_8_ = 0x42b0c0a542b0c0a5;
                  auVar176._12_4_ = 0x42b0c0a5;
                  auVar243 = vminps_avx(auVar243,auVar176);
                  auVar177._8_4_ = 0xc2b0c0a5;
                  auVar177._0_8_ = 0xc2b0c0a5c2b0c0a5;
                  auVar177._12_4_ = 0xc2b0c0a5;
                  auVar169 = vmaxps_avx(auVar243,auVar177);
                  auVar178._0_4_ = auVar169._0_4_ * 1.442695 + 0.5;
                  auVar178._4_4_ = auVar169._4_4_ * 1.442695 + 0.5;
                  auVar178._8_4_ = auVar169._8_4_ * 1.442695 + 0.5;
                  auVar178._12_4_ = auVar169._12_4_ * 1.442695 + 0.5;
                  auVar248._0_4_ = (int)auVar178._0_4_;
                  auVar248._4_4_ = (int)auVar178._4_4_;
                  auVar248._8_4_ = (int)auVar178._8_4_;
                  auVar248._12_4_ = (int)auVar178._12_4_;
                  auVar310 = vcvtdq2ps_avx(auVar248);
                  auVar243 = vcmpps_avx(auVar178,auVar310,1);
                  auVar243 = vandps_avx(auVar243,auVar168);
                  auVar243 = vsubps_avx(auVar310,auVar243);
                  auVar249._0_4_ = auVar243._0_4_ * 0.6931472;
                  auVar249._4_4_ = auVar243._4_4_ * 0.6931472;
                  auVar249._8_4_ = auVar243._8_4_ * 0.6931472;
                  auVar249._12_4_ = auVar243._12_4_ * 0.6931472;
                  auVar240 = ZEXT1664(auVar168);
                  auVar310 = vsubps_avx(auVar169,auVar249);
                  fVar225 = auVar310._0_4_;
                  fVar167 = auVar310._4_4_;
                  fVar218 = auVar310._8_4_;
                  fVar219 = auVar310._12_4_;
                  auVar306 = ZEXT864(0) << 0x20;
                  fVar220 = (((((fVar225 * 0.00019875691 + 0.0013981999) * fVar225 + 0.008333452) *
                               fVar225 + 0.041665796) * fVar225 + 0.16666666) * fVar225 + 0.5) *
                            fVar225 * fVar225;
                  fVar221 = (((((fVar167 * 0.00019875691 + 0.0013981999) * fVar167 + 0.008333452) *
                               fVar167 + 0.041665796) * fVar167 + 0.16666666) * fVar167 + 0.5) *
                            fVar167 * fVar167;
                  fVar222 = (((((fVar218 * 0.00019875691 + 0.0013981999) * fVar218 + 0.008333452) *
                               fVar218 + 0.041665796) * fVar218 + 0.16666666) * fVar218 + 0.5) *
                            fVar218 * fVar218;
                  fVar224 = (((((fVar219 * 0.00019875691 + 0.0013981999) * fVar219 + 0.008333452) *
                               fVar219 + 0.041665796) * fVar219 + 0.16666666) * fVar219 + 0.5) *
                            fVar219 * fVar219;
                  in_ZMM7 = ZEXT1664(CONCAT412(fVar224,CONCAT48(fVar222,CONCAT44(fVar221,fVar220))))
                  ;
                  auVar179._0_4_ = (int)auVar243._0_4_;
                  auVar179._4_4_ = (int)auVar243._4_4_;
                  auVar179._8_4_ = (int)auVar243._8_4_;
                  auVar179._12_4_ = (int)auVar243._12_4_;
                  auVar243 = vpslld_avx(auVar179,0x17);
                  auVar168 = vpaddd_avx(auVar243,auVar168);
                  auVar124._0_4_ = (fVar225 + fVar79 + fVar220) * auVar168._0_4_ + fVar79;
                  auVar124._4_4_ = (fVar167 + fVar97 + fVar221) * auVar168._4_4_ + fVar97;
                  auVar124._8_4_ = (fVar218 + fVar119 + fVar222) * auVar168._8_4_ + fVar119;
                  auVar124._12_4_ = (fVar219 + fVar120 + fVar224) * auVar168._12_4_ + fVar120;
                  auVar180._8_4_ = 0x40000000;
                  auVar180._0_8_ = 0x4000000040000000;
                  auVar180._12_4_ = 0x40000000;
                  auVar168 = vdivps_avx(auVar180,auVar124);
                  auVar125._0_4_ = auVar168._0_4_ + -1.0;
                  auVar125._4_4_ = auVar168._4_4_ + -1.0;
                  auVar125._8_4_ = auVar168._8_4_ + -1.0;
                  auVar125._12_4_ = auVar168._12_4_ + -1.0;
                  goto LAB_002a0b17;
                case 6:
                  pfVar76 = (float *)(this->super_Deconvolution).activation_params.data;
                  fVar79 = *pfVar76;
                  fVar97 = pfVar76[1];
                  auVar180._4_4_ = fVar97;
                  auVar180._0_4_ = fVar97;
                  auVar180._8_4_ = fVar97;
                  auVar180._12_4_ = fVar97;
                  auVar128._0_4_ = fVar79 * auVar102._0_4_ + fVar97;
                  auVar128._4_4_ = fVar79 * fVar226 + fVar97;
                  auVar128._8_4_ = fVar79 * fVar121 + fVar97;
                  auVar128._12_4_ = fVar79 * fVar223 + fVar97;
                  auVar243 = vmaxps_avx(auVar243,auVar128);
                  auVar125 = vminps_avx(auVar243,auVar168);
LAB_002a0b17:
                  in_ZMM3 = ZEXT1664(auVar180);
                  auVar102._0_4_ = auVar125._0_4_ * auVar102._0_4_;
                  auVar102._4_4_ = auVar125._4_4_ * fVar226;
                  auVar102._8_4_ = auVar125._8_4_ * fVar121;
                  auVar102._12_4_ = auVar125._12_4_ * fVar223;
                }
                *pauVar72 = auVar102;
                pauVar72 = pauVar72 + 1;
                uVar62 = uVar62 + 1;
                iVar8 = iVar8 + 1;
              } while (uVar62 != local_198.w);
            }
            iVar75 = iVar75 + 1;
          } while (iVar75 != local_198.h);
        }
        local_258 = (void *)((long)local_258 + 1);
      } while (local_258 != (void *)(long)local_198.c);
    }
    if ((uVar57 == 1) && (uVar68 == 8)) {
      if ((long)local_198.c < 1) goto LAB_002a38ed;
      iVar20 = (this->super_Deconvolution).dilation_w;
      iVar21 = (this->super_Deconvolution).dilation_h;
      iVar46 = (this->super_Deconvolution).stride_w;
      iVar74 = (this->super_Deconvolution).stride_h;
      iVar61 = (this->super_Deconvolution).activation_type;
      pvVar30 = (this->super_Deconvolution).bias_data.data;
      uVar22 = (this->super_Deconvolution).kernel_w;
      uVar51 = (this->super_Deconvolution).kernel_h;
      local_258 = (void *)0x0;
      auVar306 = ZEXT1664(ZEXT816(0) << 0x40);
      auVar308 = ZEXT3264(CONCAT428(0xc2b0c0a5,
                                    CONCAT424(0xc2b0c0a5,
                                              CONCAT420(0xc2b0c0a5,
                                                        CONCAT416(0xc2b0c0a5,
                                                                  CONCAT412(0xc2b0c0a5,
                                                                            CONCAT48(0xc2b0c0a5,
                                                                                                                                                                          
                                                  0xc2b0c0a5c2b0c0a5)))))));
      auVar319 = ZEXT3264(CONCAT428(0x3fb8aa3b,
                                    CONCAT424(0x3fb8aa3b,
                                              CONCAT420(0x3fb8aa3b,
                                                        CONCAT416(0x3fb8aa3b,
                                                                  CONCAT412(0x3fb8aa3b,
                                                                            CONCAT48(0x3fb8aa3b,
                                                                                                                                                                          
                                                  0x3fb8aa3b3fb8aa3b)))))));
      auVar238._8_4_ = 0x3f000000;
      auVar238._0_8_ = 0x3f0000003f000000;
      auVar238._12_4_ = 0x3f000000;
      auVar238._16_4_ = 0x3f000000;
      auVar238._20_4_ = 0x3f000000;
      auVar238._24_4_ = 0x3f000000;
      auVar238._28_4_ = 0x3f000000;
      auVar240 = ZEXT3264(CONCAT428(0x3f800000,
                                    CONCAT424(0x3f800000,
                                              CONCAT420(0x3f800000,
                                                        CONCAT416(0x3f800000,
                                                                  CONCAT412(0x3f800000,
                                                                            CONCAT48(0x3f800000,
                                                                                                                                                                          
                                                  0x3f8000003f800000)))))));
      auVar307 = ZEXT3264(CONCAT428(0x3c088908,
                                    CONCAT424(0x3c088908,
                                              CONCAT420(0x3c088908,
                                                        CONCAT416(0x3c088908,
                                                                  CONCAT412(0x3c088908,
                                                                            CONCAT48(0x3c088908,
                                                                                                                                                                          
                                                  0x3c0889083c088908)))))));
      do {
        if (0 < local_198.h) {
          iVar69 = bottom_blob->w;
          iVar60 = bottom_blob->h;
          pauVar71 = (undefined1 (*) [32])
                     (local_198.cstep * (long)local_258 * local_198.elemsize + (long)local_198.data)
          ;
          uVar23 = bottom_blob->c;
          iVar75 = 0;
          do {
            if (0 < local_198.w) {
              uVar62 = 0;
              iVar8 = (1 - uVar22) * iVar20;
              do {
                if (pvVar30 == (void *)0x0) {
                  auVar320 = ZEXT1664(ZEXT816(0) << 0x40);
                }
                else {
                  auVar320 = ZEXT3264(*(undefined1 (*) [32])((long)pvVar30 + (long)local_258 * 0x20)
                                     );
                }
                if (0 < (int)uVar23) {
                  pvVar66 = (void *)((this->weight_data_tm).cstep * (long)local_258 *
                                     (this->weight_data_tm).elemsize +
                                    (long)(this->weight_data_tm).data);
                  uVar58 = 0;
                  do {
                    if (0 < (int)uVar51) {
                      uVar55 = 0;
                      uVar64 = 0;
                      do {
                        iVar47 = (((int)uVar64 - uVar51) + 1) * iVar21 + iVar75;
                        if ((((-1 < iVar47) && (iVar48 = iVar47 / iVar74, iVar47 % iVar74 == 0)) &&
                            (iVar48 < iVar60)) && (0 < (int)uVar22)) {
                          uVar65 = uVar55;
                          uVar67 = (ulong)uVar22;
                          iVar47 = iVar8;
                          do {
                            if (((-1 < iVar47) && (iVar49 = iVar47 / iVar46, iVar47 % iVar46 == 0))
                               && (iVar49 < iVar69)) {
                              fVar79 = *(float *)((long)bottom_blob->data +
                                                 (long)iVar49 * 4 +
                                                 (long)iVar48 *
                                                 (long)bottom_blob->w * bottom_blob->elemsize +
                                                 bottom_blob->cstep * bottom_blob->elemsize * uVar58
                                                 );
                              pfVar76 = (float *)((long)pvVar66 + (uVar65 & 0xffffffff) * 4);
                              auVar320 = ZEXT3264(CONCAT428(auVar320._28_4_ + fVar79,
                                                            CONCAT424(auVar320._24_4_ +
                                                                      fVar79 * pfVar76[6],
                                                                      CONCAT420(auVar320._20_4_ +
                                                                                fVar79 * pfVar76[5],
                                                                                CONCAT416(auVar320.
                                                  _16_4_ + fVar79 * pfVar76[4],
                                                  CONCAT412(auVar320._12_4_ + fVar79 * pfVar76[3],
                                                            CONCAT48(auVar320._8_4_ +
                                                                     fVar79 * pfVar76[2],
                                                                     CONCAT44(auVar320._4_4_ +
                                                                              fVar79 * pfVar76[1],
                                                                              auVar320._0_4_ +
                                                                              fVar79 * *pfVar76)))))
                                                  )));
                            }
                            uVar65 = uVar65 + 8;
                            iVar47 = iVar47 + iVar20;
                            uVar67 = uVar67 - 1;
                          } while (uVar67 != 0);
                        }
                        uVar64 = uVar64 + 1;
                        uVar55 = uVar55 + (ulong)uVar22 * 8;
                      } while (uVar64 != uVar51);
                    }
                    pvVar66 = (void *)((long)pvVar66 + (long)(int)(uVar22 * uVar51 * 8) * 4);
                    uVar58 = uVar58 + 1;
                  } while (uVar58 != uVar23);
                }
                auVar318 = auVar320._0_32_;
                fVar341 = auVar320._8_4_;
                fVar343 = auVar320._12_4_;
                fVar345 = auVar320._16_4_;
                fVar347 = auVar320._20_4_;
                fVar349 = auVar320._24_4_;
                fVar167 = auVar319._0_4_;
                fVar218 = auVar319._4_4_;
                fVar219 = auVar319._8_4_;
                fVar220 = auVar319._12_4_;
                fVar221 = auVar319._16_4_;
                fVar222 = auVar319._20_4_;
                fVar224 = auVar319._24_4_;
                auVar314 = auVar240._0_32_;
                fVar242 = auVar307._0_4_;
                fVar241 = auVar307._4_4_;
                fVar287 = auVar307._8_4_;
                fVar288 = auVar307._12_4_;
                fVar289 = auVar307._16_4_;
                fVar290 = auVar307._20_4_;
                fVar322 = auVar307._24_4_;
                fVar339 = auVar307._28_4_;
                auVar87 = auVar308._0_32_;
                fVar79 = auVar240._0_4_;
                fVar97 = auVar240._4_4_;
                fVar119 = auVar240._8_4_;
                fVar120 = auVar240._12_4_;
                fVar226 = auVar240._16_4_;
                fVar121 = auVar240._20_4_;
                fVar223 = auVar240._24_4_;
                fVar225 = auVar240._28_4_;
                auVar321._28_36_ = auVar320._28_36_;
                switch(iVar61) {
                case 1:
                  auVar318 = vmaxps_avx(auVar318,auVar306._0_32_);
                  break;
                case 2:
                  auVar314 = vmaxps_avx(auVar318,ZEXT1632(ZEXT816(0) << 0x40));
                  in_ZMM7 = ZEXT3264(auVar314);
                  auVar306 = ZEXT1664(ZEXT816(0) << 0x40);
                  auVar87 = vminps_avx(auVar318,ZEXT1632(ZEXT816(0) << 0x40));
                  fVar79 = *(this->super_Deconvolution).activation_params.data;
                  auVar318._0_4_ = fVar79 * auVar87._0_4_ + auVar314._0_4_;
                  auVar318._4_4_ = fVar79 * auVar87._4_4_ + auVar314._4_4_;
                  auVar318._8_4_ = fVar79 * auVar87._8_4_ + auVar314._8_4_;
                  auVar318._12_4_ = fVar79 * auVar87._12_4_ + auVar314._12_4_;
                  auVar318._16_4_ = fVar79 * auVar87._16_4_ + auVar314._16_4_;
                  auVar318._20_4_ = fVar79 * auVar87._20_4_ + auVar314._20_4_;
                  auVar318._24_4_ = fVar79 * auVar87._24_4_ + auVar314._24_4_;
                  auVar318._28_4_ = auVar87._28_4_ + auVar314._28_4_;
                  break;
                case 3:
                  puVar26 = (undefined4 *)(this->super_Deconvolution).activation_params.data;
                  uVar7 = *puVar26;
                  auVar282._4_4_ = uVar7;
                  auVar282._0_4_ = uVar7;
                  auVar282._8_4_ = uVar7;
                  auVar282._12_4_ = uVar7;
                  auVar282._16_4_ = uVar7;
                  auVar282._20_4_ = uVar7;
                  auVar282._24_4_ = uVar7;
                  auVar282._28_4_ = uVar7;
                  uVar7 = puVar26[1];
                  auVar338._4_4_ = uVar7;
                  auVar338._0_4_ = uVar7;
                  auVar338._8_4_ = uVar7;
                  auVar338._12_4_ = uVar7;
                  auVar338._16_4_ = uVar7;
                  auVar338._20_4_ = uVar7;
                  auVar338._24_4_ = uVar7;
                  auVar338._28_4_ = uVar7;
                  auVar314 = vmaxps_avx(auVar318,auVar282);
                  in_ZMM7 = ZEXT3264(auVar314);
                  auVar318 = vminps_avx(auVar338,auVar314);
                  break;
                case 4:
                  auVar283._0_8_ = auVar320._0_8_ ^ 0x8000000080000000;
                  auVar283._8_4_ = -fVar341;
                  auVar283._12_4_ = -fVar343;
                  auVar283._16_4_ = -fVar345;
                  auVar283._20_4_ = -fVar347;
                  auVar283._24_4_ = -fVar349;
                  auVar283._28_4_ = -auVar320._28_4_;
                  auVar95._8_4_ = 0x42b0c0a5;
                  auVar95._0_8_ = 0x42b0c0a542b0c0a5;
                  auVar95._12_4_ = 0x42b0c0a5;
                  auVar95._16_4_ = 0x42b0c0a5;
                  auVar95._20_4_ = 0x42b0c0a5;
                  auVar95._24_4_ = 0x42b0c0a5;
                  auVar95._28_4_ = 0x42b0c0a5;
                  auVar152 = vminps_avx(auVar283,auVar95);
                  auVar152 = vmaxps_avx(auVar87,auVar152);
                  auVar317._0_4_ = fVar167 * auVar152._0_4_ + 0.5;
                  auVar317._4_4_ = fVar218 * auVar152._4_4_ + 0.5;
                  auVar317._8_4_ = fVar219 * auVar152._8_4_ + 0.5;
                  auVar317._12_4_ = fVar220 * auVar152._12_4_ + 0.5;
                  auVar317._16_4_ = fVar221 * auVar152._16_4_ + 0.5;
                  auVar317._20_4_ = fVar222 * auVar152._20_4_ + 0.5;
                  auVar317._24_4_ = fVar224 * auVar152._24_4_ + 0.5;
                  auVar317._28_4_ = auVar320._28_4_ + 0.5;
                  auVar158 = vroundps_avx(auVar317,1);
                  auVar87 = vcmpps_avx(auVar317,auVar158,1);
                  auVar87 = vandps_avx(auVar87,auVar314);
                  auVar87 = vsubps_avx(auVar158,auVar87);
                  fVar167 = auVar87._0_4_ * -0.6931472 + auVar152._0_4_;
                  fVar218 = auVar87._4_4_ * -0.6931472 + auVar152._4_4_;
                  fVar219 = auVar87._8_4_ * -0.6931472 + auVar152._8_4_;
                  fVar220 = auVar87._12_4_ * -0.6931472 + auVar152._12_4_;
                  fVar221 = auVar87._16_4_ * -0.6931472 + auVar152._16_4_;
                  fVar222 = auVar87._20_4_ * -0.6931472 + auVar152._20_4_;
                  fVar224 = auVar87._24_4_ * -0.6931472 + auVar152._24_4_;
                  auVar253._0_4_ = (int)auVar87._0_4_;
                  auVar253._4_4_ = (int)auVar87._4_4_;
                  auVar253._8_4_ = (int)auVar87._8_4_;
                  auVar253._12_4_ = (int)auVar87._12_4_;
                  auVar284._16_4_ = (int)auVar87._16_4_;
                  auVar284._0_16_ = auVar253;
                  auVar284._20_4_ = (int)auVar87._20_4_;
                  auVar284._24_4_ = (int)auVar87._24_4_;
                  auVar284._28_4_ = (int)auVar87._28_4_;
                  auVar243 = vpslld_avx(auVar253,0x17);
                  auVar168 = vpslld_avx(auVar284._16_16_,0x17);
                  auVar103._8_4_ = 0x3f800000;
                  auVar103._0_8_ = 0x3f8000003f800000;
                  auVar103._12_4_ = 0x3f800000;
                  auVar168 = vpaddd_avx(auVar168,auVar103);
                  auVar243 = vpaddd_avx(auVar243,auVar103);
                  in_ZMM7 = ZEXT3264(CONCAT1616(auVar168,auVar243));
                  auVar165._0_4_ =
                       (fVar167 + fVar79 +
                       fVar167 * fVar167 *
                       ((((fVar242 + (fVar167 * 0.00019875691 + 0.0013981999) * fVar167) * fVar167 +
                         0.041665796) * fVar167 + 0.16666666) * fVar167 + 0.5)) * auVar243._0_4_ +
                       fVar79;
                  auVar165._4_4_ =
                       (fVar218 + fVar97 +
                       fVar218 * fVar218 *
                       ((((fVar241 + (fVar218 * 0.00019875691 + 0.0013981999) * fVar218) * fVar218 +
                         0.041665796) * fVar218 + 0.16666666) * fVar218 + 0.5)) * auVar243._4_4_ +
                       fVar97;
                  auVar165._8_4_ =
                       (fVar219 + fVar119 +
                       fVar219 * fVar219 *
                       ((((fVar287 + (fVar219 * 0.00019875691 + 0.0013981999) * fVar219) * fVar219 +
                         0.041665796) * fVar219 + 0.16666666) * fVar219 + 0.5)) * auVar243._8_4_ +
                       fVar119;
                  auVar165._12_4_ =
                       (fVar220 + fVar120 +
                       fVar220 * fVar220 *
                       ((((fVar288 + (fVar220 * 0.00019875691 + 0.0013981999) * fVar220) * fVar220 +
                         0.041665796) * fVar220 + 0.16666666) * fVar220 + 0.5)) * auVar243._12_4_ +
                       fVar120;
                  auVar165._16_4_ =
                       (fVar221 + fVar226 +
                       fVar221 * fVar221 *
                       ((((fVar289 + (fVar221 * 0.00019875691 + 0.0013981999) * fVar221) * fVar221 +
                         0.041665796) * fVar221 + 0.16666666) * fVar221 + 0.5)) * auVar168._0_4_ +
                       fVar226;
                  auVar165._20_4_ =
                       (fVar222 + fVar121 +
                       fVar222 * fVar222 *
                       ((((fVar290 + (fVar222 * 0.00019875691 + 0.0013981999) * fVar222) * fVar222 +
                         0.041665796) * fVar222 + 0.16666666) * fVar222 + 0.5)) * auVar168._4_4_ +
                       fVar121;
                  auVar165._24_4_ =
                       (fVar224 + fVar223 +
                       fVar224 * fVar224 *
                       ((((fVar322 + (fVar224 * 0.00019875691 + 0.0013981999) * fVar224) * fVar224 +
                         0.041665796) * fVar224 + 0.16666666) * fVar224 + 0.5)) * auVar168._8_4_ +
                       fVar223;
                  auVar165._28_4_ =
                       auVar158._28_4_ + auVar152._28_4_ + fVar225 +
                       fVar339 + -0.691749 + 0.041665796 + 0.16666666 + 0.5 + fVar225;
                  auVar318 = vdivps_avx(auVar314,auVar165);
                  break;
                case 5:
                  auVar297._8_4_ = 0x42b0c0a5;
                  auVar297._0_8_ = 0x42b0c0a542b0c0a5;
                  auVar297._12_4_ = 0x42b0c0a5;
                  auVar297._16_4_ = 0x42b0c0a5;
                  auVar297._20_4_ = 0x42b0c0a5;
                  auVar297._24_4_ = 0x42b0c0a5;
                  auVar297._28_4_ = 0x42b0c0a5;
                  auVar152 = vminps_avx(auVar318,auVar297);
                  auVar158 = vmaxps_avx(auVar87,auVar152);
                  auVar280._0_4_ = fVar167 * auVar158._0_4_ + 0.5;
                  auVar280._4_4_ = fVar218 * auVar158._4_4_ + 0.5;
                  auVar280._8_4_ = fVar219 * auVar158._8_4_ + 0.5;
                  auVar280._12_4_ = fVar220 * auVar158._12_4_ + 0.5;
                  auVar280._16_4_ = fVar221 * auVar158._16_4_ + 0.5;
                  auVar280._20_4_ = fVar222 * auVar158._20_4_ + 0.5;
                  auVar280._24_4_ = fVar224 * auVar158._24_4_ + 0.5;
                  auVar280._28_4_ = in_ZMM7._28_4_ + 0.5;
                  auVar207 = vroundps_avx(auVar280,1);
                  auVar152 = vcmpps_avx(auVar280,auVar207,1);
                  auVar152 = vandps_avx(auVar152,auVar314);
                  auVar152 = vsubps_avx(auVar207,auVar152);
                  auVar39._4_4_ = auVar152._4_4_ * 0.6931472;
                  auVar39._0_4_ = auVar152._0_4_ * 0.6931472;
                  auVar39._8_4_ = auVar152._8_4_ * 0.6931472;
                  auVar39._12_4_ = auVar152._12_4_ * 0.6931472;
                  auVar39._16_4_ = auVar152._16_4_ * 0.6931472;
                  auVar39._20_4_ = auVar152._20_4_ * 0.6931472;
                  auVar39._24_4_ = auVar152._24_4_ * 0.6931472;
                  auVar39._28_4_ = auVar207._28_4_;
                  auVar158 = vsubps_avx(auVar158,auVar39);
                  fVar323 = auVar158._0_4_;
                  fVar340 = auVar158._4_4_;
                  fVar342 = auVar158._8_4_;
                  fVar344 = auVar158._12_4_;
                  fVar346 = auVar158._16_4_;
                  fVar348 = auVar158._20_4_;
                  fVar350 = auVar158._24_4_;
                  auVar181._0_4_ = (int)auVar152._0_4_;
                  auVar181._4_4_ = (int)auVar152._4_4_;
                  auVar181._8_4_ = (int)auVar152._8_4_;
                  auVar181._12_4_ = (int)auVar152._12_4_;
                  auVar213._16_4_ = (int)auVar152._16_4_;
                  auVar213._0_16_ = auVar181;
                  auVar213._20_4_ = (int)auVar152._20_4_;
                  auVar213._24_4_ = (int)auVar152._24_4_;
                  auVar213._28_4_ = (int)auVar152._28_4_;
                  auVar243 = vpslld_avx(auVar181,0x17);
                  auVar168 = vpslld_avx(auVar213._16_16_,0x17);
                  auVar235._8_4_ = 0x3f800000;
                  auVar235._0_8_ = 0x3f8000003f800000;
                  auVar235._12_4_ = 0x3f800000;
                  auVar168 = vpaddd_avx(auVar168,auVar235);
                  auVar243 = vpaddd_avx(auVar243,auVar235);
                  auVar281._0_4_ =
                       (fVar323 + fVar79 +
                       fVar323 * fVar323 *
                       ((((fVar242 + (fVar323 * 0.00019875691 + 0.0013981999) * fVar323) * fVar323 +
                         0.041665796) * fVar323 + 0.16666666) * fVar323 + 0.5)) * auVar243._0_4_ +
                       fVar79;
                  auVar281._4_4_ =
                       (fVar340 + fVar97 +
                       fVar340 * fVar340 *
                       ((((fVar241 + (fVar340 * 0.00019875691 + 0.0013981999) * fVar340) * fVar340 +
                         0.041665796) * fVar340 + 0.16666666) * fVar340 + 0.5)) * auVar243._4_4_ +
                       fVar97;
                  auVar281._8_4_ =
                       (fVar342 + fVar119 +
                       fVar342 * fVar342 *
                       ((((fVar287 + (fVar342 * 0.00019875691 + 0.0013981999) * fVar342) * fVar342 +
                         0.041665796) * fVar342 + 0.16666666) * fVar342 + 0.5)) * auVar243._8_4_ +
                       fVar119;
                  auVar281._12_4_ =
                       (fVar344 + fVar120 +
                       fVar344 * fVar344 *
                       ((((fVar288 + (fVar344 * 0.00019875691 + 0.0013981999) * fVar344) * fVar344 +
                         0.041665796) * fVar344 + 0.16666666) * fVar344 + 0.5)) * auVar243._12_4_ +
                       fVar120;
                  auVar281._16_4_ =
                       (fVar346 + fVar226 +
                       fVar346 * fVar346 *
                       ((((fVar289 + (fVar346 * 0.00019875691 + 0.0013981999) * fVar346) * fVar346 +
                         0.041665796) * fVar346 + 0.16666666) * fVar346 + 0.5)) * auVar168._0_4_ +
                       fVar226;
                  auVar281._20_4_ =
                       (fVar348 + fVar121 +
                       fVar348 * fVar348 *
                       ((((fVar290 + (fVar348 * 0.00019875691 + 0.0013981999) * fVar348) * fVar348 +
                         0.041665796) * fVar348 + 0.16666666) * fVar348 + 0.5)) * auVar168._4_4_ +
                       fVar121;
                  auVar281._24_4_ =
                       (fVar350 + fVar223 +
                       fVar350 * fVar350 *
                       ((((fVar322 + (fVar350 * 0.00019875691 + 0.0013981999) * fVar350) * fVar350 +
                         0.041665796) * fVar350 + 0.16666666) * fVar350 + 0.5)) * auVar168._8_4_ +
                       fVar223;
                  auVar281._28_4_ =
                       auVar158._28_4_ + fVar225 +
                       fVar339 + in_ZMM3._28_4_ + 0.0013981999 + 0.041665796 + 0.16666666 + 0.5 +
                       fVar225;
                  auVar91._8_4_ = 0x800000;
                  auVar91._0_8_ = 0x80000000800000;
                  auVar91._12_4_ = 0x800000;
                  auVar91._16_4_ = 0x800000;
                  auVar91._20_4_ = 0x800000;
                  auVar91._24_4_ = 0x800000;
                  auVar91._28_4_ = 0x800000;
                  auVar207 = vmaxps_avx(auVar281,auVar91);
                  auVar168 = vpsrld_avx(auVar207._16_16_,0x17);
                  auVar92._8_4_ = 0x807fffff;
                  auVar92._0_8_ = 0x807fffff807fffff;
                  auVar92._12_4_ = 0x807fffff;
                  auVar92._16_4_ = 0x807fffff;
                  auVar92._20_4_ = 0x807fffff;
                  auVar92._24_4_ = 0x807fffff;
                  auVar92._28_4_ = 0x807fffff;
                  auVar152 = vandps_avx(auVar207,auVar92);
                  auVar33 = vorps_avx(auVar152,auVar238);
                  auVar93._8_4_ = 0x3f3504f3;
                  auVar93._0_8_ = 0x3f3504f33f3504f3;
                  auVar93._12_4_ = 0x3f3504f3;
                  auVar93._16_4_ = 0x3f3504f3;
                  auVar93._20_4_ = 0x3f3504f3;
                  auVar93._24_4_ = 0x3f3504f3;
                  auVar93._28_4_ = 0x3f3504f3;
                  auVar158 = vcmpps_avx(auVar93,auVar33,2);
                  auVar152 = vandnps_avx(auVar158,auVar33);
                  fVar323 = auVar33._0_4_ + -1.0 + auVar152._0_4_;
                  fVar340 = auVar33._4_4_ + -1.0 + auVar152._4_4_;
                  fVar342 = auVar33._8_4_ + -1.0 + auVar152._8_4_;
                  fVar344 = auVar33._12_4_ + -1.0 + auVar152._12_4_;
                  fVar346 = auVar33._16_4_ + -1.0 + auVar152._16_4_;
                  fVar348 = auVar33._20_4_ + -1.0 + auVar152._20_4_;
                  fVar350 = auVar33._24_4_ + -1.0 + auVar152._24_4_;
                  auVar168 = vpsubd_avx(auVar168,auVar158._16_16_);
                  auVar243 = vpsrld_avx(auVar207._0_16_,0x17);
                  auVar293._8_4_ = 0xffffff81;
                  auVar293._0_8_ = 0xffffff81ffffff81;
                  auVar293._12_4_ = 0xffffff81;
                  auVar168 = vpaddd_avx(auVar293,auVar168);
                  auVar243 = vpsubd_avx(auVar243,auVar158._0_16_);
                  auVar243 = vpaddd_avx(auVar293,auVar243);
                  auVar163._16_16_ = auVar168;
                  auVar163._0_16_ = auVar243;
                  auVar306 = ZEXT864(0) << 0x20;
                  auVar158 = vcmpps_avx(auVar281,_DAT_005b6fa0,2);
                  auVar207 = vcvtdq2ps_avx(auVar163);
                  auVar40._4_4_ =
                       (fVar340 + auVar207._4_4_ * 0.6931472 +
                       fVar340 * fVar340 *
                       (fVar340 * (fVar340 * (fVar340 * (fVar340 * (fVar340 * (fVar340 * (fVar340 * 
                                                  (fVar340 * (fVar340 * 0.070376836 + -0.1151461) +
                                                  0.116769984) + -0.12420141) + 0.14249323) +
                                                  -0.16668057) + 0.20000714) + -0.24999994) +
                                  0.3333333) + -0.5)) * -2.0;
                  auVar40._0_4_ =
                       (fVar323 + auVar207._0_4_ * 0.6931472 +
                       fVar323 * fVar323 *
                       (fVar323 * (fVar323 * (fVar323 * (fVar323 * (fVar323 * (fVar323 * (fVar323 * 
                                                  (fVar323 * (fVar323 * 0.070376836 + -0.1151461) +
                                                  0.116769984) + -0.12420141) + 0.14249323) +
                                                  -0.16668057) + 0.20000714) + -0.24999994) +
                                  0.3333333) + -0.5)) * -2.0;
                  auVar40._8_4_ =
                       (fVar342 + auVar207._8_4_ * 0.6931472 +
                       fVar342 * fVar342 *
                       (fVar342 * (fVar342 * (fVar342 * (fVar342 * (fVar342 * (fVar342 * (fVar342 * 
                                                  (fVar342 * (fVar342 * 0.070376836 + -0.1151461) +
                                                  0.116769984) + -0.12420141) + 0.14249323) +
                                                  -0.16668057) + 0.20000714) + -0.24999994) +
                                  0.3333333) + -0.5)) * -2.0;
                  auVar40._12_4_ =
                       (fVar344 + auVar207._12_4_ * 0.6931472 +
                       fVar344 * fVar344 *
                       (fVar344 * (fVar344 * (fVar344 * (fVar344 * (fVar344 * (fVar344 * (fVar344 * 
                                                  (fVar344 * (fVar344 * 0.070376836 + -0.1151461) +
                                                  0.116769984) + -0.12420141) + 0.14249323) +
                                                  -0.16668057) + 0.20000714) + -0.24999994) +
                                  0.3333333) + -0.5)) * -2.0;
                  auVar40._16_4_ =
                       (fVar346 + auVar207._16_4_ * 0.6931472 +
                       fVar346 * fVar346 *
                       (fVar346 * (fVar346 * (fVar346 * (fVar346 * (fVar346 * (fVar346 * (fVar346 * 
                                                  (fVar346 * (fVar346 * 0.070376836 + -0.1151461) +
                                                  0.116769984) + -0.12420141) + 0.14249323) +
                                                  -0.16668057) + 0.20000714) + -0.24999994) +
                                  0.3333333) + -0.5)) * -2.0;
                  auVar40._20_4_ =
                       (fVar348 + auVar207._20_4_ * 0.6931472 +
                       fVar348 * fVar348 *
                       (fVar348 * (fVar348 * (fVar348 * (fVar348 * (fVar348 * (fVar348 * (fVar348 * 
                                                  (fVar348 * (fVar348 * 0.070376836 + -0.1151461) +
                                                  0.116769984) + -0.12420141) + 0.14249323) +
                                                  -0.16668057) + 0.20000714) + -0.24999994) +
                                  0.3333333) + -0.5)) * -2.0;
                  auVar40._24_4_ =
                       (fVar350 + auVar207._24_4_ * 0.6931472 +
                       fVar350 * fVar350 *
                       (fVar350 * (fVar350 * (fVar350 * (fVar350 * (fVar350 * (fVar350 * (fVar350 * 
                                                  (fVar350 * (fVar350 * 0.070376836 + -0.1151461) +
                                                  0.116769984) + -0.12420141) + 0.14249323) +
                                                  -0.16668057) + 0.20000714) + -0.24999994) +
                                  0.3333333) + -0.5)) * -2.0;
                  auVar40._28_4_ = auVar33._28_4_ + -1.0 + auVar152._28_4_ + auVar207._28_4_ + 0.0;
                  auVar214._8_4_ = 0x7fffffff;
                  auVar214._0_8_ = 0x7fffffff7fffffff;
                  auVar214._12_4_ = 0x7fffffff;
                  auVar214._16_4_ = 0x7fffffff;
                  auVar214._20_4_ = 0x7fffffff;
                  auVar214._24_4_ = 0x7fffffff;
                  auVar214._28_4_ = 0x7fffffff;
                  auVar152 = vblendvps_avx(auVar40,auVar214,auVar158);
                  auVar152 = vminps_avx(auVar297,auVar152);
                  auVar308 = ZEXT3264(auVar87);
                  auVar152 = vmaxps_avx(auVar87,auVar152);
                  auVar319 = ZEXT3264(auVar319._0_32_);
                  auVar215._0_4_ = fVar167 * auVar152._0_4_ + 0.5;
                  auVar215._4_4_ = fVar218 * auVar152._4_4_ + 0.5;
                  auVar215._8_4_ = fVar219 * auVar152._8_4_ + 0.5;
                  auVar215._12_4_ = fVar220 * auVar152._12_4_ + 0.5;
                  auVar215._16_4_ = fVar221 * auVar152._16_4_ + 0.5;
                  auVar215._20_4_ = fVar222 * auVar152._20_4_ + 0.5;
                  auVar215._24_4_ = fVar224 * auVar152._24_4_ + 0.5;
                  auVar215._28_4_ = 0x7fc00000;
                  auVar158 = vroundps_avx(auVar215,1);
                  auVar87 = vcmpps_avx(auVar215,auVar158,1);
                  auVar87 = vandps_avx(auVar87,auVar314);
                  auVar87 = vsubps_avx(auVar158,auVar87);
                  auVar41._4_4_ = auVar87._4_4_ * 0.6931472;
                  auVar41._0_4_ = auVar87._0_4_ * 0.6931472;
                  auVar41._8_4_ = auVar87._8_4_ * 0.6931472;
                  auVar41._12_4_ = auVar87._12_4_ * 0.6931472;
                  auVar41._16_4_ = auVar87._16_4_ * 0.6931472;
                  auVar41._20_4_ = auVar87._20_4_ * 0.6931472;
                  auVar41._24_4_ = auVar87._24_4_ * 0.6931472;
                  auVar41._28_4_ = auVar158._28_4_;
                  auVar152 = vsubps_avx(auVar152,auVar41);
                  fVar167 = auVar152._0_4_;
                  fVar218 = auVar152._4_4_;
                  fVar219 = auVar152._8_4_;
                  fVar220 = auVar152._12_4_;
                  fVar221 = auVar152._16_4_;
                  fVar222 = auVar152._20_4_;
                  fVar224 = auVar152._24_4_;
                  auVar307 = ZEXT3264(auVar307._0_32_);
                  fVar242 = ((((fVar167 * 0.00019875691 + 0.0013981999) * fVar167 + fVar242) *
                              fVar167 + 0.041665796) * fVar167 + 0.16666666) * fVar167 + 0.5;
                  fVar241 = ((((fVar218 * 0.00019875691 + 0.0013981999) * fVar218 + fVar241) *
                              fVar218 + 0.041665796) * fVar218 + 0.16666666) * fVar218 + 0.5;
                  fVar287 = ((((fVar219 * 0.00019875691 + 0.0013981999) * fVar219 + fVar287) *
                              fVar219 + 0.041665796) * fVar219 + 0.16666666) * fVar219 + 0.5;
                  fVar288 = ((((fVar220 * 0.00019875691 + 0.0013981999) * fVar220 + fVar288) *
                              fVar220 + 0.041665796) * fVar220 + 0.16666666) * fVar220 + 0.5;
                  fVar289 = ((((fVar221 * 0.00019875691 + 0.0013981999) * fVar221 + fVar289) *
                              fVar221 + 0.041665796) * fVar221 + 0.16666666) * fVar221 + 0.5;
                  fVar290 = ((((fVar222 * 0.00019875691 + 0.0013981999) * fVar222 + fVar290) *
                              fVar222 + 0.041665796) * fVar222 + 0.16666666) * fVar222 + 0.5;
                  fVar322 = ((((fVar224 * 0.00019875691 + 0.0013981999) * fVar224 + fVar322) *
                              fVar224 + 0.041665796) * fVar224 + 0.16666666) * fVar224 + 0.5;
                  in_ZMM7 = ZEXT3264(CONCAT428(auVar281._28_4_ + 0.0013981999 + fVar339 +
                                               0.041665796 + 0.16666666 + 0.5,
                                               CONCAT424(fVar322,CONCAT420(fVar290,CONCAT416(fVar289
                                                  ,CONCAT412(fVar288,CONCAT48(fVar287,CONCAT44(
                                                  fVar241,fVar242))))))));
                  auVar182._0_4_ = (int)auVar87._0_4_;
                  auVar182._4_4_ = (int)auVar87._4_4_;
                  auVar182._8_4_ = (int)auVar87._8_4_;
                  auVar182._12_4_ = (int)auVar87._12_4_;
                  auVar216._16_4_ = (int)auVar87._16_4_;
                  auVar216._0_16_ = auVar182;
                  auVar216._20_4_ = (int)auVar87._20_4_;
                  auVar216._24_4_ = (int)auVar87._24_4_;
                  auVar216._28_4_ = (int)auVar87._28_4_;
                  auVar243 = vpslld_avx(auVar182,0x17);
                  auVar168 = vpslld_avx(auVar216._16_16_,0x17);
                  auVar82._8_4_ = 0x3f800000;
                  auVar82._0_8_ = 0x3f8000003f800000;
                  auVar82._12_4_ = 0x3f800000;
                  auVar168 = vpaddd_avx(auVar168,auVar82);
                  auVar243 = vpaddd_avx(auVar243,auVar82);
                  auVar217._16_16_ = auVar168;
                  auVar217._0_16_ = auVar243;
                  auVar240 = ZEXT3264(auVar314);
                  auVar164._0_4_ =
                       (fVar167 + fVar79 + fVar167 * fVar167 * fVar242) * auVar243._0_4_ + fVar79;
                  auVar164._4_4_ =
                       (fVar218 + fVar97 + fVar218 * fVar218 * fVar241) * auVar243._4_4_ + fVar97;
                  auVar164._8_4_ =
                       (fVar219 + fVar119 + fVar219 * fVar219 * fVar287) * auVar243._8_4_ + fVar119;
                  auVar164._12_4_ =
                       (fVar220 + fVar120 + fVar220 * fVar220 * fVar288) * auVar243._12_4_ + fVar120
                  ;
                  auVar164._16_4_ =
                       (fVar221 + fVar226 + fVar221 * fVar221 * fVar289) * auVar168._0_4_ + fVar226;
                  auVar164._20_4_ =
                       (fVar222 + fVar121 + fVar222 * fVar222 * fVar290) * auVar168._4_4_ + fVar121;
                  auVar164._24_4_ =
                       (fVar224 + fVar223 + fVar224 * fVar224 * fVar322) * auVar168._8_4_ + fVar223;
                  auVar164._28_4_ = auVar152._28_4_ + fVar225 + auVar158._28_4_ + fVar225;
                  auVar94._8_4_ = 0x40000000;
                  auVar94._0_8_ = 0x4000000040000000;
                  auVar94._12_4_ = 0x40000000;
                  auVar94._16_4_ = 0x40000000;
                  auVar94._20_4_ = 0x40000000;
                  auVar94._24_4_ = 0x40000000;
                  auVar94._28_4_ = 0x40000000;
                  auVar314 = vdivps_avx(auVar94,auVar164);
                  auVar151._0_4_ = auVar314._0_4_ + -1.0;
                  auVar151._4_4_ = auVar314._4_4_ + -1.0;
                  auVar151._8_4_ = auVar314._8_4_ + -1.0;
                  auVar151._12_4_ = auVar314._12_4_ + -1.0;
                  auVar151._16_4_ = auVar314._16_4_ + -1.0;
                  auVar151._20_4_ = auVar314._20_4_ + -1.0;
                  auVar151._24_4_ = auVar314._24_4_ + -1.0;
                  goto LAB_002a12fe;
                case 6:
                  pfVar76 = (float *)(this->super_Deconvolution).activation_params.data;
                  fVar79 = *pfVar76;
                  fVar97 = pfVar76[1];
                  auVar217._4_4_ = fVar97;
                  auVar217._0_4_ = fVar97;
                  auVar217._8_4_ = fVar97;
                  auVar217._12_4_ = fVar97;
                  auVar217._16_4_ = fVar97;
                  auVar217._20_4_ = fVar97;
                  auVar217._24_4_ = fVar97;
                  auVar217._28_4_ = fVar97;
                  auVar166._0_4_ = auVar320._0_4_ * fVar79 + fVar97;
                  auVar166._4_4_ = auVar320._4_4_ * fVar79 + fVar97;
                  auVar166._8_4_ = fVar341 * fVar79 + fVar97;
                  auVar166._12_4_ = fVar343 * fVar79 + fVar97;
                  auVar166._16_4_ = fVar345 * fVar79 + fVar97;
                  auVar166._20_4_ = fVar347 * fVar79 + fVar97;
                  auVar166._24_4_ = fVar349 * fVar79 + fVar97;
                  auVar166._28_4_ = fVar79 + fVar97;
                  auVar87 = vmaxps_avx(auVar306._0_32_,auVar166);
                  auVar314 = vminps_avx(auVar87,auVar314);
                  auVar151 = auVar314._0_28_;
LAB_002a12fe:
                  in_ZMM3 = ZEXT3264(auVar217);
                  auVar321._0_4_ = auVar320._0_4_ * auVar151._0_4_;
                  auVar321._4_4_ = auVar320._4_4_ * auVar151._4_4_;
                  auVar321._8_4_ = fVar341 * auVar151._8_4_;
                  auVar321._12_4_ = fVar343 * auVar151._12_4_;
                  auVar321._16_4_ = fVar345 * auVar151._16_4_;
                  auVar321._20_4_ = fVar347 * auVar151._20_4_;
                  auVar321._24_4_ = fVar349 * auVar151._24_4_;
                  auVar318 = auVar321._0_32_;
                }
                *pauVar71 = auVar318;
                pauVar71 = pauVar71 + 1;
                uVar62 = uVar62 + 1;
                iVar8 = iVar8 + 1;
              } while (uVar62 != local_198.w);
            }
            iVar75 = iVar75 + 1;
          } while (iVar75 != local_198.h);
        }
        local_258 = (void *)((long)local_258 + 1);
      } while (local_258 != (void *)(long)local_198.c);
    }
    if ((uVar57 == 8) && (uVar68 == 1)) {
      local_148 = (long)local_198.c;
      if (0 < local_148) {
        iVar20 = (this->super_Deconvolution).dilation_w;
        iVar21 = (this->super_Deconvolution).dilation_h;
        iVar46 = (this->super_Deconvolution).stride_w;
        iVar74 = (this->super_Deconvolution).stride_h;
        iVar61 = (this->super_Deconvolution).activation_type;
        pvVar30 = (this->super_Deconvolution).bias_data.data;
        uVar57 = (this->super_Deconvolution).kernel_w;
        uVar22 = (this->super_Deconvolution).kernel_h;
        lVar70 = local_198.elemsize * local_198.cstep;
        local_150 = local_198.data;
        iVar69 = bottom_blob->w;
        iVar60 = bottom_blob->h;
        uVar68 = bottom_blob->c;
        local_258 = (void *)0x0;
        do {
          if (0 < iVar45) {
            sVar31 = (this->weight_data_tm).cstep;
            sVar27 = (this->weight_data_tm).elemsize;
            local_238 = (float *)(lVar70 * (long)local_258 + (long)local_150);
            pvVar66 = (this->weight_data_tm).data;
            iVar75 = 0;
            do {
              if (0 < iVar63) {
                iVar47 = bottom_blob->w;
                pvVar25 = bottom_blob->data;
                sVar28 = bottom_blob->elemsize;
                sVar29 = bottom_blob->cstep;
                pfVar76 = (float *)(this->super_Deconvolution).activation_params.data;
                uVar51 = 0;
                iVar8 = (1 - uVar57) * iVar20;
                do {
                  if (pvVar30 == (void *)0x0) {
                    fVar79 = 0.0;
                  }
                  else {
                    fVar79 = *(float *)((long)pvVar30 + (long)local_258 * 4);
                  }
                  if ((int)uVar68 < 1) {
                    fVar97 = 0.0;
                    fVar119 = 0.0;
                    fVar120 = 0.0;
                    fVar226 = 0.0;
                    fVar121 = 0.0;
                    fVar223 = 0.0;
                    fVar225 = 0.0;
                    fVar167 = 0.0;
                  }
                  else {
                    fVar97 = 0.0;
                    fVar119 = 0.0;
                    fVar120 = 0.0;
                    fVar226 = 0.0;
                    fVar121 = 0.0;
                    fVar223 = 0.0;
                    fVar225 = 0.0;
                    fVar167 = 0.0;
                    uVar58 = 0;
                    pvVar78 = (void *)(sVar31 * (long)local_258 * sVar27 + (long)pvVar66);
                    do {
                      if (0 < (int)uVar22) {
                        uVar64 = 0;
                        uVar55 = 0;
                        do {
                          iVar48 = (((int)uVar55 - uVar22) + 1) * iVar21 + iVar75;
                          if ((((-1 < iVar48) && (iVar49 = iVar48 / iVar74, iVar48 % iVar74 == 0))
                              && (0 < (int)uVar57)) && (iVar49 < iVar60)) {
                            uVar65 = (ulong)uVar57;
                            uVar67 = uVar64;
                            iVar48 = iVar8;
                            do {
                              if (((-1 < iVar48) && (iVar50 = iVar48 / iVar46, iVar48 % iVar46 == 0)
                                  ) && (iVar50 < iVar69)) {
                                pfVar73 = (float *)((long)pvVar78 + (uVar67 & 0xffffffff) * 4);
                                pfVar1 = (float *)((long)pvVar25 +
                                                  (long)(iVar50 << 3) * 4 +
                                                  (long)iVar49 * (long)iVar47 * sVar28 +
                                                  sVar29 * sVar28 * uVar58);
                                fVar97 = *pfVar73 * *pfVar1 + fVar97;
                                fVar119 = pfVar73[1] * pfVar1[1] + fVar119;
                                fVar120 = pfVar73[2] * pfVar1[2] + fVar120;
                                fVar226 = pfVar73[3] * pfVar1[3] + fVar226;
                                fVar121 = pfVar73[4] * pfVar1[4] + fVar121;
                                fVar223 = pfVar73[5] * pfVar1[5] + fVar223;
                                fVar225 = pfVar73[6] * pfVar1[6] + fVar225;
                                fVar167 = pfVar73[7] + fVar167;
                              }
                              uVar67 = uVar67 + 8;
                              iVar48 = iVar48 + iVar20;
                              uVar65 = uVar65 - 1;
                            } while (uVar65 != 0);
                          }
                          uVar55 = uVar55 + 1;
                          uVar64 = uVar64 + (ulong)uVar57 * 8;
                        } while (uVar55 != uVar22);
                      }
                      pvVar78 = (void *)((long)pvVar78 + (long)(int)(uVar57 * uVar22 * 8) * 4);
                      uVar58 = uVar58 + 1;
                    } while (uVar58 != uVar68);
                  }
                  auVar104._0_4_ = fVar121 + fVar97;
                  auVar104._4_4_ = fVar223 + fVar119;
                  auVar104._8_4_ = fVar225 + fVar120;
                  auVar104._12_4_ = fVar167 + fVar226;
                  auVar168 = vshufpd_avx(auVar104,auVar104,1);
                  auVar105._0_4_ = auVar168._0_4_ + auVar104._0_4_;
                  auVar105._4_4_ = auVar168._4_4_ + auVar104._4_4_;
                  auVar105._8_4_ = auVar168._8_4_ + auVar104._8_4_;
                  auVar105._12_4_ = auVar168._12_4_ + auVar104._12_4_;
                  auVar168 = vmovshdup_avx(auVar105);
                  fVar79 = auVar168._0_4_ + fVar79 + auVar105._0_4_;
                  auVar168 = ZEXT416((uint)fVar79);
                  fVar97 = fVar79;
                  switch(iVar61) {
                  case 1:
                    auVar168 = vmaxss_avx(ZEXT416((uint)fVar79),ZEXT416(0));
                    fVar97 = auVar168._0_4_;
                    break;
                  case 2:
                    auVar83._0_12_ = ZEXT812(0);
                    auVar83._12_4_ = 0;
                    auVar168 = vcmpss_avx(auVar83,auVar168,1);
                    auVar130._8_4_ = 0x3f800000;
                    auVar130._0_8_ = 0x3f8000003f800000;
                    auVar130._12_4_ = 0x3f800000;
                    auVar168 = vblendvps_avx(ZEXT416((uint)*pfVar76),auVar130,auVar168);
                    fVar97 = auVar168._0_4_ * fVar79;
                    break;
                  case 3:
                    auVar168 = vmaxss_avx(auVar168,ZEXT416((uint)*pfVar76));
                    fVar97 = auVar168._0_4_;
                    if (pfVar76[1] < auVar168._0_4_) {
                      fVar97 = pfVar76[1];
                    }
                    break;
                  case 4:
                    auVar168 = vminss_avx(auVar168,ZEXT416(0x42b0c0a5));
                    auVar106._0_8_ = auVar168._0_8_ ^ 0x8000000080000000;
                    auVar106._8_4_ = auVar168._8_4_ ^ 0x80000000;
                    auVar106._12_4_ = auVar168._12_4_ ^ 0x80000000;
                    auVar168 = vcmpss_avx(auVar168,ZEXT416(0xc2b0c0a5),1);
                    auVar129._8_4_ = 0x42b0c0a5;
                    auVar129._0_8_ = 0x42b0c0a542b0c0a5;
                    auVar129._12_4_ = 0x42b0c0a5;
                    auVar168 = vblendvps_avx(auVar106,auVar129,auVar168);
                    fVar79 = expf(auVar168._0_4_);
                    fVar97 = 1.0 / (fVar79 + 1.0);
                    break;
                  case 5:
                    fVar97 = expf(fVar79);
                    fVar97 = logf(fVar97 + 1.0);
                    fVar97 = tanhf(fVar97);
                    fVar97 = fVar97 * fVar79;
                    break;
                  case 6:
                    fVar119 = *pfVar76;
                    fVar120 = -pfVar76[1] / fVar119;
                    fVar97 = 0.0;
                    if ((fVar120 <= fVar79) && (fVar97 = fVar79, fVar79 <= fVar120 + 1.0 / fVar119))
                    {
                      fVar97 = (fVar119 * fVar79 + pfVar76[1]) * fVar79;
                    }
                  }
                  *local_238 = fVar97;
                  local_238 = local_238 + 1;
                  uVar51 = uVar51 + 1;
                  iVar8 = iVar8 + 1;
                } while (uVar51 != iVar63);
              }
              iVar75 = iVar75 + 1;
            } while (iVar75 != iVar45);
          }
          local_258 = (void *)((long)local_258 + 1);
        } while (local_258 != (void *)local_148);
      }
    }
    else {
      local_140._0_4_ = uVar68 ^ 4;
      if ((uVar57 == 4 && uVar68 == 4) && (0 < (long)local_198.c)) {
        iVar20 = (this->super_Deconvolution).dilation_w;
        iVar21 = (this->super_Deconvolution).dilation_h;
        iVar46 = (this->super_Deconvolution).stride_w;
        iVar74 = (this->super_Deconvolution).stride_h;
        iVar61 = (this->super_Deconvolution).activation_type;
        pvVar30 = (this->super_Deconvolution).bias_data.data;
        uVar22 = (this->super_Deconvolution).kernel_w;
        uVar51 = (this->super_Deconvolution).kernel_h;
        local_258 = (void *)0x0;
        auVar236._8_4_ = 0x3f000000;
        auVar236._0_8_ = 0x3f0000003f000000;
        auVar236._12_4_ = 0x3f000000;
        auVar240 = ZEXT1664(CONCAT412(0x3f800000,CONCAT48(0x3f800000,0x3f8000003f800000)));
        do {
          if (0 < local_198.h) {
            iVar69 = bottom_blob->w;
            iVar60 = bottom_blob->h;
            pauVar72 = (undefined1 (*) [16])
                       (local_198.cstep * (long)local_258 * local_198.elemsize +
                       (long)local_198.data);
            uVar23 = bottom_blob->c;
            iVar75 = 0;
            do {
              if (0 < local_198.w) {
                uVar62 = 0;
                iVar8 = (1 - uVar22) * iVar20;
                do {
                  if (pvVar30 == (void *)0x0) {
                    auVar306 = ZEXT1664((undefined1  [16])0x0);
                  }
                  else {
                    auVar306 = ZEXT1664(*(undefined1 (*) [16])
                                         ((long)pvVar30 + (long)local_258 * 0x10));
                  }
                  auVar109 = auVar306._0_16_;
                  if (0 < (int)uVar23) {
                    pvVar66 = (void *)((this->weight_data_tm).cstep * (long)local_258 *
                                       (this->weight_data_tm).elemsize +
                                      (long)(this->weight_data_tm).data);
                    pvVar25 = bottom_blob->data;
                    uVar58 = 0;
                    do {
                      if (0 < (int)uVar51) {
                        uVar55 = 0;
                        uVar64 = 0;
                        do {
                          iVar47 = (((int)uVar64 - uVar51) + 1) * iVar21 + iVar75;
                          if ((((-1 < iVar47) && (iVar48 = iVar47 / iVar74, iVar47 % iVar74 == 0))
                              && (0 < (int)uVar22)) && (iVar48 < iVar60)) {
                            lVar70 = (long)iVar48 * (long)bottom_blob->w * bottom_blob->elemsize +
                                     bottom_blob->cstep * bottom_blob->elemsize * uVar58;
                            uVar65 = uVar55;
                            uVar67 = (ulong)uVar22;
                            iVar47 = iVar8;
                            do {
                              if (((-1 < iVar47) && (iVar48 = iVar47 / iVar46, iVar47 % iVar46 == 0)
                                  ) && (iVar48 < iVar69)) {
                                lVar52 = (long)(iVar48 << 2);
                                fVar79 = *(float *)((long)pvVar25 + lVar52 * 4 + lVar70);
                                fVar97 = *(float *)((long)pvVar25 + lVar52 * 4 + lVar70 + 4);
                                fVar119 = *(float *)((long)pvVar25 + lVar52 * 4 + lVar70 + 8);
                                fVar120 = *(float *)((long)pvVar25 + lVar52 * 4 + lVar70 + 0xc);
                                uVar53 = uVar65 & 0xffffffff;
                                pfVar76 = (float *)((long)pvVar66 + uVar53 * 4);
                                pfVar73 = (float *)((long)pvVar66 + uVar53 * 4 + 0x10);
                                pfVar1 = (float *)((long)pvVar66 + uVar53 * 4 + 0x20);
                                pfVar2 = (float *)((long)pvVar66 + uVar53 * 4 + 0x30);
                                auVar306 = ZEXT1664(CONCAT412(fVar79 * pfVar76[3] + auVar306._12_4_
                                                              + fVar97 * pfVar73[3] +
                                                                fVar119 * pfVar1[3] +
                                                              fVar120 * pfVar2[3],
                                                              CONCAT48(fVar79 * pfVar76[2] +
                                                                       auVar306._8_4_ +
                                                                       fVar97 * pfVar73[2] +
                                                                       fVar119 * pfVar1[2] +
                                                                       fVar120 * pfVar2[2],
                                                                       CONCAT44(fVar79 * pfVar76[1]
                                                                                + auVar306._4_4_ +
                                                                                fVar97 * pfVar73[1]
                                                                                + fVar119 * pfVar1[1
                                                  ] + fVar120 * pfVar2[1],
                                                  fVar79 * *pfVar76 + auVar306._0_4_ +
                                                  fVar97 * *pfVar73 + fVar119 * *pfVar1 +
                                                  fVar120 * *pfVar2))));
                              }
                              uVar65 = uVar65 + 0x10;
                              iVar47 = iVar47 + iVar20;
                              uVar67 = uVar67 - 1;
                            } while (uVar67 != 0);
                          }
                          uVar64 = uVar64 + 1;
                          uVar55 = uVar55 + (ulong)uVar22 * 0x10;
                        } while (uVar64 != uVar51);
                      }
                      auVar109 = auVar306._0_16_;
                      pvVar66 = (void *)((long)pvVar66 + (long)(int)(uVar22 * uVar51 * 0x10) * 4);
                      uVar58 = uVar58 + 1;
                    } while (uVar58 != uVar23);
                  }
                  auVar168 = auVar240._0_16_;
                  fVar79 = auVar240._0_4_;
                  fVar97 = auVar240._4_4_;
                  fVar119 = auVar240._8_4_;
                  fVar120 = auVar240._12_4_;
                  fVar226 = auVar109._4_4_;
                  fVar121 = auVar109._8_4_;
                  fVar223 = auVar109._12_4_;
                  switch(iVar61) {
                  case 1:
                    auVar109 = vmaxps_avx(auVar109,_DAT_005b3ce0);
                    break;
                  case 2:
                    auVar168 = vmaxps_avx(auVar109,ZEXT816(0) << 0x40);
                    auVar243 = vminps_avx(auVar109,ZEXT816(0) << 0x40);
                    fVar79 = *(this->super_Deconvolution).activation_params.data;
                    auVar109._0_4_ = fVar79 * auVar243._0_4_ + auVar168._0_4_;
                    auVar109._4_4_ = fVar79 * auVar243._4_4_ + auVar168._4_4_;
                    auVar109._8_4_ = fVar79 * auVar243._8_4_ + auVar168._8_4_;
                    auVar109._12_4_ = fVar79 * auVar243._12_4_ + auVar168._12_4_;
                    break;
                  case 3:
                    puVar26 = (undefined4 *)(this->super_Deconvolution).activation_params.data;
                    uVar7 = *puVar26;
                    auVar258._4_4_ = uVar7;
                    auVar258._0_4_ = uVar7;
                    auVar258._8_4_ = uVar7;
                    auVar258._12_4_ = uVar7;
                    uVar7 = puVar26[1];
                    auVar330._4_4_ = uVar7;
                    auVar330._0_4_ = uVar7;
                    auVar330._8_4_ = uVar7;
                    auVar330._12_4_ = uVar7;
                    auVar168 = vmaxps_avx(auVar109,auVar258);
                    auVar109 = vminps_avx(auVar330,auVar168);
                    break;
                  case 4:
                    auVar107._0_8_ = auVar109._0_8_ ^ 0x8000000080000000;
                    auVar107._8_4_ = -fVar121;
                    auVar107._12_4_ = -fVar223;
                    auVar135._8_4_ = 0x42b0c0a5;
                    auVar135._0_8_ = 0x42b0c0a542b0c0a5;
                    auVar135._12_4_ = 0x42b0c0a5;
                    auVar243 = vminps_avx(auVar107,auVar135);
                    auVar136._8_4_ = 0xc2b0c0a5;
                    auVar136._0_8_ = 0xc2b0c0a5c2b0c0a5;
                    auVar136._12_4_ = 0xc2b0c0a5;
                    auVar169 = vmaxps_avx(auVar243,auVar136);
                    auVar259._0_4_ = auVar169._0_4_ * 1.442695 + 0.5;
                    auVar259._4_4_ = auVar169._4_4_ * 1.442695 + 0.5;
                    auVar259._8_4_ = auVar169._8_4_ * 1.442695 + 0.5;
                    auVar259._12_4_ = auVar169._12_4_ * 1.442695 + 0.5;
                    auVar331._0_4_ = (int)auVar259._0_4_;
                    auVar331._4_4_ = (int)auVar259._4_4_;
                    auVar331._8_4_ = (int)auVar259._8_4_;
                    auVar331._12_4_ = (int)auVar259._12_4_;
                    auVar310 = vcvtdq2ps_avx(auVar331);
                    auVar243 = vcmpps_avx(auVar259,auVar310,1);
                    auVar243 = vandps_avx(auVar243,auVar168);
                    auVar243 = vsubps_avx(auVar310,auVar243);
                    fVar226 = auVar243._0_4_ * -0.6931472 + auVar169._0_4_;
                    fVar121 = auVar243._4_4_ * -0.6931472 + auVar169._4_4_;
                    fVar223 = auVar243._8_4_ * -0.6931472 + auVar169._8_4_;
                    fVar225 = auVar243._12_4_ * -0.6931472 + auVar169._12_4_;
                    auVar260._0_4_ = (int)auVar243._0_4_;
                    auVar260._4_4_ = (int)auVar243._4_4_;
                    auVar260._8_4_ = (int)auVar243._8_4_;
                    auVar260._12_4_ = (int)auVar243._12_4_;
                    auVar243 = vpslld_avx(auVar260,0x17);
                    auVar243 = vpaddd_avx(auVar243,auVar168);
                    auVar108._0_4_ =
                         (fVar226 * fVar226 *
                          (((((fVar226 * 0.00019875691 + 0.0013981999) * fVar226 + 0.008333452) *
                             fVar226 + 0.041665796) * fVar226 + 0.16666666) * fVar226 + 0.5) +
                         fVar226 + fVar79) * auVar243._0_4_ + fVar79;
                    auVar108._4_4_ =
                         (fVar121 * fVar121 *
                          (((((fVar121 * 0.00019875691 + 0.0013981999) * fVar121 + 0.008333452) *
                             fVar121 + 0.041665796) * fVar121 + 0.16666666) * fVar121 + 0.5) +
                         fVar121 + fVar97) * auVar243._4_4_ + fVar97;
                    auVar108._8_4_ =
                         (fVar223 * fVar223 *
                          (((((fVar223 * 0.00019875691 + 0.0013981999) * fVar223 + 0.008333452) *
                             fVar223 + 0.041665796) * fVar223 + 0.16666666) * fVar223 + 0.5) +
                         fVar223 + fVar119) * auVar243._8_4_ + fVar119;
                    auVar108._12_4_ =
                         (fVar225 * fVar225 *
                          (((((fVar225 * 0.00019875691 + 0.0013981999) * fVar225 + 0.008333452) *
                             fVar225 + 0.041665796) * fVar225 + 0.16666666) * fVar225 + 0.5) +
                         fVar225 + fVar120) * auVar243._12_4_ + fVar120;
                    auVar109 = vdivps_avx(auVar168,auVar108);
                    break;
                  case 5:
                    auVar228._8_4_ = 0x42b0c0a5;
                    auVar228._0_8_ = 0x42b0c0a542b0c0a5;
                    auVar228._12_4_ = 0x42b0c0a5;
                    auVar243 = vminps_avx(auVar109,auVar228);
                    auVar294._8_4_ = 0xc2b0c0a5;
                    auVar294._0_8_ = 0xc2b0c0a5c2b0c0a5;
                    auVar294._12_4_ = 0xc2b0c0a5;
                    auVar169 = vmaxps_avx(auVar294,auVar243);
                    auVar311._0_4_ = auVar169._0_4_ * 1.442695 + 0.5;
                    auVar311._4_4_ = auVar169._4_4_ * 1.442695 + 0.5;
                    auVar311._8_4_ = auVar169._8_4_ * 1.442695 + 0.5;
                    auVar311._12_4_ = auVar169._12_4_ * 1.442695 + 0.5;
                    auVar328._0_4_ = (int)auVar311._0_4_;
                    auVar328._4_4_ = (int)auVar311._4_4_;
                    auVar328._8_4_ = (int)auVar311._8_4_;
                    auVar328._12_4_ = (int)auVar311._12_4_;
                    auVar310 = vcvtdq2ps_avx(auVar328);
                    auVar243 = vcmpps_avx(auVar311,auVar310,1);
                    auVar243 = vandps_avx(auVar243,auVar168);
                    auVar243 = vsubps_avx(auVar310,auVar243);
                    auVar329._0_4_ = auVar243._0_4_ * 0.6931472;
                    auVar329._4_4_ = auVar243._4_4_ * 0.6931472;
                    auVar329._8_4_ = auVar243._8_4_ * 0.6931472;
                    auVar329._12_4_ = auVar243._12_4_ * 0.6931472;
                    auVar310 = vsubps_avx(auVar169,auVar329);
                    fVar225 = auVar310._0_4_;
                    fVar167 = auVar310._4_4_;
                    fVar218 = auVar310._8_4_;
                    fVar219 = auVar310._12_4_;
                    auVar254._0_4_ = (int)auVar243._0_4_;
                    auVar254._4_4_ = (int)auVar243._4_4_;
                    auVar254._8_4_ = (int)auVar243._8_4_;
                    auVar254._12_4_ = (int)auVar243._12_4_;
                    auVar243 = vpslld_avx(auVar254,0x17);
                    auVar243 = vpaddd_avx(auVar243,auVar168);
                    auVar255._0_4_ =
                         (fVar225 + fVar79 +
                         fVar225 * fVar225 *
                         (((((fVar225 * 0.00019875691 + 0.0013981999) * fVar225 + 0.008333452) *
                            fVar225 + 0.041665796) * fVar225 + 0.16666666) * fVar225 + 0.5)) *
                         auVar243._0_4_ + fVar79;
                    auVar255._4_4_ =
                         (fVar167 + fVar97 +
                         fVar167 * fVar167 *
                         (((((fVar167 * 0.00019875691 + 0.0013981999) * fVar167 + 0.008333452) *
                            fVar167 + 0.041665796) * fVar167 + 0.16666666) * fVar167 + 0.5)) *
                         auVar243._4_4_ + fVar97;
                    auVar255._8_4_ =
                         (fVar218 + fVar119 +
                         fVar218 * fVar218 *
                         (((((fVar218 * 0.00019875691 + 0.0013981999) * fVar218 + 0.008333452) *
                            fVar218 + 0.041665796) * fVar218 + 0.16666666) * fVar218 + 0.5)) *
                         auVar243._8_4_ + fVar119;
                    auVar255._12_4_ =
                         (fVar219 + fVar120 +
                         fVar219 * fVar219 *
                         (((((fVar219 * 0.00019875691 + 0.0013981999) * fVar219 + 0.008333452) *
                            fVar219 + 0.041665796) * fVar219 + 0.16666666) * fVar219 + 0.5)) *
                         auVar243._12_4_ + fVar120;
                    auVar131._8_4_ = 0x800000;
                    auVar131._0_8_ = 0x80000000800000;
                    auVar131._12_4_ = 0x800000;
                    auVar243 = vmaxps_avx(auVar255,auVar131);
                    auVar310 = vpsrld_avx(auVar243,0x17);
                    auVar183._8_4_ = 0xffffff82;
                    auVar183._0_8_ = 0xffffff82ffffff82;
                    auVar183._12_4_ = 0xffffff82;
                    auVar310 = vpaddd_avx(auVar310,auVar183);
                    auVar184._8_4_ = 0x807fffff;
                    auVar184._0_8_ = 0x807fffff807fffff;
                    auVar184._12_4_ = 0x807fffff;
                    auVar243 = vandps_avx(auVar243,auVar184);
                    auVar291 = vorps_avx(auVar243,auVar236);
                    auVar169 = vcvtdq2ps_avx(auVar310);
                    auVar185._8_4_ = 0x3f3504f3;
                    auVar185._0_8_ = 0x3f3504f33f3504f3;
                    auVar185._12_4_ = 0x3f3504f3;
                    auVar310 = vcmpps_avx(auVar291,auVar185,1);
                    auVar243 = vandps_avx(auVar310,auVar291);
                    fVar225 = auVar291._0_4_ + -1.0 + auVar243._0_4_;
                    fVar167 = auVar291._4_4_ + -1.0 + auVar243._4_4_;
                    fVar218 = auVar291._8_4_ + -1.0 + auVar243._8_4_;
                    fVar219 = auVar291._12_4_ + -1.0 + auVar243._12_4_;
                    auVar243 = vandps_avx(auVar310,auVar168);
                    auVar310 = vsubps_avx(auVar169,auVar243);
                    auVar243 = vcmpps_avx(auVar255,_DAT_005b3ce0,2);
                    auVar132._0_4_ =
                         (fVar225 * fVar225 *
                          (((((((((fVar225 * 0.070376836 + -0.1151461) * fVar225 + 0.116769984) *
                                 fVar225 + -0.12420141) * fVar225 + 0.14249323) * fVar225 +
                              -0.16668057) * fVar225 + 0.20000714) * fVar225 + -0.24999994) *
                            fVar225 + 0.3333333) * fVar225 + -0.5) +
                         auVar310._0_4_ * 0.6931472 + fVar225) * -2.0;
                    auVar132._4_4_ =
                         (fVar167 * fVar167 *
                          (((((((((fVar167 * 0.070376836 + -0.1151461) * fVar167 + 0.116769984) *
                                 fVar167 + -0.12420141) * fVar167 + 0.14249323) * fVar167 +
                              -0.16668057) * fVar167 + 0.20000714) * fVar167 + -0.24999994) *
                            fVar167 + 0.3333333) * fVar167 + -0.5) +
                         auVar310._4_4_ * 0.6931472 + fVar167) * -2.0;
                    auVar132._8_4_ =
                         (fVar218 * fVar218 *
                          (((((((((fVar218 * 0.070376836 + -0.1151461) * fVar218 + 0.116769984) *
                                 fVar218 + -0.12420141) * fVar218 + 0.14249323) * fVar218 +
                              -0.16668057) * fVar218 + 0.20000714) * fVar218 + -0.24999994) *
                            fVar218 + 0.3333333) * fVar218 + -0.5) +
                         auVar310._8_4_ * 0.6931472 + fVar218) * -2.0;
                    auVar132._12_4_ =
                         (fVar219 * fVar219 *
                          (((((((((fVar219 * 0.070376836 + -0.1151461) * fVar219 + 0.116769984) *
                                 fVar219 + -0.12420141) * fVar219 + 0.14249323) * fVar219 +
                              -0.16668057) * fVar219 + 0.20000714) * fVar219 + -0.24999994) *
                            fVar219 + 0.3333333) * fVar219 + -0.5) +
                         auVar310._12_4_ * 0.6931472 + fVar219) * -2.0;
                    auVar186._8_4_ = 0x7fffffff;
                    auVar186._0_8_ = 0x7fffffff7fffffff;
                    auVar186._12_4_ = 0x7fffffff;
                    auVar243 = vblendvps_avx(auVar132,auVar186,auVar243);
                    auVar187._8_4_ = 0x42b0c0a5;
                    auVar187._0_8_ = 0x42b0c0a542b0c0a5;
                    auVar187._12_4_ = 0x42b0c0a5;
                    auVar243 = vminps_avx(auVar243,auVar187);
                    auVar188._8_4_ = 0xc2b0c0a5;
                    auVar188._0_8_ = 0xc2b0c0a5c2b0c0a5;
                    auVar188._12_4_ = 0xc2b0c0a5;
                    auVar169 = vmaxps_avx(auVar243,auVar188);
                    auVar189._0_4_ = auVar169._0_4_ * 1.442695 + 0.5;
                    auVar189._4_4_ = auVar169._4_4_ * 1.442695 + 0.5;
                    auVar189._8_4_ = auVar169._8_4_ * 1.442695 + 0.5;
                    auVar189._12_4_ = auVar169._12_4_ * 1.442695 + 0.5;
                    auVar256._0_4_ = (int)auVar189._0_4_;
                    auVar256._4_4_ = (int)auVar189._4_4_;
                    auVar256._8_4_ = (int)auVar189._8_4_;
                    auVar256._12_4_ = (int)auVar189._12_4_;
                    auVar310 = vcvtdq2ps_avx(auVar256);
                    auVar243 = vcmpps_avx(auVar189,auVar310,1);
                    auVar243 = vandps_avx(auVar243,auVar168);
                    auVar243 = vsubps_avx(auVar310,auVar243);
                    auVar257._0_4_ = auVar243._0_4_ * 0.6931472;
                    auVar257._4_4_ = auVar243._4_4_ * 0.6931472;
                    auVar257._8_4_ = auVar243._8_4_ * 0.6931472;
                    auVar257._12_4_ = auVar243._12_4_ * 0.6931472;
                    auVar240 = ZEXT1664(auVar168);
                    auVar310 = vsubps_avx(auVar169,auVar257);
                    fVar225 = auVar310._0_4_;
                    fVar167 = auVar310._4_4_;
                    fVar218 = auVar310._8_4_;
                    fVar219 = auVar310._12_4_;
                    auVar190._0_4_ = (int)auVar243._0_4_;
                    auVar190._4_4_ = (int)auVar243._4_4_;
                    auVar190._8_4_ = (int)auVar243._8_4_;
                    auVar190._12_4_ = (int)auVar243._12_4_;
                    auVar243 = vpslld_avx(auVar190,0x17);
                    auVar168 = vpaddd_avx(auVar243,auVar168);
                    auVar133._0_4_ =
                         (fVar225 + fVar79 +
                         (((((fVar225 * 0.00019875691 + 0.0013981999) * fVar225 + 0.008333452) *
                            fVar225 + 0.041665796) * fVar225 + 0.16666666) * fVar225 + 0.5) *
                         fVar225 * fVar225) * auVar168._0_4_ + fVar79;
                    auVar133._4_4_ =
                         (fVar167 + fVar97 +
                         (((((fVar167 * 0.00019875691 + 0.0013981999) * fVar167 + 0.008333452) *
                            fVar167 + 0.041665796) * fVar167 + 0.16666666) * fVar167 + 0.5) *
                         fVar167 * fVar167) * auVar168._4_4_ + fVar97;
                    auVar133._8_4_ =
                         (fVar218 + fVar119 +
                         (((((fVar218 * 0.00019875691 + 0.0013981999) * fVar218 + 0.008333452) *
                            fVar218 + 0.041665796) * fVar218 + 0.16666666) * fVar218 + 0.5) *
                         fVar218 * fVar218) * auVar168._8_4_ + fVar119;
                    auVar133._12_4_ =
                         (fVar219 + fVar120 +
                         (((((fVar219 * 0.00019875691 + 0.0013981999) * fVar219 + 0.008333452) *
                            fVar219 + 0.041665796) * fVar219 + 0.16666666) * fVar219 + 0.5) *
                         fVar219 * fVar219) * auVar168._12_4_ + fVar120;
                    auVar191._8_4_ = 0x40000000;
                    auVar191._0_8_ = 0x4000000040000000;
                    auVar191._12_4_ = 0x40000000;
                    auVar168 = vdivps_avx(auVar191,auVar133);
                    auVar134._0_4_ = auVar168._0_4_ + -1.0;
                    auVar134._4_4_ = auVar168._4_4_ + -1.0;
                    auVar134._8_4_ = auVar168._8_4_ + -1.0;
                    auVar134._12_4_ = auVar168._12_4_ + -1.0;
                    goto LAB_002a219f;
                  case 6:
                    pfVar76 = (float *)(this->super_Deconvolution).activation_params.data;
                    fVar79 = *pfVar76;
                    fVar97 = pfVar76[1];
                    auVar137._0_4_ = fVar79 * auVar109._0_4_ + fVar97;
                    auVar137._4_4_ = fVar79 * fVar226 + fVar97;
                    auVar137._8_4_ = fVar79 * fVar121 + fVar97;
                    auVar137._12_4_ = fVar79 * fVar223 + fVar97;
                    auVar243 = vmaxps_avx(auVar137,_DAT_005b3ce0);
                    auVar134 = vminps_avx(auVar243,auVar168);
LAB_002a219f:
                    auVar109._0_4_ = auVar134._0_4_ * auVar109._0_4_;
                    auVar109._4_4_ = auVar134._4_4_ * fVar226;
                    auVar109._8_4_ = auVar134._8_4_ * fVar121;
                    auVar109._12_4_ = auVar134._12_4_ * fVar223;
                  }
                  *pauVar72 = auVar109;
                  pauVar72 = pauVar72 + 1;
                  uVar62 = uVar62 + 1;
                  iVar8 = iVar8 + 1;
                } while (uVar62 != local_198.w);
              }
              iVar75 = iVar75 + 1;
            } while (iVar75 != local_198.h);
          }
          local_258 = (void *)((long)local_258 + 1);
        } while (local_258 != (void *)(long)local_198.c);
      }
      local_140._0_4_ = (uint)local_140 | uVar57 ^ 1;
      if (((uint)local_140 == 0) && (0 < (long)local_198.c)) {
        iVar20 = (this->super_Deconvolution).dilation_w;
        iVar21 = (this->super_Deconvolution).dilation_h;
        iVar46 = (this->super_Deconvolution).stride_w;
        iVar74 = (this->super_Deconvolution).stride_h;
        iVar61 = (this->super_Deconvolution).activation_type;
        pvVar30 = (this->super_Deconvolution).bias_data.data;
        uVar22 = (this->super_Deconvolution).kernel_w;
        uVar51 = (this->super_Deconvolution).kernel_h;
        local_258 = (void *)0x0;
        auVar237._8_4_ = 0x3f000000;
        auVar237._0_8_ = 0x3f0000003f000000;
        auVar237._12_4_ = 0x3f000000;
        auVar240 = ZEXT1664(CONCAT412(0x3f800000,CONCAT48(0x3f800000,0x3f8000003f800000)));
        do {
          if (0 < local_198.h) {
            iVar69 = bottom_blob->w;
            iVar60 = bottom_blob->h;
            pauVar72 = (undefined1 (*) [16])
                       (local_198.cstep * (long)local_258 * local_198.elemsize +
                       (long)local_198.data);
            uVar23 = bottom_blob->c;
            iVar75 = 0;
            do {
              if (0 < local_198.w) {
                uVar62 = 0;
                iVar8 = (1 - uVar22) * iVar20;
                do {
                  if (pvVar30 == (void *)0x0) {
                    auVar306 = ZEXT1664((undefined1  [16])0x0);
                  }
                  else {
                    auVar306 = ZEXT1664(*(undefined1 (*) [16])
                                         ((long)pvVar30 + (long)local_258 * 0x10));
                  }
                  auVar112 = auVar306._0_16_;
                  if (0 < (int)uVar23) {
                    pvVar66 = (void *)((this->weight_data_tm).cstep * (long)local_258 *
                                       (this->weight_data_tm).elemsize +
                                      (long)(this->weight_data_tm).data);
                    uVar58 = 0;
                    do {
                      if (0 < (int)uVar51) {
                        uVar55 = 0;
                        uVar64 = 0;
                        do {
                          iVar47 = (((int)uVar64 - uVar51) + 1) * iVar21 + iVar75;
                          if ((((-1 < iVar47) && (iVar48 = iVar47 / iVar74, iVar47 % iVar74 == 0))
                              && (iVar48 < iVar60)) && (0 < (int)uVar22)) {
                            uVar65 = uVar55;
                            uVar67 = (ulong)uVar22;
                            iVar47 = iVar8;
                            do {
                              if (((-1 < iVar47) && (iVar49 = iVar47 / iVar46, iVar47 % iVar46 == 0)
                                  ) && (iVar49 < iVar69)) {
                                fVar79 = *(float *)((long)bottom_blob->data +
                                                   (long)iVar49 * 4 +
                                                   (long)iVar48 *
                                                   (long)bottom_blob->w * bottom_blob->elemsize +
                                                   bottom_blob->cstep * bottom_blob->elemsize *
                                                   uVar58);
                                pfVar76 = (float *)((long)pvVar66 + (uVar65 & 0xffffffff) * 4);
                                auVar306 = ZEXT1664(CONCAT412(fVar79 * pfVar76[3] + auVar306._12_4_,
                                                              CONCAT48(fVar79 * pfVar76[2] +
                                                                       auVar306._8_4_,
                                                                       CONCAT44(fVar79 * pfVar76[1]
                                                                                + auVar306._4_4_,
                                                                                fVar79 * *pfVar76 +
                                                                                auVar306._0_4_))));
                              }
                              uVar65 = uVar65 + 4;
                              iVar47 = iVar47 + iVar20;
                              uVar67 = uVar67 - 1;
                            } while (uVar67 != 0);
                          }
                          uVar64 = uVar64 + 1;
                          uVar55 = uVar55 + (ulong)uVar22 * 4;
                        } while (uVar64 != uVar51);
                      }
                      auVar112 = auVar306._0_16_;
                      pvVar66 = (void *)((long)pvVar66 + (long)(int)(uVar22 * uVar51 * 4) * 4);
                      uVar58 = uVar58 + 1;
                    } while (uVar58 != uVar23);
                  }
                  auVar168 = auVar240._0_16_;
                  fVar79 = auVar240._0_4_;
                  fVar97 = auVar240._4_4_;
                  fVar119 = auVar240._8_4_;
                  fVar120 = auVar240._12_4_;
                  fVar226 = auVar112._4_4_;
                  fVar121 = auVar112._8_4_;
                  fVar223 = auVar112._12_4_;
                  switch(iVar61) {
                  case 1:
                    auVar112 = vmaxps_avx(auVar112,_DAT_005b3ce0);
                    break;
                  case 2:
                    auVar168 = vmaxps_avx(auVar112,ZEXT816(0) << 0x40);
                    auVar243 = vminps_avx(auVar112,ZEXT816(0) << 0x40);
                    fVar79 = *(this->super_Deconvolution).activation_params.data;
                    auVar112._0_4_ = fVar79 * auVar243._0_4_ + auVar168._0_4_;
                    auVar112._4_4_ = fVar79 * auVar243._4_4_ + auVar168._4_4_;
                    auVar112._8_4_ = fVar79 * auVar243._8_4_ + auVar168._8_4_;
                    auVar112._12_4_ = fVar79 * auVar243._12_4_ + auVar168._12_4_;
                    break;
                  case 3:
                    puVar26 = (undefined4 *)(this->super_Deconvolution).activation_params.data;
                    uVar7 = *puVar26;
                    auVar265._4_4_ = uVar7;
                    auVar265._0_4_ = uVar7;
                    auVar265._8_4_ = uVar7;
                    auVar265._12_4_ = uVar7;
                    uVar7 = puVar26[1];
                    auVar334._4_4_ = uVar7;
                    auVar334._0_4_ = uVar7;
                    auVar334._8_4_ = uVar7;
                    auVar334._12_4_ = uVar7;
                    auVar168 = vmaxps_avx(auVar112,auVar265);
                    auVar112 = vminps_avx(auVar334,auVar168);
                    break;
                  case 4:
                    auVar110._0_8_ = auVar112._0_8_ ^ 0x8000000080000000;
                    auVar110._8_4_ = -fVar121;
                    auVar110._12_4_ = -fVar223;
                    auVar142._8_4_ = 0x42b0c0a5;
                    auVar142._0_8_ = 0x42b0c0a542b0c0a5;
                    auVar142._12_4_ = 0x42b0c0a5;
                    auVar243 = vminps_avx(auVar110,auVar142);
                    auVar143._8_4_ = 0xc2b0c0a5;
                    auVar143._0_8_ = 0xc2b0c0a5c2b0c0a5;
                    auVar143._12_4_ = 0xc2b0c0a5;
                    auVar169 = vmaxps_avx(auVar243,auVar143);
                    auVar266._0_4_ = auVar169._0_4_ * 1.442695 + 0.5;
                    auVar266._4_4_ = auVar169._4_4_ * 1.442695 + 0.5;
                    auVar266._8_4_ = auVar169._8_4_ * 1.442695 + 0.5;
                    auVar266._12_4_ = auVar169._12_4_ * 1.442695 + 0.5;
                    auVar335._0_4_ = (int)auVar266._0_4_;
                    auVar335._4_4_ = (int)auVar266._4_4_;
                    auVar335._8_4_ = (int)auVar266._8_4_;
                    auVar335._12_4_ = (int)auVar266._12_4_;
                    auVar310 = vcvtdq2ps_avx(auVar335);
                    auVar243 = vcmpps_avx(auVar266,auVar310,1);
                    auVar243 = vandps_avx(auVar243,auVar168);
                    auVar243 = vsubps_avx(auVar310,auVar243);
                    fVar226 = auVar243._0_4_ * -0.6931472 + auVar169._0_4_;
                    fVar121 = auVar243._4_4_ * -0.6931472 + auVar169._4_4_;
                    fVar223 = auVar243._8_4_ * -0.6931472 + auVar169._8_4_;
                    fVar225 = auVar243._12_4_ * -0.6931472 + auVar169._12_4_;
                    auVar267._0_4_ = (int)auVar243._0_4_;
                    auVar267._4_4_ = (int)auVar243._4_4_;
                    auVar267._8_4_ = (int)auVar243._8_4_;
                    auVar267._12_4_ = (int)auVar243._12_4_;
                    auVar243 = vpslld_avx(auVar267,0x17);
                    auVar243 = vpaddd_avx(auVar243,auVar168);
                    auVar111._0_4_ =
                         (fVar226 * fVar226 *
                          (((((fVar226 * 0.00019875691 + 0.0013981999) * fVar226 + 0.008333452) *
                             fVar226 + 0.041665796) * fVar226 + 0.16666666) * fVar226 + 0.5) +
                         fVar226 + fVar79) * auVar243._0_4_ + fVar79;
                    auVar111._4_4_ =
                         (fVar121 * fVar121 *
                          (((((fVar121 * 0.00019875691 + 0.0013981999) * fVar121 + 0.008333452) *
                             fVar121 + 0.041665796) * fVar121 + 0.16666666) * fVar121 + 0.5) +
                         fVar121 + fVar97) * auVar243._4_4_ + fVar97;
                    auVar111._8_4_ =
                         (fVar223 * fVar223 *
                          (((((fVar223 * 0.00019875691 + 0.0013981999) * fVar223 + 0.008333452) *
                             fVar223 + 0.041665796) * fVar223 + 0.16666666) * fVar223 + 0.5) +
                         fVar223 + fVar119) * auVar243._8_4_ + fVar119;
                    auVar111._12_4_ =
                         (fVar225 * fVar225 *
                          (((((fVar225 * 0.00019875691 + 0.0013981999) * fVar225 + 0.008333452) *
                             fVar225 + 0.041665796) * fVar225 + 0.16666666) * fVar225 + 0.5) +
                         fVar225 + fVar120) * auVar243._12_4_ + fVar120;
                    auVar112 = vdivps_avx(auVar168,auVar111);
                    break;
                  case 5:
                    auVar229._8_4_ = 0x42b0c0a5;
                    auVar229._0_8_ = 0x42b0c0a542b0c0a5;
                    auVar229._12_4_ = 0x42b0c0a5;
                    auVar243 = vminps_avx(auVar112,auVar229);
                    auVar295._8_4_ = 0xc2b0c0a5;
                    auVar295._0_8_ = 0xc2b0c0a5c2b0c0a5;
                    auVar295._12_4_ = 0xc2b0c0a5;
                    auVar169 = vmaxps_avx(auVar295,auVar243);
                    auVar312._0_4_ = auVar169._0_4_ * 1.442695 + 0.5;
                    auVar312._4_4_ = auVar169._4_4_ * 1.442695 + 0.5;
                    auVar312._8_4_ = auVar169._8_4_ * 1.442695 + 0.5;
                    auVar312._12_4_ = auVar169._12_4_ * 1.442695 + 0.5;
                    auVar332._0_4_ = (int)auVar312._0_4_;
                    auVar332._4_4_ = (int)auVar312._4_4_;
                    auVar332._8_4_ = (int)auVar312._8_4_;
                    auVar332._12_4_ = (int)auVar312._12_4_;
                    auVar310 = vcvtdq2ps_avx(auVar332);
                    auVar243 = vcmpps_avx(auVar312,auVar310,1);
                    auVar243 = vandps_avx(auVar243,auVar168);
                    auVar243 = vsubps_avx(auVar310,auVar243);
                    auVar333._0_4_ = auVar243._0_4_ * 0.6931472;
                    auVar333._4_4_ = auVar243._4_4_ * 0.6931472;
                    auVar333._8_4_ = auVar243._8_4_ * 0.6931472;
                    auVar333._12_4_ = auVar243._12_4_ * 0.6931472;
                    auVar310 = vsubps_avx(auVar169,auVar333);
                    fVar225 = auVar310._0_4_;
                    fVar167 = auVar310._4_4_;
                    fVar218 = auVar310._8_4_;
                    fVar219 = auVar310._12_4_;
                    auVar261._0_4_ = (int)auVar243._0_4_;
                    auVar261._4_4_ = (int)auVar243._4_4_;
                    auVar261._8_4_ = (int)auVar243._8_4_;
                    auVar261._12_4_ = (int)auVar243._12_4_;
                    auVar243 = vpslld_avx(auVar261,0x17);
                    auVar243 = vpaddd_avx(auVar243,auVar168);
                    auVar262._0_4_ =
                         (fVar225 + fVar79 +
                         fVar225 * fVar225 *
                         (((((fVar225 * 0.00019875691 + 0.0013981999) * fVar225 + 0.008333452) *
                            fVar225 + 0.041665796) * fVar225 + 0.16666666) * fVar225 + 0.5)) *
                         auVar243._0_4_ + fVar79;
                    auVar262._4_4_ =
                         (fVar167 + fVar97 +
                         fVar167 * fVar167 *
                         (((((fVar167 * 0.00019875691 + 0.0013981999) * fVar167 + 0.008333452) *
                            fVar167 + 0.041665796) * fVar167 + 0.16666666) * fVar167 + 0.5)) *
                         auVar243._4_4_ + fVar97;
                    auVar262._8_4_ =
                         (fVar218 + fVar119 +
                         fVar218 * fVar218 *
                         (((((fVar218 * 0.00019875691 + 0.0013981999) * fVar218 + 0.008333452) *
                            fVar218 + 0.041665796) * fVar218 + 0.16666666) * fVar218 + 0.5)) *
                         auVar243._8_4_ + fVar119;
                    auVar262._12_4_ =
                         (fVar219 + fVar120 +
                         fVar219 * fVar219 *
                         (((((fVar219 * 0.00019875691 + 0.0013981999) * fVar219 + 0.008333452) *
                            fVar219 + 0.041665796) * fVar219 + 0.16666666) * fVar219 + 0.5)) *
                         auVar243._12_4_ + fVar120;
                    auVar138._8_4_ = 0x800000;
                    auVar138._0_8_ = 0x80000000800000;
                    auVar138._12_4_ = 0x800000;
                    auVar243 = vmaxps_avx(auVar262,auVar138);
                    auVar310 = vpsrld_avx(auVar243,0x17);
                    auVar192._8_4_ = 0xffffff82;
                    auVar192._0_8_ = 0xffffff82ffffff82;
                    auVar192._12_4_ = 0xffffff82;
                    auVar310 = vpaddd_avx(auVar310,auVar192);
                    auVar193._8_4_ = 0x807fffff;
                    auVar193._0_8_ = 0x807fffff807fffff;
                    auVar193._12_4_ = 0x807fffff;
                    auVar243 = vandps_avx(auVar243,auVar193);
                    auVar291 = vorps_avx(auVar243,auVar237);
                    auVar169 = vcvtdq2ps_avx(auVar310);
                    auVar194._8_4_ = 0x3f3504f3;
                    auVar194._0_8_ = 0x3f3504f33f3504f3;
                    auVar194._12_4_ = 0x3f3504f3;
                    auVar310 = vcmpps_avx(auVar291,auVar194,1);
                    auVar243 = vandps_avx(auVar310,auVar291);
                    fVar225 = auVar291._0_4_ + -1.0 + auVar243._0_4_;
                    fVar167 = auVar291._4_4_ + -1.0 + auVar243._4_4_;
                    fVar218 = auVar291._8_4_ + -1.0 + auVar243._8_4_;
                    fVar219 = auVar291._12_4_ + -1.0 + auVar243._12_4_;
                    auVar243 = vandps_avx(auVar310,auVar168);
                    auVar310 = vsubps_avx(auVar169,auVar243);
                    auVar243 = vcmpps_avx(auVar262,_DAT_005b3ce0,2);
                    auVar139._0_4_ =
                         (fVar225 * fVar225 *
                          (((((((((fVar225 * 0.070376836 + -0.1151461) * fVar225 + 0.116769984) *
                                 fVar225 + -0.12420141) * fVar225 + 0.14249323) * fVar225 +
                              -0.16668057) * fVar225 + 0.20000714) * fVar225 + -0.24999994) *
                            fVar225 + 0.3333333) * fVar225 + -0.5) +
                         auVar310._0_4_ * 0.6931472 + fVar225) * -2.0;
                    auVar139._4_4_ =
                         (fVar167 * fVar167 *
                          (((((((((fVar167 * 0.070376836 + -0.1151461) * fVar167 + 0.116769984) *
                                 fVar167 + -0.12420141) * fVar167 + 0.14249323) * fVar167 +
                              -0.16668057) * fVar167 + 0.20000714) * fVar167 + -0.24999994) *
                            fVar167 + 0.3333333) * fVar167 + -0.5) +
                         auVar310._4_4_ * 0.6931472 + fVar167) * -2.0;
                    auVar139._8_4_ =
                         (fVar218 * fVar218 *
                          (((((((((fVar218 * 0.070376836 + -0.1151461) * fVar218 + 0.116769984) *
                                 fVar218 + -0.12420141) * fVar218 + 0.14249323) * fVar218 +
                              -0.16668057) * fVar218 + 0.20000714) * fVar218 + -0.24999994) *
                            fVar218 + 0.3333333) * fVar218 + -0.5) +
                         auVar310._8_4_ * 0.6931472 + fVar218) * -2.0;
                    auVar139._12_4_ =
                         (fVar219 * fVar219 *
                          (((((((((fVar219 * 0.070376836 + -0.1151461) * fVar219 + 0.116769984) *
                                 fVar219 + -0.12420141) * fVar219 + 0.14249323) * fVar219 +
                              -0.16668057) * fVar219 + 0.20000714) * fVar219 + -0.24999994) *
                            fVar219 + 0.3333333) * fVar219 + -0.5) +
                         auVar310._12_4_ * 0.6931472 + fVar219) * -2.0;
                    auVar195._8_4_ = 0x7fffffff;
                    auVar195._0_8_ = 0x7fffffff7fffffff;
                    auVar195._12_4_ = 0x7fffffff;
                    auVar243 = vblendvps_avx(auVar139,auVar195,auVar243);
                    auVar196._8_4_ = 0x42b0c0a5;
                    auVar196._0_8_ = 0x42b0c0a542b0c0a5;
                    auVar196._12_4_ = 0x42b0c0a5;
                    auVar243 = vminps_avx(auVar243,auVar196);
                    auVar197._8_4_ = 0xc2b0c0a5;
                    auVar197._0_8_ = 0xc2b0c0a5c2b0c0a5;
                    auVar197._12_4_ = 0xc2b0c0a5;
                    auVar169 = vmaxps_avx(auVar243,auVar197);
                    auVar198._0_4_ = auVar169._0_4_ * 1.442695 + 0.5;
                    auVar198._4_4_ = auVar169._4_4_ * 1.442695 + 0.5;
                    auVar198._8_4_ = auVar169._8_4_ * 1.442695 + 0.5;
                    auVar198._12_4_ = auVar169._12_4_ * 1.442695 + 0.5;
                    auVar263._0_4_ = (int)auVar198._0_4_;
                    auVar263._4_4_ = (int)auVar198._4_4_;
                    auVar263._8_4_ = (int)auVar198._8_4_;
                    auVar263._12_4_ = (int)auVar198._12_4_;
                    auVar310 = vcvtdq2ps_avx(auVar263);
                    auVar243 = vcmpps_avx(auVar198,auVar310,1);
                    auVar243 = vandps_avx(auVar243,auVar168);
                    auVar243 = vsubps_avx(auVar310,auVar243);
                    auVar264._0_4_ = auVar243._0_4_ * 0.6931472;
                    auVar264._4_4_ = auVar243._4_4_ * 0.6931472;
                    auVar264._8_4_ = auVar243._8_4_ * 0.6931472;
                    auVar264._12_4_ = auVar243._12_4_ * 0.6931472;
                    auVar240 = ZEXT1664(auVar168);
                    auVar310 = vsubps_avx(auVar169,auVar264);
                    fVar225 = auVar310._0_4_;
                    fVar167 = auVar310._4_4_;
                    fVar218 = auVar310._8_4_;
                    fVar219 = auVar310._12_4_;
                    auVar199._0_4_ = (int)auVar243._0_4_;
                    auVar199._4_4_ = (int)auVar243._4_4_;
                    auVar199._8_4_ = (int)auVar243._8_4_;
                    auVar199._12_4_ = (int)auVar243._12_4_;
                    auVar243 = vpslld_avx(auVar199,0x17);
                    auVar168 = vpaddd_avx(auVar243,auVar168);
                    auVar140._0_4_ =
                         (fVar225 + fVar79 +
                         (((((fVar225 * 0.00019875691 + 0.0013981999) * fVar225 + 0.008333452) *
                            fVar225 + 0.041665796) * fVar225 + 0.16666666) * fVar225 + 0.5) *
                         fVar225 * fVar225) * auVar168._0_4_ + fVar79;
                    auVar140._4_4_ =
                         (fVar167 + fVar97 +
                         (((((fVar167 * 0.00019875691 + 0.0013981999) * fVar167 + 0.008333452) *
                            fVar167 + 0.041665796) * fVar167 + 0.16666666) * fVar167 + 0.5) *
                         fVar167 * fVar167) * auVar168._4_4_ + fVar97;
                    auVar140._8_4_ =
                         (fVar218 + fVar119 +
                         (((((fVar218 * 0.00019875691 + 0.0013981999) * fVar218 + 0.008333452) *
                            fVar218 + 0.041665796) * fVar218 + 0.16666666) * fVar218 + 0.5) *
                         fVar218 * fVar218) * auVar168._8_4_ + fVar119;
                    auVar140._12_4_ =
                         (fVar219 + fVar120 +
                         (((((fVar219 * 0.00019875691 + 0.0013981999) * fVar219 + 0.008333452) *
                            fVar219 + 0.041665796) * fVar219 + 0.16666666) * fVar219 + 0.5) *
                         fVar219 * fVar219) * auVar168._12_4_ + fVar120;
                    auVar200._8_4_ = 0x40000000;
                    auVar200._0_8_ = 0x4000000040000000;
                    auVar200._12_4_ = 0x40000000;
                    auVar168 = vdivps_avx(auVar200,auVar140);
                    auVar141._0_4_ = auVar168._0_4_ + -1.0;
                    auVar141._4_4_ = auVar168._4_4_ + -1.0;
                    auVar141._8_4_ = auVar168._8_4_ + -1.0;
                    auVar141._12_4_ = auVar168._12_4_ + -1.0;
                    goto LAB_002a2921;
                  case 6:
                    pfVar76 = (float *)(this->super_Deconvolution).activation_params.data;
                    fVar79 = *pfVar76;
                    fVar97 = pfVar76[1];
                    auVar144._0_4_ = fVar79 * auVar112._0_4_ + fVar97;
                    auVar144._4_4_ = fVar79 * fVar226 + fVar97;
                    auVar144._8_4_ = fVar79 * fVar121 + fVar97;
                    auVar144._12_4_ = fVar79 * fVar223 + fVar97;
                    auVar243 = vmaxps_avx(auVar144,_DAT_005b3ce0);
                    auVar141 = vminps_avx(auVar243,auVar168);
LAB_002a2921:
                    auVar112._0_4_ = auVar141._0_4_ * auVar112._0_4_;
                    auVar112._4_4_ = auVar141._4_4_ * fVar226;
                    auVar112._8_4_ = auVar141._8_4_ * fVar121;
                    auVar112._12_4_ = auVar141._12_4_ * fVar223;
                  }
                  *pauVar72 = auVar112;
                  pauVar72 = pauVar72 + 1;
                  uVar62 = uVar62 + 1;
                  iVar8 = iVar8 + 1;
                } while (uVar62 != local_198.w);
              }
              iVar75 = iVar75 + 1;
            } while (iVar75 != local_198.h);
          }
          local_258 = (void *)((long)local_258 + 1);
        } while (local_258 != (void *)(long)local_198.c);
      }
      if ((uVar57 == 4 && (uVar68 ^ 1) == 0) &&
         (local_140 = (void *)(long)local_198.c, 0 < (long)local_140)) {
        iVar20 = (this->super_Deconvolution).dilation_w;
        iVar21 = (this->super_Deconvolution).dilation_h;
        iVar46 = (this->super_Deconvolution).stride_w;
        iVar74 = (this->super_Deconvolution).stride_h;
        iVar61 = (this->super_Deconvolution).activation_type;
        pvVar30 = (this->super_Deconvolution).bias_data.data;
        uVar22 = (this->super_Deconvolution).kernel_w;
        uVar51 = (this->super_Deconvolution).kernel_h;
        local_130 = local_198.elemsize * local_198.cstep;
        local_d0 = local_198.data;
        iVar69 = bottom_blob->w;
        iVar60 = bottom_blob->h;
        uVar23 = bottom_blob->c;
        local_258 = (void *)0x0;
        do {
          if (0 < iVar45) {
            sVar31 = (this->weight_data_tm).cstep;
            sVar27 = (this->weight_data_tm).elemsize;
            local_238 = (float *)(local_130 * (long)local_258 + (long)local_d0);
            pvVar66 = (this->weight_data_tm).data;
            iVar75 = 0;
            do {
              if (0 < iVar63) {
                iVar47 = bottom_blob->w;
                pvVar25 = bottom_blob->data;
                sVar28 = bottom_blob->elemsize;
                sVar29 = bottom_blob->cstep;
                pfVar76 = (float *)(this->super_Deconvolution).activation_params.data;
                uVar62 = 0;
                iVar8 = (1 - uVar22) * iVar20;
                do {
                  if (pvVar30 == (void *)0x0) {
                    fVar79 = 0.0;
                  }
                  else {
                    fVar79 = *(float *)((long)pvVar30 + (long)local_258 * 4);
                  }
                  if ((int)uVar23 < 1) {
                    auVar168 = (undefined1  [16])0x0;
                  }
                  else {
                    auVar240 = ZEXT1664((undefined1  [16])0x0);
                    uVar58 = 0;
                    pvVar78 = (void *)(sVar31 * (long)local_258 * sVar27 + (long)pvVar66);
                    do {
                      if (0 < (int)uVar51) {
                        uVar64 = 0;
                        uVar55 = 0;
                        do {
                          iVar48 = (((int)uVar55 - uVar51) + 1) * iVar21 + iVar75;
                          if ((((-1 < iVar48) && (iVar49 = iVar48 / iVar74, iVar48 % iVar74 == 0))
                              && (0 < (int)uVar22)) && (iVar49 < iVar60)) {
                            uVar65 = (ulong)uVar22;
                            uVar67 = uVar64;
                            iVar48 = iVar8;
                            do {
                              if (((-1 < iVar48) && (iVar50 = iVar48 / iVar46, iVar48 % iVar46 == 0)
                                  ) && (iVar50 < iVar69)) {
                                pfVar73 = (float *)((long)pvVar78 + (uVar67 & 0xffffffff) * 4);
                                pfVar1 = (float *)((long)pvVar25 +
                                                  (long)(iVar50 << 2) * 4 +
                                                  (long)iVar49 * (long)iVar47 * sVar28 +
                                                  sVar29 * sVar28 * uVar58);
                                auVar240 = ZEXT1664(CONCAT412(pfVar73[3] * pfVar1[3] +
                                                              auVar240._12_4_,
                                                              CONCAT48(pfVar73[2] * pfVar1[2] +
                                                                       auVar240._8_4_,
                                                                       CONCAT44(pfVar73[1] *
                                                                                pfVar1[1] +
                                                                                auVar240._4_4_,
                                                                                *pfVar73 * *pfVar1 +
                                                                                auVar240._0_4_))));
                              }
                              uVar67 = uVar67 + 4;
                              iVar48 = iVar48 + iVar20;
                              uVar65 = uVar65 - 1;
                            } while (uVar65 != 0);
                          }
                          uVar55 = uVar55 + 1;
                          uVar64 = uVar64 + (ulong)uVar22 * 4;
                        } while (uVar55 != uVar51);
                      }
                      auVar168 = auVar240._0_16_;
                      pvVar78 = (void *)((long)pvVar78 + (long)(int)(uVar22 * uVar51 * 4) * 4);
                      uVar58 = uVar58 + 1;
                    } while (uVar58 != uVar23);
                  }
                  auVar243 = vshufpd_avx(auVar168,auVar168,1);
                  auVar113._0_4_ = auVar243._0_4_ + auVar168._0_4_;
                  auVar113._4_4_ = auVar243._4_4_ + auVar168._4_4_;
                  auVar113._8_4_ = auVar243._8_4_ + auVar168._8_4_;
                  auVar113._12_4_ = auVar243._12_4_ + auVar168._12_4_;
                  auVar168 = vmovshdup_avx(auVar113);
                  fVar79 = auVar168._0_4_ + fVar79 + auVar113._0_4_;
                  auVar168 = ZEXT416((uint)fVar79);
                  fVar97 = fVar79;
                  switch(iVar61) {
                  case 1:
                    auVar168 = vmaxss_avx(ZEXT416((uint)fVar79),ZEXT416(0));
                    fVar97 = auVar168._0_4_;
                    break;
                  case 2:
                    auVar84._0_12_ = ZEXT812(0);
                    auVar84._12_4_ = 0;
                    auVar168 = vcmpss_avx(auVar84,auVar168,1);
                    auVar146._8_4_ = 0x3f800000;
                    auVar146._0_8_ = 0x3f8000003f800000;
                    auVar146._12_4_ = 0x3f800000;
                    auVar168 = vblendvps_avx(ZEXT416((uint)*pfVar76),auVar146,auVar168);
                    fVar97 = auVar168._0_4_ * fVar79;
                    break;
                  case 3:
                    auVar168 = vmaxss_avx(auVar168,ZEXT416((uint)*pfVar76));
                    fVar97 = auVar168._0_4_;
                    if (pfVar76[1] < auVar168._0_4_) {
                      fVar97 = pfVar76[1];
                    }
                    break;
                  case 4:
                    auVar168 = vminss_avx(auVar168,ZEXT416(0x42b0c0a5));
                    auVar114._0_8_ = auVar168._0_8_ ^ 0x8000000080000000;
                    auVar114._8_4_ = auVar168._8_4_ ^ 0x80000000;
                    auVar114._12_4_ = auVar168._12_4_ ^ 0x80000000;
                    auVar168 = vcmpss_avx(auVar168,ZEXT416(0xc2b0c0a5),1);
                    auVar145._8_4_ = 0x42b0c0a5;
                    auVar145._0_8_ = 0x42b0c0a542b0c0a5;
                    auVar145._12_4_ = 0x42b0c0a5;
                    auVar168 = vblendvps_avx(auVar114,auVar145,auVar168);
                    fVar79 = expf(auVar168._0_4_);
                    fVar97 = 1.0 / (fVar79 + 1.0);
                    break;
                  case 5:
                    fVar97 = expf(fVar79);
                    fVar97 = logf(fVar97 + 1.0);
                    fVar97 = tanhf(fVar97);
                    fVar97 = fVar97 * fVar79;
                    break;
                  case 6:
                    fVar119 = *pfVar76;
                    fVar120 = -pfVar76[1] / fVar119;
                    fVar97 = 0.0;
                    if ((fVar120 <= fVar79) && (fVar97 = fVar79, fVar79 <= fVar120 + 1.0 / fVar119))
                    {
                      fVar97 = (fVar119 * fVar79 + pfVar76[1]) * fVar79;
                    }
                  }
                  *local_238 = fVar97;
                  local_238 = local_238 + 1;
                  uVar62 = uVar62 + 1;
                  iVar8 = iVar8 + 1;
                } while (uVar62 != iVar63);
              }
              iVar75 = iVar75 + 1;
            } while (iVar75 != iVar45);
          }
          local_258 = (void *)((long)local_258 + 1);
        } while (local_258 != local_140);
      }
      iVar21 = local_198.h;
      iVar20 = local_198.w;
      if (((uVar68 ^ 1) == 0 && uVar57 == 1) &&
         (lVar70 = (long)(this->super_Deconvolution).num_output, 0 < lVar70)) {
        local_140 = local_198.data;
        local_130 = local_198.cstep * local_198.elemsize;
        iVar63 = bottom_blob->w;
        iVar45 = bottom_blob->h;
        uVar57 = bottom_blob->c;
        uVar58 = (ulong)(uint)local_198.w;
        lVar59 = (long)local_11c;
        lVar52 = (long)local_198.w;
        local_150 = (void *)CONCAT44(local_150._4_4_,-(int)local_150);
        local_258 = (void *)0x0;
        do {
          if (0 < iVar21) {
            local_250 = (void *)(local_130 * (long)local_258 + (long)local_140);
            iVar46 = (this->super_Deconvolution).bias_term;
            iVar74 = (this->super_Deconvolution).activation_type;
            sVar31 = (this->weight_data_tm).cstep;
            sVar27 = (this->weight_data_tm).elemsize;
            pvVar30 = (this->weight_data_tm).data;
            iVar61 = 0;
            do {
              if (0 < iVar20) {
                pvVar66 = (this->super_Deconvolution).bias_data.data;
                iVar69 = bottom_blob->w;
                pvVar25 = bottom_blob->data;
                sVar28 = bottom_blob->elemsize;
                sVar29 = bottom_blob->cstep;
                uVar22 = (this->super_Deconvolution).kernel_h;
                iVar60 = iVar61 - (int)local_148;
                pfVar76 = (float *)(this->super_Deconvolution).activation_params.data;
                local_230 = (ulong)local_150 & 0xffffffff;
                uVar64 = 0;
                do {
                  if (iVar46 == 0) {
                    auVar240 = ZEXT1664(ZEXT816(0) << 0x40);
                  }
                  else {
                    auVar240 = ZEXT464(*(uint *)((long)pvVar66 + (long)local_258 * 4));
                  }
                  auVar168 = auVar240._0_16_;
                  if (0 < (int)uVar57) {
                    iVar75 = (this->super_Deconvolution).stride_h;
                    uVar68 = (this->super_Deconvolution).kernel_w;
                    iVar8 = (this->super_Deconvolution).stride_w;
                    uVar55 = 0;
                    pvVar78 = (void *)(sVar31 * sVar27 * (long)local_258 + (long)pvVar30);
                    do {
                      if (0 < (int)uVar22) {
                        uVar65 = 0;
                        pvVar77 = pvVar78;
                        do {
                          iVar47 = (this->super_Deconvolution).dilation_h * (int)uVar65 + iVar60;
                          if ((((-1 < iVar47) && (iVar48 = iVar47 / iVar75, iVar47 % iVar75 == 0))
                              && (iVar48 < iVar45)) && (0 < (int)uVar68)) {
                            uVar67 = 0;
                            iVar47 = (int)local_230;
                            do {
                              if (((-1 < iVar47) && (iVar49 = iVar47 / iVar8, iVar47 % iVar8 == 0))
                                 && (iVar49 < iVar63)) {
                                auVar240 = ZEXT464((uint)(*(float *)((long)pvVar77 + uVar67 * 4) *
                                                          *(float *)((long)pvVar25 +
                                                                    (long)iVar49 * 4 +
                                                                    (long)iVar48 *
                                                                    (long)iVar69 * sVar28 +
                                                                    sVar29 * sVar28 * uVar55) +
                                                         auVar240._0_4_));
                              }
                              uVar67 = uVar67 + 1;
                              iVar47 = iVar47 + (this->super_Deconvolution).dilation_w;
                            } while (uVar68 != uVar67);
                          }
                          uVar65 = uVar65 + 1;
                          pvVar77 = (void *)((long)pvVar77 + (ulong)uVar68 * 4);
                        } while (uVar65 != uVar22);
                      }
                      auVar168 = auVar240._0_16_;
                      uVar55 = uVar55 + 1;
                      pvVar78 = (void *)((long)pvVar78 + lVar59 * 4);
                    } while (uVar55 != uVar57);
                  }
                  fVar97 = auVar168._0_4_;
                  fVar79 = fVar97;
                  switch(iVar74) {
                  case 1:
                    auVar168 = vmaxss_avx(auVar168,ZEXT416(0));
                    fVar79 = auVar168._0_4_;
                    break;
                  case 2:
                    auVar168 = vcmpss_avx(ZEXT816(0) << 0x40,auVar168,1);
                    auVar148._8_4_ = 0x3f800000;
                    auVar148._0_8_ = 0x3f8000003f800000;
                    auVar148._12_4_ = 0x3f800000;
                    auVar168 = vblendvps_avx(ZEXT416((uint)*pfVar76),auVar148,auVar168);
                    fVar79 = auVar168._0_4_;
LAB_002a3212:
                    fVar79 = fVar79 * fVar97;
                    break;
                  case 3:
                    auVar168 = vmaxss_avx(auVar168,ZEXT416((uint)*pfVar76));
                    fVar79 = auVar168._0_4_;
                    if (pfVar76[1] < auVar168._0_4_) {
                      fVar79 = pfVar76[1];
                    }
                    break;
                  case 4:
                    auVar168 = vminss_avx(auVar168,ZEXT416(0x42b0c0a5));
                    auVar115._0_8_ = auVar168._0_8_ ^ 0x8000000080000000;
                    auVar115._8_4_ = auVar168._8_4_ ^ 0x80000000;
                    auVar115._12_4_ = auVar168._12_4_ ^ 0x80000000;
                    auVar168 = vcmpss_avx(auVar168,ZEXT416(0xc2b0c0a5),1);
                    auVar147._8_4_ = 0x42b0c0a5;
                    auVar147._0_8_ = 0x42b0c0a542b0c0a5;
                    auVar147._12_4_ = 0x42b0c0a5;
                    auVar168 = vblendvps_avx(auVar115,auVar147,auVar168);
                    fVar79 = expf(auVar168._0_4_);
                    fVar79 = 1.0 / (fVar79 + 1.0);
                    break;
                  case 5:
                    fVar79 = expf(fVar97);
                    fVar79 = logf(fVar79 + 1.0);
                    fVar79 = tanhf(fVar79);
                    fVar79 = fVar79 * fVar97;
                    break;
                  case 6:
                    fVar119 = *pfVar76;
                    fVar120 = -pfVar76[1] / fVar119;
                    fVar79 = 0.0;
                    if ((fVar120 <= fVar97) && (fVar79 = fVar97, fVar97 <= fVar120 + 1.0 / fVar119))
                    {
                      fVar79 = fVar119 * fVar97 + pfVar76[1];
                      goto LAB_002a3212;
                    }
                  }
                  *(float *)((long)local_250 + uVar64 * 4) = fVar79;
                  uVar64 = uVar64 + 1;
                  local_230 = (ulong)((int)local_230 + 1);
                } while (uVar64 != uVar58);
              }
              local_250 = (void *)((long)local_250 + lVar52 * 4);
              iVar61 = iVar61 + 1;
            } while (iVar61 != iVar21);
          }
          local_258 = (void *)((long)local_258 + 1);
        } while (local_258 != (void *)lVar70);
      }
    }
  }
LAB_002a38ed:
  pMVar44 = local_128;
  Deconvolution::cut_padding(&this->super_Deconvolution,&local_198,local_128,local_138);
  if ((pMVar44->data == (void *)0x0) || (iVar46 = 0, (long)pMVar44->c * pMVar44->cstep == 0)) {
    iVar46 = -100;
  }
LAB_002a3932:
  piVar24 = (int *)CONCAT44(local_198.refcount._4_4_,local_198.refcount._0_4_);
  if (piVar24 != (int *)0x0) {
    LOCK();
    *piVar24 = *piVar24 + -1;
    UNLOCK();
    if (*piVar24 == 0) {
      if (local_198.allocator == (Allocator *)0x0) {
        if (local_198.data != (void *)0x0) {
          free(local_198.data);
        }
      }
      else {
        (*(local_198.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return iVar46;
}

Assistant:

int Deconvolution_x86_avx::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    // deconvolv with NxN kernel
    // value = value + bias

    int w = bottom_blob.w;
    int h = bottom_blob.h;
    size_t elemsize = bottom_blob.elemsize;
    int elempack = bottom_blob.elempack;

    //     NCNN_LOGE("Deconvolution input %d x %d  pad = %d %d  ksize=%d %d  stride=%d %d", w, h, pad_w, pad_h, kernel_w, kernel_h, stride_w, stride_h);

    const int kernel_extent_w = dilation_w * (kernel_w - 1) + 1;
    const int kernel_extent_h = dilation_h * (kernel_h - 1) + 1;

    int outw = (w - 1) * stride_w + kernel_extent_w + output_pad_right;
    int outh = (h - 1) * stride_h + kernel_extent_h + output_pad_bottom;
    int out_elempack = 1;
#if __SSE2__
    if (opt.use_packing_layout)
    {
#if __AVX512F__
        out_elempack = num_output % 16 == 0 ? 16 : num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#elif __AVX__
        out_elempack = num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#else
        out_elempack = num_output % 4 == 0 ? 4 : 1;
#endif
    }
#endif // __SSE2__
    size_t out_elemsize = elemsize / elempack * out_elempack;

    int out_channels = num_output / out_elempack;

    Mat top_blob_bordered;
    if (pad_left > 0 || pad_right > 0 || pad_top > 0 || pad_bottom > 0 || (output_w > 0 && output_h > 0))
    {
        top_blob_bordered.create(outw, outh, out_channels, out_elemsize, out_elempack, opt.workspace_allocator);
    }
    else
    {
        top_blob_bordered = top_blob;
        top_blob_bordered.create(outw, outh, out_channels, out_elemsize, out_elempack, opt.blob_allocator);
    }
    if (top_blob_bordered.empty())
        return -100;

    const int maxk = kernel_w * kernel_h;

    if (opt.use_sgemm_convolution)
    {
        // sgemm
        Mat bottom_blob_2 = bottom_blob;
        {
            bottom_blob_2.w = bottom_blob.w * bottom_blob.h;
            bottom_blob_2.h = 1;
        }
        Mat top_col2im;
        Option opt_b = opt;
        opt_b.blob_allocator = top_blob_bordered.allocator;
        int ret = gemm->forward(bottom_blob_2, top_col2im, opt_b);
        if (ret != 0)
            return ret;

        {
            // col2im
            const int gap = (outw * stride_h - w * stride_w) * out_elempack;

#if __SSE2__
#if __AVX__
#if __AVX512F__
            if (out_elempack == 16)
            {
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int p = 0; p < out_channels; p++)
                {
                    const float* sptr = top_col2im.row(p * maxk);
                    Mat outm = top_blob_bordered.channel(p);

                    if (bias_data.empty())
                    {
                        outm.fill(_mm512_setzero_ps());
                    }
                    else
                    {
                        outm.fill(_mm512_loadu_ps((const float*)bias_data + p * 16));
                    }

                    for (int u = 0; u < kernel_h; u++)
                    {
                        for (int v = 0; v < kernel_w; v++)
                        {
                            float* ptr = outm.row(dilation_h * u) + dilation_w * v * 16;

                            for (int i = 0; i < h; i++)
                            {
                                for (int j = 0; j < w; j++)
                                {
                                    __m512 _val = _mm512_load_ps(ptr);
                                    __m512 _s = _mm512_load_ps(sptr);
                                    _val = _mm512_add_ps(_val, _s);
                                    _mm512_store_ps(ptr, _val);

                                    ptr += stride_w * 16;
                                    sptr += 16;
                                }

                                ptr += gap;
                            }
                        }
                    }
                }
            }
#endif // __AVX512F__

            if (out_elempack == 8)
            {
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int p = 0; p < out_channels; p++)
                {
                    const float* sptr = top_col2im.row(p * maxk);
                    Mat outm = top_blob_bordered.channel(p);

                    if (bias_data.empty())
                    {
                        outm.fill(_mm256_setzero_ps());
                    }
                    else
                    {
                        outm.fill(_mm256_loadu_ps((const float*)bias_data + p * 8));
                    }

                    for (int u = 0; u < kernel_h; u++)
                    {
                        for (int v = 0; v < kernel_w; v++)
                        {
                            float* ptr = outm.row(dilation_h * u) + dilation_w * v * 8;

                            for (int i = 0; i < h; i++)
                            {
                                for (int j = 0; j < w; j++)
                                {
                                    __m256 _val = _mm256_load_ps(ptr);
                                    __m256 _s = _mm256_load_ps(sptr);
                                    _val = _mm256_add_ps(_val, _s);
                                    _mm256_store_ps(ptr, _val);

                                    ptr += stride_w * 8;
                                    sptr += 8;
                                }

                                ptr += gap;
                            }
                        }
                    }
                }
            }
#endif // __AVX__

            if (out_elempack == 4)
            {
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int p = 0; p < out_channels; p++)
                {
                    const float* sptr = top_col2im.row(p * maxk);
                    Mat outm = top_blob_bordered.channel(p);

                    if (bias_data.empty())
                    {
                        outm.fill(_mm_setzero_ps());
                    }
                    else
                    {
                        outm.fill(_mm_loadu_ps((const float*)bias_data + p * 4));
                    }

                    for (int u = 0; u < kernel_h; u++)
                    {
                        for (int v = 0; v < kernel_w; v++)
                        {
                            float* ptr = outm.row(dilation_h * u) + dilation_w * v * 4;

                            for (int i = 0; i < h; i++)
                            {
                                for (int j = 0; j < w; j++)
                                {
                                    __m128 _val = _mm_load_ps(ptr);
                                    __m128 _s = _mm_load_ps(sptr);
                                    _val = _mm_add_ps(_val, _s);
                                    _mm_store_ps(ptr, _val);

                                    ptr += stride_w * 4;
                                    sptr += 4;
                                }

                                ptr += gap;
                            }
                        }
                    }
                }
            }
#endif // __SSE2__

            if (out_elempack == 1)
            {
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int p = 0; p < out_channels; p++)
                {
                    const float* sptr = top_col2im.row(p * maxk);
                    Mat outm = top_blob_bordered.channel(p);

                    const float bias = bias_data.empty() ? 0.f : bias_data[p];
                    outm.fill(bias);

                    for (int u = 0; u < kernel_h; u++)
                    {
                        for (int v = 0; v < kernel_w; v++)
                        {
                            float* ptr = outm.row(dilation_h * u) + dilation_w * v;

                            for (int i = 0; i < h; i++)
                            {
                                for (int j = 0; j < w; j++)
                                {
                                    ptr[0] += sptr[0];

                                    ptr += stride_w;
                                    sptr += 1;
                                }

                                ptr += gap;
                            }
                        }
                    }
                }
            }
        }

        if (activation)
        {
            activation->forward_inplace(top_blob_bordered, opt);
        }
    }
    else
    {
#if __SSE2__
#if __AVX__
#if __AVX512F__
        if (elempack == 16 && out_elempack == 16)
        {
            deconvolution_pack16_avx512(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }

        if (elempack == 8 && out_elempack == 16)
        {
            deconvolution_pack8to16_avx512(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }

        if (elempack == 16 && out_elempack == 8)
        {
            deconvolution_pack16to8_avx512(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }

        if (elempack == 4 && out_elempack == 16)
        {
            deconvolution_pack4to16_avx512(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }

        if (elempack == 16 && out_elempack == 4)
        {
            deconvolution_pack16to4_avx512(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }

        if (elempack == 1 && out_elempack == 16)
        {
            deconvolution_pack1to16_avx512(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }

        if (elempack == 16 && out_elempack == 1)
        {
            deconvolution_pack16to1_avx512(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }
#endif // __AVX512F__

        if (elempack == 8 && out_elempack == 8)
        {
            deconvolution_pack8_avx(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }

        if (elempack == 4 && out_elempack == 8)
        {
            deconvolution_pack4to8_avx(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }

        if (elempack == 8 && out_elempack == 4)
        {
            deconvolution_pack8to4_avx(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }

        if (elempack == 1 && out_elempack == 8)
        {
            deconvolution_pack1to8_avx(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }

        if (elempack == 8 && out_elempack == 1)
        {
            deconvolution_pack8to1_avx(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }
#endif // __AVX__

        if (elempack == 4 && out_elempack == 4)
        {
            deconvolution_pack4_sse(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }

        if (elempack == 1 && out_elempack == 4)
        {
            deconvolution_pack1to4_sse(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }

        if (elempack == 4 && out_elempack == 1)
        {
            deconvolution_pack4to1_sse(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }
#endif // __SSE2__

        if (elempack == 1 && out_elempack == 1)
        {
            // num_output
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int p = 0; p < num_output; p++)
            {
                float* outptr = top_blob_bordered.channel(p);

                // shadowed variable for less openmp task args
                const int w = bottom_blob.w;
                const int h = bottom_blob.h;
                const int channels = bottom_blob.c;
                const int outw = top_blob_bordered.w;
                const int outh = top_blob_bordered.h;

                for (int i = 0; i < outh; i++)
                {
                    for (int j = 0; j < outw; j++)
                    {
                        float sum = 0.f;

                        if (bias_term)
                        {
                            sum = bias_data[p];
                        }

                        const float* kptr = (const float*)weight_data_tm.channel(p);

                        // channels
                        for (int q = 0; q < channels; q++)
                        {
                            const Mat m = bottom_blob.channel(q);

                            for (int y = 0; y < kernel_h; y++)
                            {
                                int sys = (i + y * dilation_h - (kernel_extent_h - 1));
                                if (sys < 0 || sys % stride_h != 0)
                                    continue;

                                int sy = sys / stride_h;
                                if (sy >= h)
                                    continue;

                                const float* sptr = m.row(sy);

                                for (int x = 0; x < kernel_w; x++)
                                {
                                    int sxs = (j + x * dilation_w - (kernel_extent_w - 1));
                                    if (sxs < 0 || sxs % stride_w != 0)
                                        continue;

                                    int sx = sxs / stride_w;
                                    if (sx >= w)
                                        continue;

                                    float val = sptr[sx];

                                    int k = y * kernel_w + x;

                                    float w = kptr[k];

                                    sum += val * w;
                                }
                            }

                            kptr += maxk;
                        }

                        sum = activation_ss(sum, activation_type, activation_params);

                        outptr[j] = sum;
                    }

                    outptr += outw;
                }
            }
        }
    }

    cut_padding(top_blob_bordered, top_blob, opt);
    if (top_blob.empty())
        return -100;

    return 0;
}